

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  uint uVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  long lVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [28];
  undefined1 auVar108 [28];
  undefined1 auVar109 [28];
  undefined1 auVar110 [28];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  undefined8 uVar113;
  undefined8 uVar114;
  int iVar115;
  long lVar116;
  RTCIntersectArguments *pRVar117;
  RTCIntersectArguments *pRVar118;
  bool bVar119;
  uint uVar120;
  ulong uVar121;
  ulong uVar122;
  uint uVar123;
  long lVar124;
  float fVar125;
  float fVar143;
  float fVar145;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar155;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar153;
  undefined1 auVar136 [32];
  float fVar149;
  float fVar151;
  float fVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  vint4 bi_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar173;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar172;
  undefined1 auVar171 [64];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar188;
  float fVar189;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar190;
  float fVar202;
  float fVar203;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar206;
  undefined1 auVar194 [16];
  float fVar204;
  undefined1 auVar193 [16];
  float fVar207;
  float fVar209;
  float fVar211;
  float fVar212;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar205;
  float fVar208;
  float fVar210;
  float fVar213;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 bi;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar225;
  float fVar235;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar227 [16];
  float fVar237;
  undefined1 auVar228 [16];
  float fVar226;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  undefined1 auVar234 [32];
  float fVar241;
  float fVar242;
  float fVar248;
  float fVar250;
  undefined1 auVar243 [16];
  float fVar252;
  undefined1 auVar244 [16];
  float fVar249;
  float fVar251;
  float fVar253;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar254;
  float fVar255;
  undefined1 auVar247 [32];
  float fVar256;
  float fVar266;
  float fVar267;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar272;
  float fVar278;
  float fVar280;
  float fVar281;
  vint4 ai_1;
  undefined1 auVar273 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar274 [32];
  float fVar282;
  undefined1 auVar275 [32];
  float fVar279;
  float fVar283;
  float fVar288;
  undefined1 auVar276 [32];
  float fVar289;
  float fVar290;
  float fVar298;
  float fVar299;
  undefined1 auVar291 [16];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar308 [32];
  undefined1 auVar316 [16];
  float fVar322;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar326 [32];
  float fVar330;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  ulong local_900;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  uint local_880;
  undefined4 uStack_87c;
  undefined1 local_840 [8];
  undefined8 uStack_838;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  uint uStack_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 *local_708;
  undefined1 (*local_700) [16];
  undefined1 (*local_6f8) [32];
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  uint local_400;
  uint local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3a0 [32];
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  RTCHitN local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar163 [24];
  undefined1 auVar277 [64];
  undefined1 auVar297 [64];
  
  PVar9 = prim[1];
  uVar121 = (ulong)(byte)PVar9;
  lVar97 = uVar121 * 0x19;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar230 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar230 = vinsertps_avx(auVar230,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar225 = *(float *)(prim + lVar97 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + lVar97 + 6));
  auVar174._0_4_ = fVar225 * auVar16._0_4_;
  auVar174._4_4_ = fVar225 * auVar16._4_4_;
  auVar174._8_4_ = fVar225 * auVar16._8_4_;
  auVar174._12_4_ = fVar225 * auVar16._12_4_;
  auVar257._0_4_ = fVar225 * auVar230._0_4_;
  auVar257._4_4_ = fVar225 * auVar230._4_4_;
  auVar257._8_4_ = fVar225 * auVar230._8_4_;
  auVar257._12_4_ = fVar225 * auVar230._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 5 + 6)));
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 6 + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xb + 6)));
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar121 + 6)));
  auVar229 = vcvtdq2ps_avx(auVar229);
  uVar122 = (ulong)(uint)((int)(uVar121 * 9) * 2);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 + uVar121 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  uVar122 = (ulong)(uint)((int)(uVar121 * 5) << 2);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar126 = vshufps_avx(auVar257,auVar257,0);
  auVar158 = vshufps_avx(auVar257,auVar257,0x55);
  auVar175 = vshufps_avx(auVar257,auVar257,0xaa);
  fVar225 = auVar175._0_4_;
  fVar190 = auVar175._4_4_;
  fVar235 = auVar175._8_4_;
  fVar202 = auVar175._12_4_;
  fVar241 = auVar158._0_4_;
  fVar248 = auVar158._4_4_;
  fVar250 = auVar158._8_4_;
  fVar252 = auVar158._12_4_;
  fVar236 = auVar126._0_4_;
  fVar203 = auVar126._4_4_;
  fVar237 = auVar126._8_4_;
  fVar204 = auVar126._12_4_;
  auVar316._0_4_ = fVar236 * auVar16._0_4_ + fVar241 * auVar230._0_4_ + fVar225 * auVar180._0_4_;
  auVar316._4_4_ = fVar203 * auVar16._4_4_ + fVar248 * auVar230._4_4_ + fVar190 * auVar180._4_4_;
  auVar316._8_4_ = fVar237 * auVar16._8_4_ + fVar250 * auVar230._8_4_ + fVar235 * auVar180._8_4_;
  auVar316._12_4_ = fVar204 * auVar16._12_4_ + fVar252 * auVar230._12_4_ + fVar202 * auVar180._12_4_
  ;
  auVar323._0_4_ = fVar236 * auVar219._0_4_ + fVar241 * auVar194._0_4_ + auVar229._0_4_ * fVar225;
  auVar323._4_4_ = fVar203 * auVar219._4_4_ + fVar248 * auVar194._4_4_ + auVar229._4_4_ * fVar190;
  auVar323._8_4_ = fVar237 * auVar219._8_4_ + fVar250 * auVar194._8_4_ + auVar229._8_4_ * fVar235;
  auVar323._12_4_ =
       fVar204 * auVar219._12_4_ + fVar252 * auVar194._12_4_ + auVar229._12_4_ * fVar202;
  auVar258._0_4_ = fVar236 * auVar127._0_4_ + fVar241 * auVar128._0_4_ + auVar159._0_4_ * fVar225;
  auVar258._4_4_ = fVar203 * auVar127._4_4_ + fVar248 * auVar128._4_4_ + auVar159._4_4_ * fVar190;
  auVar258._8_4_ = fVar237 * auVar127._8_4_ + fVar250 * auVar128._8_4_ + auVar159._8_4_ * fVar235;
  auVar258._12_4_ =
       fVar204 * auVar127._12_4_ + fVar252 * auVar128._12_4_ + auVar159._12_4_ * fVar202;
  auVar126 = vshufps_avx(auVar174,auVar174,0);
  auVar158 = vshufps_avx(auVar174,auVar174,0x55);
  auVar175 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar225 = auVar175._0_4_;
  fVar190 = auVar175._4_4_;
  fVar235 = auVar175._8_4_;
  fVar202 = auVar175._12_4_;
  fVar241 = auVar158._0_4_;
  fVar248 = auVar158._4_4_;
  fVar250 = auVar158._8_4_;
  fVar252 = auVar158._12_4_;
  fVar236 = auVar126._0_4_;
  fVar203 = auVar126._4_4_;
  fVar237 = auVar126._8_4_;
  fVar204 = auVar126._12_4_;
  auVar214._0_4_ = fVar236 * auVar16._0_4_ + fVar241 * auVar230._0_4_ + fVar225 * auVar180._0_4_;
  auVar214._4_4_ = fVar203 * auVar16._4_4_ + fVar248 * auVar230._4_4_ + fVar190 * auVar180._4_4_;
  auVar214._8_4_ = fVar237 * auVar16._8_4_ + fVar250 * auVar230._8_4_ + fVar235 * auVar180._8_4_;
  auVar214._12_4_ = fVar204 * auVar16._12_4_ + fVar252 * auVar230._12_4_ + fVar202 * auVar180._12_4_
  ;
  auVar158._0_4_ = fVar236 * auVar219._0_4_ + auVar229._0_4_ * fVar225 + fVar241 * auVar194._0_4_;
  auVar158._4_4_ = fVar203 * auVar219._4_4_ + auVar229._4_4_ * fVar190 + fVar248 * auVar194._4_4_;
  auVar158._8_4_ = fVar237 * auVar219._8_4_ + auVar229._8_4_ * fVar235 + fVar250 * auVar194._8_4_;
  auVar158._12_4_ =
       fVar204 * auVar219._12_4_ + auVar229._12_4_ * fVar202 + fVar252 * auVar194._12_4_;
  auVar126._0_4_ = fVar236 * auVar127._0_4_ + fVar241 * auVar128._0_4_ + auVar159._0_4_ * fVar225;
  auVar126._4_4_ = fVar203 * auVar127._4_4_ + fVar248 * auVar128._4_4_ + auVar159._4_4_ * fVar190;
  auVar126._8_4_ = fVar237 * auVar127._8_4_ + fVar250 * auVar128._8_4_ + auVar159._8_4_ * fVar235;
  auVar126._12_4_ =
       fVar204 * auVar127._12_4_ + fVar252 * auVar128._12_4_ + auVar159._12_4_ * fVar202;
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar316,auVar243);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar191,1);
  auVar230 = vblendvps_avx(auVar316,auVar191,auVar16);
  auVar16 = vandps_avx(auVar323,auVar243);
  auVar16 = vcmpps_avx(auVar16,auVar191,1);
  auVar180 = vblendvps_avx(auVar323,auVar191,auVar16);
  auVar16 = vandps_avx(auVar258,auVar243);
  auVar16 = vcmpps_avx(auVar16,auVar191,1);
  auVar16 = vblendvps_avx(auVar258,auVar191,auVar16);
  auVar219 = vrcpps_avx(auVar230);
  fVar241 = auVar219._0_4_;
  auVar175._0_4_ = fVar241 * auVar230._0_4_;
  fVar248 = auVar219._4_4_;
  auVar175._4_4_ = fVar248 * auVar230._4_4_;
  fVar250 = auVar219._8_4_;
  auVar175._8_4_ = fVar250 * auVar230._8_4_;
  fVar252 = auVar219._12_4_;
  auVar175._12_4_ = fVar252 * auVar230._12_4_;
  auVar259._8_4_ = 0x3f800000;
  auVar259._0_8_ = 0x3f8000003f800000;
  auVar259._12_4_ = 0x3f800000;
  auVar230 = vsubps_avx(auVar259,auVar175);
  fVar241 = fVar241 + fVar241 * auVar230._0_4_;
  fVar248 = fVar248 + fVar248 * auVar230._4_4_;
  fVar250 = fVar250 + fVar250 * auVar230._8_4_;
  fVar252 = fVar252 + fVar252 * auVar230._12_4_;
  auVar230 = vrcpps_avx(auVar180);
  fVar225 = auVar230._0_4_;
  auVar227._0_4_ = fVar225 * auVar180._0_4_;
  fVar235 = auVar230._4_4_;
  auVar227._4_4_ = fVar235 * auVar180._4_4_;
  fVar236 = auVar230._8_4_;
  auVar227._8_4_ = fVar236 * auVar180._8_4_;
  fVar237 = auVar230._12_4_;
  auVar227._12_4_ = fVar237 * auVar180._12_4_;
  auVar230 = vsubps_avx(auVar259,auVar227);
  fVar225 = fVar225 + fVar225 * auVar230._0_4_;
  fVar235 = fVar235 + fVar235 * auVar230._4_4_;
  fVar236 = fVar236 + fVar236 * auVar230._8_4_;
  fVar237 = fVar237 + fVar237 * auVar230._12_4_;
  auVar230 = vrcpps_avx(auVar16);
  fVar190 = auVar230._0_4_;
  auVar192._0_4_ = fVar190 * auVar16._0_4_;
  fVar202 = auVar230._4_4_;
  auVar192._4_4_ = fVar202 * auVar16._4_4_;
  fVar203 = auVar230._8_4_;
  auVar192._8_4_ = fVar203 * auVar16._8_4_;
  fVar204 = auVar230._12_4_;
  auVar192._12_4_ = fVar204 * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar259,auVar192);
  fVar190 = fVar190 + fVar190 * auVar16._0_4_;
  fVar202 = fVar202 + fVar202 * auVar16._4_4_;
  fVar203 = fVar203 + fVar203 * auVar16._8_4_;
  fVar204 = fVar204 + fVar204 * auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar121 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar214);
  auVar176._0_4_ = fVar241 * auVar16._0_4_;
  auVar176._4_4_ = fVar248 * auVar16._4_4_;
  auVar176._8_4_ = fVar250 * auVar16._8_4_;
  auVar176._12_4_ = fVar252 * auVar16._12_4_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar121 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar230);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar214);
  auVar215._0_4_ = fVar241 * auVar16._0_4_;
  auVar215._4_4_ = fVar248 * auVar16._4_4_;
  auVar215._8_4_ = fVar250 * auVar16._8_4_;
  auVar215._12_4_ = fVar252 * auVar16._12_4_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar230 = vpmovsxwd_avx(auVar180);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar121 * -2 + 6);
  auVar16 = vpmovsxwd_avx(auVar219);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar158);
  auVar273._0_4_ = auVar16._0_4_ * fVar225;
  auVar273._4_4_ = auVar16._4_4_ * fVar235;
  auVar273._8_4_ = auVar16._8_4_ * fVar236;
  auVar273._12_4_ = auVar16._12_4_ * fVar237;
  auVar277 = ZEXT1664(auVar273);
  auVar16 = vcvtdq2ps_avx(auVar230);
  auVar16 = vsubps_avx(auVar16,auVar158);
  auVar159._0_4_ = fVar225 * auVar16._0_4_;
  auVar159._4_4_ = fVar235 * auVar16._4_4_;
  auVar159._8_4_ = fVar236 * auVar16._8_4_;
  auVar159._12_4_ = fVar237 * auVar16._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar122 + uVar121 + 6);
  auVar16 = vpmovsxwd_avx(auVar194);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar126);
  auVar228._0_4_ = auVar16._0_4_ * fVar190;
  auVar228._4_4_ = auVar16._4_4_ * fVar202;
  auVar228._8_4_ = auVar16._8_4_ * fVar203;
  auVar228._12_4_ = auVar16._12_4_ * fVar204;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar121 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar229);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar126);
  auVar127._0_4_ = auVar16._0_4_ * fVar190;
  auVar127._4_4_ = auVar16._4_4_ * fVar202;
  auVar127._8_4_ = auVar16._8_4_ * fVar203;
  auVar127._12_4_ = auVar16._12_4_ * fVar204;
  auVar16 = vpminsd_avx(auVar176,auVar215);
  auVar230 = vpminsd_avx(auVar273,auVar159);
  auVar16 = vmaxps_avx(auVar16,auVar230);
  auVar230 = vpminsd_avx(auVar228,auVar127);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar291._4_4_ = uVar7;
  auVar291._0_4_ = uVar7;
  auVar291._8_4_ = uVar7;
  auVar291._12_4_ = uVar7;
  auVar297 = ZEXT1664(auVar291);
  auVar230 = vmaxps_avx(auVar230,auVar291);
  auVar16 = vmaxps_avx(auVar16,auVar230);
  local_470._0_4_ = auVar16._0_4_ * 0.99999964;
  local_470._4_4_ = auVar16._4_4_ * 0.99999964;
  local_470._8_4_ = auVar16._8_4_ * 0.99999964;
  local_470._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar176,auVar215);
  auVar230 = vpmaxsd_avx(auVar273,auVar159);
  auVar16 = vminps_avx(auVar16,auVar230);
  auVar230 = vpmaxsd_avx(auVar228,auVar127);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar177._4_4_ = uVar7;
  auVar177._0_4_ = uVar7;
  auVar177._8_4_ = uVar7;
  auVar177._12_4_ = uVar7;
  auVar230 = vminps_avx(auVar230,auVar177);
  auVar16 = vminps_avx(auVar16,auVar230);
  auVar128._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar128._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar128._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar128._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar230 = vpcmpgtd_avx(auVar16,_DAT_01f7fcf0);
  auVar16 = vcmpps_avx(local_470,auVar128,2);
  auVar16 = vandps_avx(auVar16,auVar230);
  uVar120 = vmovmskps_avx(auVar16);
  if (uVar120 == 0) {
    bVar119 = false;
  }
  else {
    uVar120 = uVar120 & 0xff;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    local_6f8 = (undefined1 (*) [32])&local_160;
    uVar123 = 1 << ((byte)k & 0x1f);
    local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar123 & 0xf) << 4));
    local_708 = mm_lookupmask_ps + (long)((int)uVar123 >> 4) * 0x10;
    do {
      uVar122 = (ulong)uVar120;
      auVar233 = auVar297._0_32_;
      auVar274 = auVar277._0_32_;
      lVar116 = 0;
      if (uVar122 != 0) {
        for (; (uVar120 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
        }
      }
      uVar122 = uVar122 - 1 & uVar122;
      uVar120 = *(uint *)(prim + lVar116 * 4 + 6);
      local_560._0_4_ = uVar120;
      lVar116 = lVar116 * 0x40;
      lVar124 = 0;
      if (uVar122 != 0) {
        for (; (uVar122 >> lVar124 & 1) == 0; lVar124 = lVar124 + 1) {
        }
      }
      uVar123 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar123].ptr;
      auVar16 = *(undefined1 (*) [16])(prim + lVar116 + lVar97 + 0x16);
      if (((uVar122 != 0) && (uVar121 = uVar122 - 1 & uVar122, uVar121 != 0)) &&
         (lVar124 = 0, uVar121 != 0)) {
        for (; (uVar121 >> lVar124 & 1) == 0; lVar124 = lVar124 + 1) {
        }
      }
      _local_720 = *(undefined1 (*) [16])(prim + lVar116 + lVar97 + 0x26);
      _local_630 = *(undefined1 (*) [16])(prim + lVar116 + lVar97 + 0x36);
      _local_640 = *(undefined1 (*) [16])(prim + lVar116 + lVar97 + 0x46);
      uVar10 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar230 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar194 = vinsertps_avx(auVar230,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar219 = vsubps_avx(auVar16,auVar194);
      auVar230 = vshufps_avx(auVar219,auVar219,0);
      auVar180 = vshufps_avx(auVar219,auVar219,0x55);
      auVar219 = vshufps_avx(auVar219,auVar219,0xaa);
      fVar225 = pre->ray_space[k].vx.field_0.m128[0];
      fVar190 = pre->ray_space[k].vx.field_0.m128[1];
      fVar235 = pre->ray_space[k].vx.field_0.m128[2];
      fVar202 = pre->ray_space[k].vx.field_0.m128[3];
      fVar236 = pre->ray_space[k].vy.field_0.m128[0];
      fVar203 = pre->ray_space[k].vy.field_0.m128[1];
      fVar237 = pre->ray_space[k].vy.field_0.m128[2];
      fVar204 = pre->ray_space[k].vy.field_0.m128[3];
      fVar241 = pre->ray_space[k].vz.field_0.m128[0];
      fVar248 = pre->ray_space[k].vz.field_0.m128[1];
      fVar250 = pre->ray_space[k].vz.field_0.m128[2];
      fVar252 = pre->ray_space[k].vz.field_0.m128[3];
      auVar216._0_4_ =
           auVar230._0_4_ * fVar225 + auVar180._0_4_ * fVar236 + fVar241 * auVar219._0_4_;
      auVar216._4_4_ =
           auVar230._4_4_ * fVar190 + auVar180._4_4_ * fVar203 + fVar248 * auVar219._4_4_;
      auVar216._8_4_ =
           auVar230._8_4_ * fVar235 + auVar180._8_4_ * fVar237 + fVar250 * auVar219._8_4_;
      auVar216._12_4_ =
           auVar230._12_4_ * fVar202 + auVar180._12_4_ * fVar204 + fVar252 * auVar219._12_4_;
      auVar230 = vblendps_avx(auVar216,auVar16,8);
      auVar229 = vsubps_avx(_local_720,auVar194);
      auVar180 = vshufps_avx(auVar229,auVar229,0);
      auVar219 = vshufps_avx(auVar229,auVar229,0x55);
      auVar229 = vshufps_avx(auVar229,auVar229,0xaa);
      auVar217._0_8_ =
           CONCAT44(auVar180._4_4_ * fVar190 + auVar219._4_4_ * fVar203 + fVar248 * auVar229._4_4_,
                    auVar180._0_4_ * fVar225 + auVar219._0_4_ * fVar236 + fVar241 * auVar229._0_4_);
      auVar217._8_4_ =
           auVar180._8_4_ * fVar235 + auVar219._8_4_ * fVar237 + fVar250 * auVar229._8_4_;
      auVar217._12_4_ =
           auVar180._12_4_ * fVar202 + auVar219._12_4_ * fVar204 + fVar252 * auVar229._12_4_;
      auVar180 = vblendps_avx(auVar217,_local_720,8);
      auVar127 = vsubps_avx(_local_630,auVar194);
      auVar219 = vshufps_avx(auVar127,auVar127,0);
      auVar229 = vshufps_avx(auVar127,auVar127,0x55);
      auVar127 = vshufps_avx(auVar127,auVar127,0xaa);
      auVar218._0_4_ =
           auVar219._0_4_ * fVar225 + auVar229._0_4_ * fVar236 + fVar241 * auVar127._0_4_;
      auVar218._4_4_ =
           auVar219._4_4_ * fVar190 + auVar229._4_4_ * fVar203 + fVar248 * auVar127._4_4_;
      auVar218._8_4_ =
           auVar219._8_4_ * fVar235 + auVar229._8_4_ * fVar237 + fVar250 * auVar127._8_4_;
      auVar218._12_4_ =
           auVar219._12_4_ * fVar202 + auVar229._12_4_ * fVar204 + fVar252 * auVar127._12_4_;
      auVar219 = vblendps_avx(auVar218,_local_630,8);
      auVar127 = vsubps_avx(_local_640,auVar194);
      auVar194 = vshufps_avx(auVar127,auVar127,0);
      auVar229 = vshufps_avx(auVar127,auVar127,0x55);
      auVar127 = vshufps_avx(auVar127,auVar127,0xaa);
      auVar244._0_4_ =
           auVar194._0_4_ * fVar225 + auVar229._0_4_ * fVar236 + fVar241 * auVar127._0_4_;
      auVar244._4_4_ =
           auVar194._4_4_ * fVar190 + auVar229._4_4_ * fVar203 + fVar248 * auVar127._4_4_;
      auVar244._8_4_ =
           auVar194._8_4_ * fVar235 + auVar229._8_4_ * fVar237 + fVar250 * auVar127._8_4_;
      auVar244._12_4_ =
           auVar194._12_4_ * fVar202 + auVar229._12_4_ * fVar204 + fVar252 * auVar127._12_4_;
      auVar194 = vblendps_avx(auVar244,_local_640,8);
      auVar193._8_4_ = 0x7fffffff;
      auVar193._0_8_ = 0x7fffffff7fffffff;
      auVar193._12_4_ = 0x7fffffff;
      auVar230 = vandps_avx(auVar230,auVar193);
      auVar180 = vandps_avx(auVar180,auVar193);
      auVar229 = vmaxps_avx(auVar230,auVar180);
      auVar230 = vandps_avx(auVar219,auVar193);
      auVar180 = vandps_avx(auVar194,auVar193);
      auVar230 = vmaxps_avx(auVar230,auVar180);
      auVar230 = vmaxps_avx(auVar229,auVar230);
      auVar180 = vmovshdup_avx(auVar230);
      auVar180 = vmaxss_avx(auVar180,auVar230);
      auVar230 = vshufpd_avx(auVar230,auVar230,1);
      auVar230 = vmaxss_avx(auVar230,auVar180);
      lVar116 = (long)(int)uVar10 * 0x44;
      fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0x908);
      fVar190 = *(float *)(bspline_basis0 + lVar116 + 0x90c);
      fVar235 = *(float *)(bspline_basis0 + lVar116 + 0x910);
      fVar202 = *(float *)(bspline_basis0 + lVar116 + 0x914);
      fVar236 = *(float *)(bspline_basis0 + lVar116 + 0x918);
      fVar203 = *(float *)(bspline_basis0 + lVar116 + 0x91c);
      fVar237 = *(float *)(bspline_basis0 + lVar116 + 0x920);
      auVar108 = *(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0x908);
      auVar180 = vshufps_avx(auVar218,auVar218,0);
      register0x00001250 = auVar180;
      _local_6c0 = auVar180;
      auVar219 = vshufps_avx(auVar218,auVar218,0x55);
      register0x00001350 = auVar219;
      _local_6a0 = auVar219;
      fVar204 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0xd8c);
      fVar241 = *(float *)(bspline_basis0 + lVar116 + 0xd90);
      fVar248 = *(float *)(bspline_basis0 + lVar116 + 0xd94);
      fVar250 = *(float *)(bspline_basis0 + lVar116 + 0xd98);
      fVar252 = *(float *)(bspline_basis0 + lVar116 + 0xd9c);
      fVar322 = *(float *)(bspline_basis0 + lVar116 + 0xda0);
      fVar188 = *(float *)(bspline_basis0 + lVar116 + 0xda4);
      auVar107 = *(undefined1 (*) [28])(bspline_basis0 + lVar116 + 0xd8c);
      auVar194 = vshufps_avx(auVar244,auVar244,0);
      register0x000015d0 = auVar194;
      _local_520 = auVar194;
      auVar229 = vshufps_avx(auVar244,auVar244,0x55);
      fVar330 = auVar194._0_4_;
      fVar335 = auVar194._4_4_;
      fVar336 = auVar194._8_4_;
      fVar337 = auVar194._12_4_;
      fVar149 = auVar180._0_4_;
      fVar151 = auVar180._4_4_;
      fVar154 = auVar180._8_4_;
      fVar156 = auVar180._12_4_;
      fVar242 = auVar229._0_4_;
      fVar249 = auVar229._4_4_;
      fVar251 = auVar229._8_4_;
      fVar253 = auVar229._12_4_;
      fVar226 = auVar219._0_4_;
      fVar157 = auVar219._4_4_;
      fVar173 = auVar219._8_4_;
      fVar255 = auVar219._12_4_;
      auVar180 = vshufps_avx(_local_630,_local_630,0xff);
      register0x00001490 = auVar180;
      _local_2a0 = auVar180;
      auVar219 = vshufps_avx(_local_640,_local_640,0xff);
      register0x00001410 = auVar219;
      _local_2c0 = auVar219;
      fVar272 = auVar219._0_4_;
      fVar278 = auVar219._4_4_;
      fVar281 = auVar219._8_4_;
      fVar282 = auVar219._12_4_;
      fVar267 = auVar180._0_4_;
      fVar268 = auVar180._4_4_;
      fVar269 = auVar180._8_4_;
      auVar100._8_4_ = auVar217._8_4_;
      auVar100._0_8_ = auVar217._0_8_;
      auVar100._12_4_ = auVar217._12_4_;
      auVar219 = vshufps_avx(auVar100,auVar100,0);
      register0x00001550 = auVar219;
      _local_80 = auVar219;
      fVar153 = *(float *)(bspline_basis0 + lVar116 + 0x484);
      fVar206 = *(float *)(bspline_basis0 + lVar116 + 0x488);
      fVar309 = *(float *)(bspline_basis0 + lVar116 + 0x48c);
      fVar211 = *(float *)(bspline_basis0 + lVar116 + 0x490);
      fVar310 = *(float *)(bspline_basis0 + lVar116 + 0x494);
      fVar239 = *(float *)(bspline_basis0 + lVar116 + 0x498);
      fVar312 = *(float *)(bspline_basis0 + lVar116 + 0x49c);
      fVar299 = auVar219._0_4_;
      fVar300 = auVar219._4_4_;
      fVar301 = auVar219._8_4_;
      fVar302 = auVar219._12_4_;
      auVar219 = vshufps_avx(auVar100,auVar100,0x55);
      register0x00001350 = auVar219;
      _local_260 = auVar219;
      fVar209 = auVar219._0_4_;
      fVar212 = auVar219._4_4_;
      fVar288 = auVar219._8_4_;
      fVar238 = auVar219._12_4_;
      auVar219 = vpermilps_avx(_local_720,0xff);
      register0x00001590 = auVar219;
      _local_a0 = auVar219;
      fVar303 = auVar219._0_4_;
      fVar327 = auVar219._4_4_;
      fVar328 = auVar219._8_4_;
      fVar329 = auVar219._12_4_;
      auVar219 = vshufps_avx(auVar216,auVar216,0);
      register0x00001310 = auVar219;
      _local_500 = auVar219;
      fVar311 = *(float *)(bspline_basis0 + lVar116);
      fVar313 = *(float *)(bspline_basis0 + lVar116 + 4);
      fVar285 = *(float *)(bspline_basis0 + lVar116 + 8);
      fVar315 = *(float *)(bspline_basis0 + lVar116 + 0xc);
      fStack_570 = *(float *)(bspline_basis0 + lVar116 + 0x10);
      fStack_56c = *(float *)(bspline_basis0 + lVar116 + 0x14);
      fStack_568 = *(float *)(bspline_basis0 + lVar116 + 0x18);
      fStack_564 = *(float *)(bspline_basis0 + lVar116 + 0x1c);
      fVar240 = auVar219._0_4_;
      fVar254 = auVar219._4_4_;
      fVar205 = auVar219._8_4_;
      fVar207 = auVar219._12_4_;
      auVar308._0_4_ = fVar240 * fVar311 + fVar299 * fVar153 + fVar149 * fVar225 + fVar330 * fVar204
      ;
      auVar308._4_4_ = fVar254 * fVar313 + fVar300 * fVar206 + fVar151 * fVar190 + fVar335 * fVar241
      ;
      auVar308._8_4_ = fVar205 * fVar285 + fVar301 * fVar309 + fVar154 * fVar235 + fVar336 * fVar248
      ;
      auVar308._12_4_ =
           fVar207 * fVar315 + fVar302 * fVar211 + fVar156 * fVar202 + fVar337 * fVar250;
      auVar308._16_4_ =
           fVar240 * fStack_570 + fVar299 * fVar310 + fVar149 * fVar236 + fVar330 * fVar252;
      auVar308._20_4_ =
           fVar254 * fStack_56c + fVar300 * fVar239 + fVar151 * fVar203 + fVar335 * fVar322;
      auVar308._24_4_ =
           fVar205 * fStack_568 + fVar301 * fVar312 + fVar154 * fVar237 + fVar336 * fVar188;
      auVar308._28_4_ = fVar156 + 0.0 + 0.0 + 0.0;
      auVar219 = vshufps_avx(auVar216,auVar216,0x55);
      register0x00001510 = auVar219;
      _local_280 = auVar219;
      fVar270 = auVar219._0_4_;
      fVar271 = auVar219._4_4_;
      fVar290 = auVar219._8_4_;
      fVar298 = auVar219._12_4_;
      auVar245._0_4_ = fVar270 * fVar311 + fVar209 * fVar153 + fVar226 * fVar225 + fVar242 * fVar204
      ;
      auVar245._4_4_ = fVar271 * fVar313 + fVar212 * fVar206 + fVar157 * fVar190 + fVar249 * fVar241
      ;
      auVar245._8_4_ = fVar290 * fVar285 + fVar288 * fVar309 + fVar173 * fVar235 + fVar251 * fVar248
      ;
      auVar245._12_4_ =
           fVar298 * fVar315 + fVar238 * fVar211 + fVar255 * fVar202 + fVar253 * fVar250;
      auVar245._16_4_ =
           fVar270 * fStack_570 + fVar209 * fVar310 + fVar226 * fVar236 + fVar242 * fVar252;
      auVar245._20_4_ =
           fVar271 * fStack_56c + fVar212 * fVar239 + fVar157 * fVar203 + fVar249 * fVar322;
      auVar245._24_4_ =
           fVar290 * fStack_568 + fVar288 * fVar312 + fVar173 * fVar237 + fVar251 * fVar188;
      auVar245._28_4_ = fVar156 + 0.0 + 0.0 + 0.0;
      auVar219 = vpermilps_avx(auVar16,0xff);
      register0x00001450 = auVar219;
      _local_2e0 = auVar219;
      fVar289 = auVar219._0_4_;
      fVar256 = auVar219._4_4_;
      fVar266 = auVar219._8_4_;
      fVar125 = fVar289 * fVar311 + fVar303 * fVar153 + fVar267 * fVar225 + fVar272 * fVar204;
      fVar143 = fVar256 * fVar313 + fVar327 * fVar206 + fVar268 * fVar190 + fVar278 * fVar241;
      fVar145 = fVar266 * fVar285 + fVar328 * fVar309 + fVar269 * fVar235 + fVar281 * fVar248;
      fVar147 = auVar219._12_4_ * fVar315 +
                fVar329 * fVar211 + auVar180._12_4_ * fVar202 + fVar282 * fVar250;
      fVar148 = fVar289 * fStack_570 + fVar303 * fVar310 + fVar267 * fVar236 + fVar272 * fVar252;
      fVar150 = fVar256 * fStack_56c + fVar327 * fVar239 + fVar268 * fVar203 + fVar278 * fVar322;
      fVar152 = fVar266 * fStack_568 + fVar328 * fVar312 + fVar269 * fVar237 + fVar281 * fVar188;
      fVar155 = *(float *)(bspline_basis0 + lVar116 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar204 = *(float *)(bspline_basis1 + lVar116 + 0x908);
      fVar241 = *(float *)(bspline_basis1 + lVar116 + 0x90c);
      fVar248 = *(float *)(bspline_basis1 + lVar116 + 0x910);
      fVar250 = *(float *)(bspline_basis1 + lVar116 + 0x914);
      fVar252 = *(float *)(bspline_basis1 + lVar116 + 0x918);
      fVar322 = *(float *)(bspline_basis1 + lVar116 + 0x91c);
      fVar188 = *(float *)(bspline_basis1 + lVar116 + 0x920);
      fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar116 + 0xd8c);
      fVar190 = *(float *)(bspline_basis1 + lVar116 + 0xd90);
      fVar235 = *(float *)(bspline_basis1 + lVar116 + 0xd94);
      fVar202 = *(float *)(bspline_basis1 + lVar116 + 0xd98);
      fVar236 = *(float *)(bspline_basis1 + lVar116 + 0xd9c);
      fVar203 = *(float *)(bspline_basis1 + lVar116 + 0xda0);
      fVar237 = *(float *)(bspline_basis1 + lVar116 + 0xda4);
      auVar109 = *(undefined1 (*) [28])(bspline_basis1 + lVar116 + 0xd8c);
      fVar314 = *(float *)(bspline_basis1 + lVar116 + 0x484);
      fVar208 = *(float *)(bspline_basis1 + lVar116 + 0x488);
      fVar286 = *(float *)(bspline_basis1 + lVar116 + 0x48c);
      fVar279 = *(float *)(bspline_basis1 + lVar116 + 0x490);
      fVar280 = *(float *)(bspline_basis1 + lVar116 + 0x494);
      fVar210 = *(float *)(bspline_basis1 + lVar116 + 0x498);
      fVar287 = *(float *)(bspline_basis1 + lVar116 + 0x49c);
      fVar189 = fVar302 + 0.0;
      fVar283 = *(float *)(bspline_basis1 + lVar116);
      fVar284 = *(float *)(bspline_basis1 + lVar116 + 4);
      fVar213 = *(float *)(bspline_basis1 + lVar116 + 8);
      fVar172 = *(float *)(bspline_basis1 + lVar116 + 0xc);
      fVar304 = *(float *)(bspline_basis1 + lVar116 + 0x10);
      fVar144 = *(float *)(bspline_basis1 + lVar116 + 0x14);
      fVar146 = *(float *)(bspline_basis1 + lVar116 + 0x18);
      auVar220._0_4_ = fVar283 * fVar240 + fVar299 * fVar314 + fVar204 * fVar149 + fVar330 * fVar225
      ;
      auVar220._4_4_ = fVar284 * fVar254 + fVar300 * fVar208 + fVar241 * fVar151 + fVar335 * fVar190
      ;
      auVar220._8_4_ = fVar213 * fVar205 + fVar301 * fVar286 + fVar248 * fVar154 + fVar336 * fVar235
      ;
      auVar220._12_4_ =
           fVar172 * fVar207 + fVar302 * fVar279 + fVar250 * fVar156 + fVar337 * fVar202;
      auVar220._16_4_ =
           fVar304 * fVar240 + fVar299 * fVar280 + fVar252 * fVar149 + fVar330 * fVar236;
      auVar220._20_4_ =
           fVar144 * fVar254 + fVar300 * fVar210 + fVar322 * fVar151 + fVar335 * fVar203;
      auVar220._24_4_ =
           fVar146 * fVar205 + fVar301 * fVar287 + fVar188 * fVar154 + fVar336 * fVar237;
      auVar220._28_4_ = fVar329 + fVar189;
      auVar195._0_4_ = fVar270 * fVar283 + fVar209 * fVar314 + fVar204 * fVar226 + fVar225 * fVar242
      ;
      auVar195._4_4_ = fVar271 * fVar284 + fVar212 * fVar208 + fVar241 * fVar157 + fVar190 * fVar249
      ;
      auVar195._8_4_ = fVar290 * fVar213 + fVar288 * fVar286 + fVar248 * fVar173 + fVar235 * fVar251
      ;
      auVar195._12_4_ =
           fVar298 * fVar172 + fVar238 * fVar279 + fVar250 * fVar255 + fVar202 * fVar253;
      auVar195._16_4_ =
           fVar270 * fVar304 + fVar209 * fVar280 + fVar252 * fVar226 + fVar236 * fVar242;
      auVar195._20_4_ =
           fVar271 * fVar144 + fVar212 * fVar210 + fVar322 * fVar157 + fVar203 * fVar249;
      auVar195._24_4_ =
           fVar290 * fVar146 + fVar288 * fVar287 + fVar188 * fVar173 + fVar237 * fVar251;
      auVar195._28_4_ = fVar189 + fVar302 + 0.0;
      auVar331._0_4_ = fVar303 * fVar314 + fVar267 * fVar204 + fVar272 * fVar225 + fVar289 * fVar283
      ;
      auVar331._4_4_ = fVar327 * fVar208 + fVar268 * fVar241 + fVar278 * fVar190 + fVar256 * fVar284
      ;
      auVar331._8_4_ = fVar328 * fVar286 + fVar269 * fVar248 + fVar281 * fVar235 + fVar266 * fVar213
      ;
      auVar331._12_4_ =
           fVar329 * fVar279 + auVar180._12_4_ * fVar250 + fVar282 * fVar202 +
           auVar219._12_4_ * fVar172;
      auVar331._16_4_ =
           fVar303 * fVar280 + fVar267 * fVar252 + fVar272 * fVar236 + fVar289 * fVar304;
      auVar331._20_4_ =
           fVar327 * fVar210 + fVar268 * fVar322 + fVar278 * fVar203 + fVar256 * fVar144;
      auVar331._24_4_ =
           fVar328 * fVar287 + fVar269 * fVar188 + fVar281 * fVar237 + fVar266 * fVar146;
      auVar331._28_4_ = fVar302 + fVar282 + 0.0 + fVar189;
      auVar17 = vsubps_avx(auVar220,auVar308);
      auVar18 = vsubps_avx(auVar195,auVar245);
      fVar272 = auVar17._0_4_;
      fVar278 = auVar17._4_4_;
      auVar169._4_4_ = fVar278 * auVar245._4_4_;
      auVar169._0_4_ = fVar272 * auVar245._0_4_;
      fVar281 = auVar17._8_4_;
      auVar169._8_4_ = fVar281 * auVar245._8_4_;
      fVar282 = auVar17._12_4_;
      auVar169._12_4_ = fVar282 * auVar245._12_4_;
      fVar289 = auVar17._16_4_;
      auVar169._16_4_ = fVar289 * auVar245._16_4_;
      fVar256 = auVar17._20_4_;
      auVar169._20_4_ = fVar256 * auVar245._20_4_;
      fVar266 = auVar17._24_4_;
      auVar169._24_4_ = fVar266 * auVar245._24_4_;
      auVar169._28_4_ = fVar189;
      fVar225 = auVar18._0_4_;
      fVar190 = auVar18._4_4_;
      auVar294._4_4_ = auVar308._4_4_ * fVar190;
      auVar294._0_4_ = auVar308._0_4_ * fVar225;
      fVar235 = auVar18._8_4_;
      auVar294._8_4_ = auVar308._8_4_ * fVar235;
      fVar202 = auVar18._12_4_;
      auVar294._12_4_ = auVar308._12_4_ * fVar202;
      fVar236 = auVar18._16_4_;
      auVar294._16_4_ = auVar308._16_4_ * fVar236;
      fVar203 = auVar18._20_4_;
      auVar294._20_4_ = auVar308._20_4_ * fVar203;
      fVar237 = auVar18._24_4_;
      auVar294._24_4_ = auVar308._24_4_ * fVar237;
      auVar294._28_4_ = auVar195._28_4_;
      auVar294 = vsubps_avx(auVar169,auVar294);
      auVar15._4_4_ = fVar143;
      auVar15._0_4_ = fVar125;
      auVar15._8_4_ = fVar145;
      auVar15._12_4_ = fVar147;
      auVar15._16_4_ = fVar148;
      auVar15._20_4_ = fVar150;
      auVar15._24_4_ = fVar152;
      auVar15._28_4_ = fVar155;
      auVar169 = vmaxps_avx(auVar15,auVar331);
      auVar23._4_4_ = auVar169._4_4_ * auVar169._4_4_ * (fVar278 * fVar278 + fVar190 * fVar190);
      auVar23._0_4_ = auVar169._0_4_ * auVar169._0_4_ * (fVar272 * fVar272 + fVar225 * fVar225);
      auVar23._8_4_ = auVar169._8_4_ * auVar169._8_4_ * (fVar281 * fVar281 + fVar235 * fVar235);
      auVar23._12_4_ = auVar169._12_4_ * auVar169._12_4_ * (fVar282 * fVar282 + fVar202 * fVar202);
      auVar23._16_4_ = auVar169._16_4_ * auVar169._16_4_ * (fVar289 * fVar289 + fVar236 * fVar236);
      auVar23._20_4_ = auVar169._20_4_ * auVar169._20_4_ * (fVar256 * fVar256 + fVar203 * fVar203);
      auVar23._24_4_ = auVar169._24_4_ * auVar169._24_4_ * (fVar266 * fVar266 + fVar237 * fVar237);
      auVar23._28_4_ = auVar18._28_4_ + auVar195._28_4_;
      auVar14._4_4_ = auVar294._4_4_ * auVar294._4_4_;
      auVar14._0_4_ = auVar294._0_4_ * auVar294._0_4_;
      auVar14._8_4_ = auVar294._8_4_ * auVar294._8_4_;
      auVar14._12_4_ = auVar294._12_4_ * auVar294._12_4_;
      auVar14._16_4_ = auVar294._16_4_ * auVar294._16_4_;
      auVar14._20_4_ = auVar294._20_4_ * auVar294._20_4_;
      auVar14._24_4_ = auVar294._24_4_ * auVar294._24_4_;
      auVar14._28_4_ = auVar294._28_4_;
      auVar169 = vcmpps_avx(auVar14,auVar23,2);
      auVar180 = ZEXT416((uint)(float)(int)uVar10);
      local_540._0_16_ = auVar180;
      auVar180 = vshufps_avx(auVar180,auVar180,0);
      auVar196._16_16_ = auVar180;
      auVar196._0_16_ = auVar180;
      auVar294 = vcmpps_avx(_DAT_01faff40,auVar196,1);
      auVar201 = ZEXT3264(auVar294);
      auVar180 = vpermilps_avx(auVar216,0xaa);
      register0x00001450 = auVar180;
      _local_600 = auVar180;
      auVar101._8_4_ = auVar217._8_4_;
      auVar101._0_8_ = auVar217._0_8_;
      auVar101._12_4_ = auVar217._12_4_;
      auVar219 = vpermilps_avx(auVar101,0xaa);
      register0x00001550 = auVar219;
      _local_c0 = auVar219;
      auVar194 = vpermilps_avx(auVar218,0xaa);
      register0x00001590 = auVar194;
      _local_e0 = auVar194;
      auVar229 = vpermilps_avx(auVar244,0xaa);
      auVar23 = auVar294 & auVar169;
      uVar8 = *(uint *)(ray + k * 4 + 0x60);
      auVar230 = ZEXT416((uint)(auVar230._0_4_ * 4.7683716e-07));
      local_910 = auVar16._0_4_;
      fStack_90c = auVar16._4_4_;
      fStack_908 = auVar16._8_4_;
      fStack_904 = auVar16._12_4_;
      local_3f0 = auVar16._0_8_;
      uVar113 = local_3f0;
      uStack_3e8 = auVar16._8_8_;
      uVar114 = uStack_3e8;
      fVar202 = auVar229._0_4_;
      fVar236 = auVar229._4_4_;
      fVar203 = auVar229._8_4_;
      fVar237 = auVar229._12_4_;
      fVar225 = fVar226;
      fVar190 = fVar157;
      fVar235 = fVar173;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        pRVar117 = (RTCIntersectArguments *)0x0;
        auVar277 = ZEXT3264(auVar274);
        auVar297 = ZEXT3264(auVar233);
      }
      else {
        local_5c0._0_8_ = pGVar11;
        local_4a0 = vandps_avx(auVar169,auVar294);
        fVar189 = auVar180._0_4_;
        fVar272 = auVar180._4_4_;
        fVar278 = auVar180._8_4_;
        fVar281 = auVar180._12_4_;
        fVar282 = auVar219._0_4_;
        fVar289 = auVar219._4_4_;
        fVar256 = auVar219._8_4_;
        fVar266 = auVar219._12_4_;
        fVar267 = auVar194._0_4_;
        fVar268 = auVar194._4_4_;
        fVar269 = auVar194._8_4_;
        fVar303 = auVar194._12_4_;
        local_5a0._0_4_ = auVar109._0_4_;
        local_5a0._4_4_ = auVar109._4_4_;
        fStack_598 = auVar109._8_4_;
        fStack_594 = auVar109._12_4_;
        fStack_590 = auVar109._16_4_;
        fStack_58c = auVar109._20_4_;
        fStack_588 = auVar109._24_4_;
        local_5a0._0_4_ =
             fVar189 * fVar283 +
             fVar282 * fVar314 + fVar267 * fVar204 + fVar202 * (float)local_5a0._0_4_;
        local_5a0._4_4_ =
             fVar272 * fVar284 +
             fVar289 * fVar208 + fVar268 * fVar241 + fVar236 * (float)local_5a0._4_4_;
        fStack_598 = fVar278 * fVar213 +
                     fVar256 * fVar286 + fVar269 * fVar248 + fVar203 * fStack_598;
        fStack_594 = fVar281 * fVar172 +
                     fVar266 * fVar279 + fVar303 * fVar250 + fVar237 * fStack_594;
        fStack_590 = fVar189 * fVar304 +
                     fVar282 * fVar280 + fVar267 * fVar252 + fVar202 * fStack_590;
        fStack_58c = fVar272 * fVar144 +
                     fVar289 * fVar210 + fVar268 * fVar322 + fVar236 * fStack_58c;
        fStack_588 = fVar278 * fVar146 +
                     fVar256 * fVar287 + fVar269 * fVar188 + fVar203 * fStack_588;
        fStack_584 = local_4a0._28_4_ +
                     auVar294._28_4_ + *(float *)(bspline_basis1 + lVar116 + 0x924) + 0.0;
        local_660._0_4_ = auVar108._0_4_;
        local_660._4_4_ = auVar108._4_4_;
        uStack_658._0_4_ = auVar108._8_4_;
        uStack_658._4_4_ = auVar108._12_4_;
        uStack_650._0_4_ = auVar108._16_4_;
        uStack_650._4_4_ = auVar108._20_4_;
        uStack_648._0_4_ = auVar108._24_4_;
        local_840._0_4_ = auVar107._0_4_;
        local_840._4_4_ = auVar107._4_4_;
        uStack_838._0_4_ = auVar107._8_4_;
        uStack_838._4_4_ = auVar107._12_4_;
        fStack_830 = auVar107._16_4_;
        fStack_82c = auVar107._20_4_;
        fStack_828 = auVar107._24_4_;
        local_660._0_4_ =
             fVar189 * fVar311 +
             fVar282 * fVar153 + fVar267 * (float)local_660._0_4_ + fVar202 * (float)local_840._0_4_
        ;
        local_660._4_4_ =
             fVar272 * fVar313 +
             fVar289 * fVar206 + fVar268 * (float)local_660._4_4_ + fVar236 * (float)local_840._4_4_
        ;
        uStack_658._0_4_ =
             fVar278 * fVar285 +
             fVar256 * fVar309 + fVar269 * (float)uStack_658 + fVar203 * (float)uStack_838;
        uStack_658._4_4_ =
             fVar281 * fVar315 +
             fVar266 * fVar211 + fVar303 * uStack_658._4_4_ + fVar237 * uStack_838._4_4_;
        uStack_650._0_4_ =
             fVar189 * fStack_570 +
             fVar282 * fVar310 + fVar267 * (float)uStack_650 + fVar202 * fStack_830;
        uStack_650._4_4_ =
             fVar272 * fStack_56c +
             fVar289 * fVar239 + fVar268 * uStack_650._4_4_ + fVar236 * fStack_82c;
        uStack_648._0_4_ =
             fVar278 * fStack_568 +
             fVar256 * fVar312 + fVar269 * (float)uStack_648 + fVar203 * fStack_828;
        uStack_648._4_4_ = fVar298 + fStack_584 + local_4a0._28_4_ + auVar294._28_4_;
        fVar204 = *(float *)(bspline_basis0 + lVar116 + 0x1210);
        fVar241 = *(float *)(bspline_basis0 + lVar116 + 0x1214);
        fVar248 = *(float *)(bspline_basis0 + lVar116 + 0x1218);
        fVar250 = *(float *)(bspline_basis0 + lVar116 + 0x121c);
        fVar252 = *(float *)(bspline_basis0 + lVar116 + 0x1220);
        fVar322 = *(float *)(bspline_basis0 + lVar116 + 0x1224);
        fVar188 = *(float *)(bspline_basis0 + lVar116 + 0x1228);
        fVar153 = *(float *)(bspline_basis0 + lVar116 + 0x1694);
        fVar206 = *(float *)(bspline_basis0 + lVar116 + 0x1698);
        fVar309 = *(float *)(bspline_basis0 + lVar116 + 0x169c);
        fVar211 = *(float *)(bspline_basis0 + lVar116 + 0x16a0);
        fVar310 = *(float *)(bspline_basis0 + lVar116 + 0x16a4);
        fVar239 = *(float *)(bspline_basis0 + lVar116 + 0x16a8);
        fVar312 = *(float *)(bspline_basis0 + lVar116 + 0x16ac);
        fVar311 = *(float *)(bspline_basis0 + lVar116 + 0x1b18);
        fVar313 = *(float *)(bspline_basis0 + lVar116 + 0x1b1c);
        fVar285 = *(float *)(bspline_basis0 + lVar116 + 0x1b20);
        fVar315 = *(float *)(bspline_basis0 + lVar116 + 0x1b24);
        fVar314 = *(float *)(bspline_basis0 + lVar116 + 0x1b28);
        fVar208 = *(float *)(bspline_basis0 + lVar116 + 0x1b2c);
        fVar286 = *(float *)(bspline_basis0 + lVar116 + 0x1b30);
        fVar279 = *(float *)(bspline_basis0 + lVar116 + 0x1f9c);
        fVar280 = *(float *)(bspline_basis0 + lVar116 + 0x1fa0);
        fVar210 = *(float *)(bspline_basis0 + lVar116 + 0x1fa4);
        fVar287 = *(float *)(bspline_basis0 + lVar116 + 0x1fa8);
        fVar283 = *(float *)(bspline_basis0 + lVar116 + 0x1fac);
        fVar284 = *(float *)(bspline_basis0 + lVar116 + 0x1fb0);
        fVar213 = *(float *)(bspline_basis0 + lVar116 + 0x1fb4);
        fVar172 = *(float *)(bspline_basis0 + lVar116 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar116 + 0x1fb8);
        fVar304 = *(float *)(bspline_basis0 + lVar116 + 0x16b0) + fVar172;
        local_620 = fVar240 * fVar204 + fVar299 * fVar153 + fVar149 * fVar311 + fVar330 * fVar279;
        fStack_61c = fVar254 * fVar241 + fVar300 * fVar206 + fVar151 * fVar313 + fVar335 * fVar280;
        fStack_618 = fVar205 * fVar248 + fVar301 * fVar309 + fVar154 * fVar285 + fVar336 * fVar210;
        fStack_614 = fVar207 * fVar250 + fVar302 * fVar211 + fVar156 * fVar315 + fVar337 * fVar287;
        fStack_610 = fVar240 * fVar252 + fVar299 * fVar310 + fVar149 * fVar314 + fVar330 * fVar283;
        fStack_60c = fVar254 * fVar322 + fVar300 * fVar239 + fVar151 * fVar208 + fVar335 * fVar284;
        fStack_608 = fVar205 * fVar188 + fVar301 * fVar312 + fVar154 * fVar286 + fVar336 * fVar213;
        fStack_604 = *(float *)(bspline_basis0 + lVar116 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar116 + 0x1fb8) +
                     fVar281 + *(float *)(bspline_basis1 + lVar116 + 0x4a0);
        auVar260._0_4_ =
             fVar270 * fVar204 + fVar226 * fVar311 + fVar242 * fVar279 + fVar209 * fVar153;
        auVar260._4_4_ =
             fVar271 * fVar241 + fVar157 * fVar313 + fVar249 * fVar280 + fVar212 * fVar206;
        auVar260._8_4_ =
             fVar290 * fVar248 + fVar173 * fVar285 + fVar251 * fVar210 + fVar288 * fVar309;
        auVar260._12_4_ =
             fVar298 * fVar250 + fVar255 * fVar315 + fVar253 * fVar287 + fVar238 * fVar211;
        auVar260._16_4_ =
             fVar270 * fVar252 + fVar226 * fVar314 + fVar242 * fVar283 + fVar209 * fVar310;
        auVar260._20_4_ =
             fVar271 * fVar322 + fVar157 * fVar208 + fVar249 * fVar284 + fVar212 * fVar239;
        auVar260._24_4_ =
             fVar290 * fVar188 + fVar173 * fVar286 + fVar251 * fVar213 + fVar288 * fVar312;
        auVar260._28_4_ =
             fVar172 + fVar281 + *(float *)(bspline_basis1 + lVar116 + 0x1c) +
                       fVar281 + *(float *)(bspline_basis1 + lVar116 + 0x4a0);
        local_580 = fVar282 * fVar153 + fVar267 * fVar311 + fVar202 * fVar279 + fVar189 * fVar204;
        fStack_57c = fVar289 * fVar206 + fVar268 * fVar313 + fVar236 * fVar280 + fVar272 * fVar241;
        fStack_578 = fVar256 * fVar309 + fVar269 * fVar285 + fVar203 * fVar210 + fVar278 * fVar248;
        fStack_574 = fVar266 * fVar211 + fVar303 * fVar315 + fVar237 * fVar287 + fVar281 * fVar250;
        fStack_570 = fVar282 * fVar310 + fVar267 * fVar314 + fVar202 * fVar283 + fVar189 * fVar252;
        fStack_56c = fVar289 * fVar239 + fVar268 * fVar208 + fVar236 * fVar284 + fVar272 * fVar322;
        fStack_568 = fVar256 * fVar312 + fVar269 * fVar286 + fVar203 * fVar213 + fVar278 * fVar188;
        fStack_564 = fVar304 + *(float *)(bspline_basis0 + lVar116 + 0x122c);
        fVar204 = *(float *)(bspline_basis1 + lVar116 + 0x1b18);
        fVar241 = *(float *)(bspline_basis1 + lVar116 + 0x1b1c);
        fVar248 = *(float *)(bspline_basis1 + lVar116 + 0x1b20);
        fVar250 = *(float *)(bspline_basis1 + lVar116 + 0x1b24);
        fVar252 = *(float *)(bspline_basis1 + lVar116 + 0x1b28);
        fVar322 = *(float *)(bspline_basis1 + lVar116 + 0x1b2c);
        fVar188 = *(float *)(bspline_basis1 + lVar116 + 0x1b30);
        fVar153 = *(float *)(bspline_basis1 + lVar116 + 0x1f9c);
        fVar206 = *(float *)(bspline_basis1 + lVar116 + 0x1fa0);
        fVar309 = *(float *)(bspline_basis1 + lVar116 + 0x1fa4);
        fVar211 = *(float *)(bspline_basis1 + lVar116 + 0x1fa8);
        fVar310 = *(float *)(bspline_basis1 + lVar116 + 0x1fac);
        fVar239 = *(float *)(bspline_basis1 + lVar116 + 0x1fb0);
        fVar312 = *(float *)(bspline_basis1 + lVar116 + 0x1fb4);
        fVar311 = *(float *)(bspline_basis1 + lVar116 + 0x1694);
        fVar313 = *(float *)(bspline_basis1 + lVar116 + 0x1698);
        fVar285 = *(float *)(bspline_basis1 + lVar116 + 0x169c);
        fVar315 = *(float *)(bspline_basis1 + lVar116 + 0x16a0);
        fVar314 = *(float *)(bspline_basis1 + lVar116 + 0x16a4);
        fVar208 = *(float *)(bspline_basis1 + lVar116 + 0x16a8);
        fVar286 = *(float *)(bspline_basis1 + lVar116 + 0x16ac);
        fVar279 = *(float *)(bspline_basis1 + lVar116 + 0x1210);
        fVar280 = *(float *)(bspline_basis1 + lVar116 + 0x1214);
        fVar210 = *(float *)(bspline_basis1 + lVar116 + 0x1218);
        fVar287 = *(float *)(bspline_basis1 + lVar116 + 0x121c);
        fVar283 = *(float *)(bspline_basis1 + lVar116 + 0x1220);
        fVar284 = *(float *)(bspline_basis1 + lVar116 + 0x1224);
        fVar213 = *(float *)(bspline_basis1 + lVar116 + 0x1228);
        auVar275._0_4_ =
             fVar240 * fVar279 + fVar299 * fVar311 + fVar149 * fVar204 + fVar330 * fVar153;
        auVar275._4_4_ =
             fVar254 * fVar280 + fVar300 * fVar313 + fVar151 * fVar241 + fVar335 * fVar206;
        auVar275._8_4_ =
             fVar205 * fVar210 + fVar301 * fVar285 + fVar154 * fVar248 + fVar336 * fVar309;
        auVar275._12_4_ =
             fVar207 * fVar287 + fVar302 * fVar315 + fVar156 * fVar250 + fVar337 * fVar211;
        auVar275._16_4_ =
             fVar240 * fVar283 + fVar299 * fVar314 + fVar149 * fVar252 + fVar330 * fVar310;
        auVar275._20_4_ =
             fVar254 * fVar284 + fVar300 * fVar208 + fVar151 * fVar322 + fVar335 * fVar239;
        auVar275._24_4_ =
             fVar205 * fVar213 + fVar301 * fVar286 + fVar154 * fVar188 + fVar336 * fVar312;
        auVar275._28_4_ = fVar255 + fVar255 + fVar304 + fVar337;
        auVar292._0_4_ =
             fVar270 * fVar279 + fVar209 * fVar311 + fVar226 * fVar204 + fVar242 * fVar153;
        auVar292._4_4_ =
             fVar271 * fVar280 + fVar212 * fVar313 + fVar157 * fVar241 + fVar249 * fVar206;
        auVar292._8_4_ =
             fVar290 * fVar210 + fVar288 * fVar285 + fVar173 * fVar248 + fVar251 * fVar309;
        auVar292._12_4_ =
             fVar298 * fVar287 + fVar238 * fVar315 + fVar255 * fVar250 + fVar253 * fVar211;
        auVar292._16_4_ =
             fVar270 * fVar283 + fVar209 * fVar314 + fVar226 * fVar252 + fVar242 * fVar310;
        auVar292._20_4_ =
             fVar271 * fVar284 + fVar212 * fVar208 + fVar157 * fVar322 + fVar249 * fVar239;
        auVar292._24_4_ =
             fVar290 * fVar213 + fVar288 * fVar286 + fVar173 * fVar188 + fVar251 * fVar312;
        auVar292._28_4_ = fVar255 + fVar255 + fVar255 + fVar304;
        auVar182._0_4_ =
             fVar189 * fVar279 + fVar282 * fVar311 + fVar267 * fVar204 + fVar202 * fVar153;
        auVar182._4_4_ =
             fVar272 * fVar280 + fVar289 * fVar313 + fVar268 * fVar241 + fVar236 * fVar206;
        auVar182._8_4_ =
             fVar278 * fVar210 + fVar256 * fVar285 + fVar269 * fVar248 + fVar203 * fVar309;
        auVar182._12_4_ =
             fVar281 * fVar287 + fVar266 * fVar315 + fVar303 * fVar250 + fVar237 * fVar211;
        auVar182._16_4_ =
             fVar189 * fVar283 + fVar282 * fVar314 + fVar267 * fVar252 + fVar202 * fVar310;
        auVar182._20_4_ =
             fVar272 * fVar284 + fVar289 * fVar208 + fVar268 * fVar322 + fVar236 * fVar239;
        auVar182._24_4_ =
             fVar278 * fVar213 + fVar256 * fVar286 + fVar269 * fVar188 + fVar203 * fVar312;
        auVar182._28_4_ =
             *(float *)(bspline_basis1 + lVar116 + 0x122c) +
             *(float *)(bspline_basis1 + lVar116 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar116 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar116 + 0x1fb8);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar103._4_4_ = fStack_61c;
        auVar103._0_4_ = local_620;
        auVar103._8_4_ = fStack_618;
        auVar103._12_4_ = fStack_614;
        auVar103._16_4_ = fStack_610;
        auVar103._20_4_ = fStack_60c;
        auVar103._24_4_ = fStack_608;
        auVar103._28_4_ = fStack_604;
        auVar169 = vandps_avx(auVar103,auVar221);
        auVar294 = vandps_avx(auVar260,auVar221);
        auVar294 = vmaxps_avx(auVar169,auVar294);
        auVar106._4_4_ = fStack_57c;
        auVar106._0_4_ = local_580;
        auVar106._8_4_ = fStack_578;
        auVar106._12_4_ = fStack_574;
        auVar106._16_4_ = fStack_570;
        auVar106._20_4_ = fStack_56c;
        auVar106._24_4_ = fStack_568;
        auVar106._28_4_ = fStack_564;
        auVar169 = vandps_avx(auVar221,auVar106);
        auVar169 = vmaxps_avx(auVar294,auVar169);
        auVar16 = vpermilps_avx(auVar230,0);
        auVar261._16_16_ = auVar16;
        auVar261._0_16_ = auVar16;
        auVar169 = vcmpps_avx(auVar169,auVar261,1);
        auVar23 = vblendvps_avx(auVar103,auVar17,auVar169);
        auVar14 = vblendvps_avx(auVar260,auVar18,auVar169);
        auVar169 = vandps_avx(auVar275,auVar221);
        auVar294 = vandps_avx(auVar292,auVar221);
        auVar15 = vmaxps_avx(auVar169,auVar294);
        auVar169 = vandps_avx(auVar182,auVar221);
        auVar169 = vmaxps_avx(auVar15,auVar169);
        auVar15 = vcmpps_avx(auVar169,auVar261,1);
        auVar169 = vblendvps_avx(auVar275,auVar17,auVar15);
        auVar17 = vblendvps_avx(auVar292,auVar18,auVar15);
        fVar304 = auVar23._0_4_;
        fVar144 = auVar23._4_4_;
        fVar146 = auVar23._8_4_;
        fVar149 = auVar23._12_4_;
        fVar151 = auVar23._16_4_;
        fVar154 = auVar23._20_4_;
        fVar156 = auVar23._24_4_;
        fVar189 = auVar169._0_4_;
        fVar240 = auVar169._4_4_;
        fVar254 = auVar169._8_4_;
        fVar205 = auVar169._12_4_;
        fVar207 = auVar169._16_4_;
        fVar209 = auVar169._20_4_;
        fVar212 = auVar169._24_4_;
        fVar288 = -auVar169._28_4_;
        fVar204 = auVar14._0_4_;
        fVar252 = auVar14._4_4_;
        fVar206 = auVar14._8_4_;
        fVar239 = auVar14._12_4_;
        fVar285 = auVar14._16_4_;
        fVar286 = auVar14._20_4_;
        fVar287 = auVar14._24_4_;
        auVar133._0_4_ = fVar204 * fVar204 + fVar304 * fVar304;
        auVar133._4_4_ = fVar252 * fVar252 + fVar144 * fVar144;
        auVar133._8_4_ = fVar206 * fVar206 + fVar146 * fVar146;
        auVar133._12_4_ = fVar239 * fVar239 + fVar149 * fVar149;
        auVar133._16_4_ = fVar285 * fVar285 + fVar151 * fVar151;
        auVar133._20_4_ = fVar286 * fVar286 + fVar154 * fVar154;
        auVar133._24_4_ = fVar287 * fVar287 + fVar156 * fVar156;
        auVar133._28_4_ = auVar292._28_4_ + auVar23._28_4_;
        auVar18 = vrsqrtps_avx(auVar133);
        fVar241 = auVar18._0_4_;
        fVar248 = auVar18._4_4_;
        auVar19._4_4_ = fVar248 * 1.5;
        auVar19._0_4_ = fVar241 * 1.5;
        fVar250 = auVar18._8_4_;
        auVar19._8_4_ = fVar250 * 1.5;
        fVar322 = auVar18._12_4_;
        auVar19._12_4_ = fVar322 * 1.5;
        fVar188 = auVar18._16_4_;
        auVar19._16_4_ = fVar188 * 1.5;
        fVar153 = auVar18._20_4_;
        auVar19._20_4_ = fVar153 * 1.5;
        fVar309 = auVar18._24_4_;
        fVar172 = auVar294._28_4_;
        auVar19._24_4_ = fVar309 * 1.5;
        auVar19._28_4_ = fVar172;
        auVar18._4_4_ = fVar248 * fVar248 * fVar248 * auVar133._4_4_ * 0.5;
        auVar18._0_4_ = fVar241 * fVar241 * fVar241 * auVar133._0_4_ * 0.5;
        auVar18._8_4_ = fVar250 * fVar250 * fVar250 * auVar133._8_4_ * 0.5;
        auVar18._12_4_ = fVar322 * fVar322 * fVar322 * auVar133._12_4_ * 0.5;
        auVar18._16_4_ = fVar188 * fVar188 * fVar188 * auVar133._16_4_ * 0.5;
        auVar18._20_4_ = fVar153 * fVar153 * fVar153 * auVar133._20_4_ * 0.5;
        auVar18._24_4_ = fVar309 * fVar309 * fVar309 * auVar133._24_4_ * 0.5;
        auVar18._28_4_ = auVar133._28_4_;
        auVar294 = vsubps_avx(auVar19,auVar18);
        fVar241 = auVar294._0_4_;
        fVar322 = auVar294._4_4_;
        fVar309 = auVar294._8_4_;
        fVar312 = auVar294._12_4_;
        fVar315 = auVar294._16_4_;
        fVar279 = auVar294._20_4_;
        fVar283 = auVar294._24_4_;
        fVar248 = auVar17._0_4_;
        fVar188 = auVar17._4_4_;
        fVar211 = auVar17._8_4_;
        fVar311 = auVar17._12_4_;
        fVar314 = auVar17._16_4_;
        fVar280 = auVar17._20_4_;
        fVar284 = auVar17._24_4_;
        auVar134._0_4_ = fVar248 * fVar248 + fVar189 * fVar189;
        auVar134._4_4_ = fVar188 * fVar188 + fVar240 * fVar240;
        auVar134._8_4_ = fVar211 * fVar211 + fVar254 * fVar254;
        auVar134._12_4_ = fVar311 * fVar311 + fVar205 * fVar205;
        auVar134._16_4_ = fVar314 * fVar314 + fVar207 * fVar207;
        auVar134._20_4_ = fVar280 * fVar280 + fVar209 * fVar209;
        auVar134._24_4_ = fVar284 * fVar284 + fVar212 * fVar212;
        auVar134._28_4_ = auVar169._28_4_ + auVar294._28_4_;
        auVar169 = vrsqrtps_avx(auVar134);
        fVar250 = auVar169._0_4_;
        fVar153 = auVar169._4_4_;
        auVar20._4_4_ = fVar153 * 1.5;
        auVar20._0_4_ = fVar250 * 1.5;
        fVar310 = auVar169._8_4_;
        auVar20._8_4_ = fVar310 * 1.5;
        fVar313 = auVar169._12_4_;
        auVar20._12_4_ = fVar313 * 1.5;
        fVar208 = auVar169._16_4_;
        auVar20._16_4_ = fVar208 * 1.5;
        fVar210 = auVar169._20_4_;
        auVar20._20_4_ = fVar210 * 1.5;
        fVar213 = auVar169._24_4_;
        auVar20._24_4_ = fVar213 * 1.5;
        auVar20._28_4_ = fVar172;
        auVar21._4_4_ = fVar153 * fVar153 * fVar153 * auVar134._4_4_ * 0.5;
        auVar21._0_4_ = fVar250 * fVar250 * fVar250 * auVar134._0_4_ * 0.5;
        auVar21._8_4_ = fVar310 * fVar310 * fVar310 * auVar134._8_4_ * 0.5;
        auVar21._12_4_ = fVar313 * fVar313 * fVar313 * auVar134._12_4_ * 0.5;
        auVar21._16_4_ = fVar208 * fVar208 * fVar208 * auVar134._16_4_ * 0.5;
        auVar21._20_4_ = fVar210 * fVar210 * fVar210 * auVar134._20_4_ * 0.5;
        auVar21._24_4_ = fVar213 * fVar213 * fVar213 * auVar134._24_4_ * 0.5;
        auVar21._28_4_ = auVar134._28_4_;
        auVar169 = vsubps_avx(auVar20,auVar21);
        fVar250 = auVar169._0_4_;
        fVar153 = auVar169._4_4_;
        fVar310 = auVar169._8_4_;
        fVar313 = auVar169._12_4_;
        fVar208 = auVar169._16_4_;
        fVar210 = auVar169._20_4_;
        fVar213 = auVar169._24_4_;
        fVar204 = fVar125 * fVar204 * fVar241;
        fVar252 = fVar143 * fVar252 * fVar322;
        auVar22._4_4_ = fVar252;
        auVar22._0_4_ = fVar204;
        fVar206 = fVar145 * fVar206 * fVar309;
        auVar22._8_4_ = fVar206;
        fVar239 = fVar147 * fVar239 * fVar312;
        auVar22._12_4_ = fVar239;
        fVar285 = fVar148 * fVar285 * fVar315;
        auVar22._16_4_ = fVar285;
        fVar286 = fVar150 * fVar286 * fVar279;
        auVar22._20_4_ = fVar286;
        fVar287 = fVar152 * fVar287 * fVar283;
        auVar22._24_4_ = fVar287;
        auVar22._28_4_ = fVar288;
        local_840._4_4_ = fVar252 + auVar308._4_4_;
        local_840._0_4_ = fVar204 + auVar308._0_4_;
        uStack_838._0_4_ = fVar206 + auVar308._8_4_;
        uStack_838._4_4_ = fVar239 + auVar308._12_4_;
        fStack_830 = fVar285 + auVar308._16_4_;
        fStack_82c = fVar286 + auVar308._20_4_;
        fStack_828 = fVar287 + auVar308._24_4_;
        fStack_824 = fVar288 + auVar308._28_4_;
        fVar204 = fVar125 * fVar241 * -fVar304;
        fVar252 = fVar143 * fVar322 * -fVar144;
        auVar24._4_4_ = fVar252;
        auVar24._0_4_ = fVar204;
        fVar206 = fVar145 * fVar309 * -fVar146;
        auVar24._8_4_ = fVar206;
        fVar239 = fVar147 * fVar312 * -fVar149;
        auVar24._12_4_ = fVar239;
        fVar285 = fVar148 * fVar315 * -fVar151;
        auVar24._16_4_ = fVar285;
        fVar286 = fVar150 * fVar279 * -fVar154;
        auVar24._20_4_ = fVar286;
        fVar287 = fVar152 * fVar283 * -fVar156;
        auVar24._24_4_ = fVar287;
        auVar24._28_4_ = fVar172;
        local_680._4_4_ = fVar252 + auVar245._4_4_;
        local_680._0_4_ = fVar204 + auVar245._0_4_;
        fStack_678 = fVar206 + auVar245._8_4_;
        fStack_674 = fVar239 + auVar245._12_4_;
        fStack_670 = fVar285 + auVar245._16_4_;
        fStack_66c = fVar286 + auVar245._20_4_;
        fStack_668 = fVar287 + auVar245._24_4_;
        fStack_664 = fVar172 + auVar245._28_4_;
        fVar204 = fVar241 * 0.0 * fVar125;
        fVar241 = fVar322 * 0.0 * fVar143;
        auVar25._4_4_ = fVar241;
        auVar25._0_4_ = fVar204;
        fVar252 = fVar309 * 0.0 * fVar145;
        auVar25._8_4_ = fVar252;
        fVar322 = fVar312 * 0.0 * fVar147;
        auVar25._12_4_ = fVar322;
        fVar206 = fVar315 * 0.0 * fVar148;
        auVar25._16_4_ = fVar206;
        fVar309 = fVar279 * 0.0 * fVar150;
        auVar25._20_4_ = fVar309;
        fVar239 = fVar283 * 0.0 * fVar152;
        auVar25._24_4_ = fVar239;
        auVar25._28_4_ = fVar253;
        auVar262._0_4_ = fVar204 + (float)local_660._0_4_;
        auVar262._4_4_ = fVar241 + (float)local_660._4_4_;
        auVar262._8_4_ = fVar252 + (float)uStack_658;
        auVar262._12_4_ = fVar322 + uStack_658._4_4_;
        auVar262._16_4_ = fVar206 + (float)uStack_650;
        auVar262._20_4_ = fVar309 + uStack_650._4_4_;
        auVar262._24_4_ = fVar239 + (float)uStack_648;
        auVar262._28_4_ = fVar253 + uStack_648._4_4_;
        fVar204 = auVar331._0_4_ * fVar248 * fVar250;
        fVar241 = auVar331._4_4_ * fVar188 * fVar153;
        auVar26._4_4_ = fVar241;
        auVar26._0_4_ = fVar204;
        fVar248 = auVar331._8_4_ * fVar211 * fVar310;
        auVar26._8_4_ = fVar248;
        fVar252 = auVar331._12_4_ * fVar311 * fVar313;
        auVar26._12_4_ = fVar252;
        fVar322 = auVar331._16_4_ * fVar314 * fVar208;
        auVar26._16_4_ = fVar322;
        fVar188 = auVar331._20_4_ * fVar280 * fVar210;
        auVar26._20_4_ = fVar188;
        fVar206 = auVar331._24_4_ * fVar284 * fVar213;
        auVar26._24_4_ = fVar206;
        auVar26._28_4_ = auVar17._28_4_;
        auVar15 = vsubps_avx(auVar308,auVar22);
        auVar293._0_4_ = auVar220._0_4_ + fVar204;
        auVar293._4_4_ = auVar220._4_4_ + fVar241;
        auVar293._8_4_ = auVar220._8_4_ + fVar248;
        auVar293._12_4_ = auVar220._12_4_ + fVar252;
        auVar293._16_4_ = auVar220._16_4_ + fVar322;
        auVar293._20_4_ = auVar220._20_4_ + fVar188;
        auVar293._24_4_ = auVar220._24_4_ + fVar206;
        auVar293._28_4_ = auVar220._28_4_ + auVar17._28_4_;
        fVar204 = auVar331._0_4_ * -fVar189 * fVar250;
        fVar241 = auVar331._4_4_ * -fVar240 * fVar153;
        auVar17._4_4_ = fVar241;
        auVar17._0_4_ = fVar204;
        fVar248 = auVar331._8_4_ * -fVar254 * fVar310;
        auVar17._8_4_ = fVar248;
        fVar252 = auVar331._12_4_ * -fVar205 * fVar313;
        auVar17._12_4_ = fVar252;
        fVar322 = auVar331._16_4_ * -fVar207 * fVar208;
        auVar17._16_4_ = fVar322;
        fVar188 = auVar331._20_4_ * -fVar209 * fVar210;
        auVar17._20_4_ = fVar188;
        fVar206 = auVar331._24_4_ * -fVar212 * fVar213;
        auVar17._24_4_ = fVar206;
        auVar17._28_4_ = fVar266;
        auVar196 = vsubps_avx(auVar245,auVar24);
        auVar305._0_4_ = fVar204 + auVar195._0_4_;
        auVar305._4_4_ = fVar241 + auVar195._4_4_;
        auVar305._8_4_ = fVar248 + auVar195._8_4_;
        auVar305._12_4_ = fVar252 + auVar195._12_4_;
        auVar305._16_4_ = fVar322 + auVar195._16_4_;
        auVar305._20_4_ = fVar188 + auVar195._20_4_;
        auVar305._24_4_ = fVar206 + auVar195._24_4_;
        auVar305._28_4_ = fVar266 + auVar195._28_4_;
        fVar204 = fVar250 * 0.0 * auVar331._0_4_;
        fVar241 = fVar153 * 0.0 * auVar331._4_4_;
        auVar27._4_4_ = fVar241;
        auVar27._0_4_ = fVar204;
        fVar248 = fVar310 * 0.0 * auVar331._8_4_;
        auVar27._8_4_ = fVar248;
        fVar250 = fVar313 * 0.0 * auVar331._12_4_;
        auVar27._12_4_ = fVar250;
        fVar252 = fVar208 * 0.0 * auVar331._16_4_;
        auVar27._16_4_ = fVar252;
        fVar322 = fVar210 * 0.0 * auVar331._20_4_;
        auVar27._20_4_ = fVar322;
        fVar188 = fVar213 * 0.0 * auVar331._24_4_;
        auVar27._24_4_ = fVar188;
        auVar27._28_4_ = fVar303;
        auVar245 = vsubps_avx(_local_660,auVar25);
        auVar332._0_4_ = fVar204 + (float)local_5a0._0_4_;
        auVar332._4_4_ = fVar241 + (float)local_5a0._4_4_;
        auVar332._8_4_ = fVar248 + fStack_598;
        auVar332._12_4_ = fVar250 + fStack_594;
        auVar332._16_4_ = fVar252 + fStack_590;
        auVar332._20_4_ = fVar322 + fStack_58c;
        auVar332._24_4_ = fVar188 + fStack_588;
        auVar332._28_4_ = fVar303 + fStack_584;
        auVar169 = vsubps_avx(auVar220,auVar26);
        auVar294 = vsubps_avx(auVar195,auVar17);
        auVar17 = vsubps_avx(_local_5a0,auVar27);
        auVar18 = vsubps_avx(auVar305,auVar196);
        auVar23 = vsubps_avx(auVar332,auVar245);
        auVar28._4_4_ = auVar245._4_4_ * auVar18._4_4_;
        auVar28._0_4_ = auVar245._0_4_ * auVar18._0_4_;
        auVar28._8_4_ = auVar245._8_4_ * auVar18._8_4_;
        auVar28._12_4_ = auVar245._12_4_ * auVar18._12_4_;
        auVar28._16_4_ = auVar245._16_4_ * auVar18._16_4_;
        auVar28._20_4_ = auVar245._20_4_ * auVar18._20_4_;
        auVar28._24_4_ = auVar245._24_4_ * auVar18._24_4_;
        auVar28._28_4_ = fVar303;
        auVar29._4_4_ = auVar196._4_4_ * auVar23._4_4_;
        auVar29._0_4_ = auVar196._0_4_ * auVar23._0_4_;
        auVar29._8_4_ = auVar196._8_4_ * auVar23._8_4_;
        auVar29._12_4_ = auVar196._12_4_ * auVar23._12_4_;
        auVar29._16_4_ = auVar196._16_4_ * auVar23._16_4_;
        auVar29._20_4_ = auVar196._20_4_ * auVar23._20_4_;
        auVar29._24_4_ = auVar196._24_4_ * auVar23._24_4_;
        auVar29._28_4_ = auVar195._28_4_;
        auVar14 = vsubps_avx(auVar29,auVar28);
        auVar30._4_4_ = auVar15._4_4_ * auVar23._4_4_;
        auVar30._0_4_ = auVar15._0_4_ * auVar23._0_4_;
        auVar30._8_4_ = auVar15._8_4_ * auVar23._8_4_;
        auVar30._12_4_ = auVar15._12_4_ * auVar23._12_4_;
        auVar30._16_4_ = auVar15._16_4_ * auVar23._16_4_;
        auVar30._20_4_ = auVar15._20_4_ * auVar23._20_4_;
        auVar30._24_4_ = auVar15._24_4_ * auVar23._24_4_;
        auVar30._28_4_ = auVar23._28_4_;
        auVar195 = vsubps_avx(auVar293,auVar15);
        auVar31._4_4_ = auVar245._4_4_ * auVar195._4_4_;
        auVar31._0_4_ = auVar245._0_4_ * auVar195._0_4_;
        auVar31._8_4_ = auVar245._8_4_ * auVar195._8_4_;
        auVar31._12_4_ = auVar245._12_4_ * auVar195._12_4_;
        auVar31._16_4_ = auVar245._16_4_ * auVar195._16_4_;
        auVar31._20_4_ = auVar245._20_4_ * auVar195._20_4_;
        auVar31._24_4_ = auVar245._24_4_ * auVar195._24_4_;
        auVar31._28_4_ = auVar220._28_4_;
        auVar220 = vsubps_avx(auVar31,auVar30);
        auVar32._4_4_ = auVar195._4_4_ * auVar196._4_4_;
        auVar32._0_4_ = auVar195._0_4_ * auVar196._0_4_;
        auVar32._8_4_ = auVar195._8_4_ * auVar196._8_4_;
        auVar32._12_4_ = auVar195._12_4_ * auVar196._12_4_;
        auVar32._16_4_ = auVar195._16_4_ * auVar196._16_4_;
        auVar32._20_4_ = auVar195._20_4_ * auVar196._20_4_;
        auVar32._24_4_ = auVar195._24_4_ * auVar196._24_4_;
        auVar32._28_4_ = auVar23._28_4_;
        auVar33._4_4_ = auVar15._4_4_ * auVar18._4_4_;
        auVar33._0_4_ = auVar15._0_4_ * auVar18._0_4_;
        auVar33._8_4_ = auVar15._8_4_ * auVar18._8_4_;
        auVar33._12_4_ = auVar15._12_4_ * auVar18._12_4_;
        auVar33._16_4_ = auVar15._16_4_ * auVar18._16_4_;
        auVar33._20_4_ = auVar15._20_4_ * auVar18._20_4_;
        auVar33._24_4_ = auVar15._24_4_ * auVar18._24_4_;
        auVar33._28_4_ = auVar18._28_4_;
        auVar18 = vsubps_avx(auVar33,auVar32);
        auVar135._0_4_ = auVar14._0_4_ * 0.0 + auVar18._0_4_ + auVar220._0_4_ * 0.0;
        auVar135._4_4_ = auVar14._4_4_ * 0.0 + auVar18._4_4_ + auVar220._4_4_ * 0.0;
        auVar135._8_4_ = auVar14._8_4_ * 0.0 + auVar18._8_4_ + auVar220._8_4_ * 0.0;
        auVar135._12_4_ = auVar14._12_4_ * 0.0 + auVar18._12_4_ + auVar220._12_4_ * 0.0;
        auVar135._16_4_ = auVar14._16_4_ * 0.0 + auVar18._16_4_ + auVar220._16_4_ * 0.0;
        auVar135._20_4_ = auVar14._20_4_ * 0.0 + auVar18._20_4_ + auVar220._20_4_ * 0.0;
        auVar135._24_4_ = auVar14._24_4_ * 0.0 + auVar18._24_4_ + auVar220._24_4_ * 0.0;
        auVar135._28_4_ = auVar18._28_4_ + auVar18._28_4_ + auVar220._28_4_;
        auVar220 = vcmpps_avx(auVar135,ZEXT432(0) << 0x20,2);
        auVar169 = vblendvps_avx(auVar169,_local_840,auVar220);
        auVar294 = vblendvps_avx(auVar294,_local_680,auVar220);
        auVar17 = vblendvps_avx(auVar17,auVar262,auVar220);
        auVar18 = vblendvps_avx(auVar15,auVar293,auVar220);
        auVar23 = vblendvps_avx(auVar196,auVar305,auVar220);
        auVar14 = vblendvps_avx(auVar245,auVar332,auVar220);
        auVar15 = vblendvps_avx(auVar293,auVar15,auVar220);
        auVar195 = vblendvps_avx(auVar305,auVar196,auVar220);
        auVar16 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar196 = vblendvps_avx(auVar332,auVar245,auVar220);
        auVar15 = vsubps_avx(auVar15,auVar169);
        auVar308 = vsubps_avx(auVar195,auVar294);
        auVar196 = vsubps_avx(auVar196,auVar17);
        auVar19 = vsubps_avx(auVar294,auVar23);
        fVar204 = auVar308._0_4_;
        fVar156 = auVar17._0_4_;
        fVar322 = auVar308._4_4_;
        fVar189 = auVar17._4_4_;
        auVar34._4_4_ = fVar189 * fVar322;
        auVar34._0_4_ = fVar156 * fVar204;
        fVar211 = auVar308._8_4_;
        fVar240 = auVar17._8_4_;
        auVar34._8_4_ = fVar240 * fVar211;
        fVar313 = auVar308._12_4_;
        fVar254 = auVar17._12_4_;
        auVar34._12_4_ = fVar254 * fVar313;
        fVar286 = auVar308._16_4_;
        fVar205 = auVar17._16_4_;
        auVar34._16_4_ = fVar205 * fVar286;
        fVar283 = auVar308._20_4_;
        fVar207 = auVar17._20_4_;
        auVar34._20_4_ = fVar207 * fVar283;
        fVar144 = auVar308._24_4_;
        fVar209 = auVar17._24_4_;
        auVar34._24_4_ = fVar209 * fVar144;
        auVar34._28_4_ = auVar195._28_4_;
        fVar241 = auVar294._0_4_;
        fVar289 = auVar196._0_4_;
        fVar188 = auVar294._4_4_;
        fVar256 = auVar196._4_4_;
        auVar35._4_4_ = fVar256 * fVar188;
        auVar35._0_4_ = fVar289 * fVar241;
        fVar310 = auVar294._8_4_;
        fVar266 = auVar196._8_4_;
        auVar35._8_4_ = fVar266 * fVar310;
        fVar285 = auVar294._12_4_;
        fVar267 = auVar196._12_4_;
        auVar35._12_4_ = fVar267 * fVar285;
        fVar279 = auVar294._16_4_;
        fVar268 = auVar196._16_4_;
        auVar35._16_4_ = fVar268 * fVar279;
        fVar284 = auVar294._20_4_;
        fVar269 = auVar196._20_4_;
        auVar35._20_4_ = fVar269 * fVar284;
        fVar146 = auVar294._24_4_;
        fVar270 = auVar196._24_4_;
        uVar7 = auVar245._28_4_;
        auVar35._24_4_ = fVar270 * fVar146;
        auVar35._28_4_ = uVar7;
        auVar294 = vsubps_avx(auVar35,auVar34);
        fVar248 = auVar169._0_4_;
        fVar153 = auVar169._4_4_;
        auVar36._4_4_ = fVar256 * fVar153;
        auVar36._0_4_ = fVar289 * fVar248;
        fVar239 = auVar169._8_4_;
        auVar36._8_4_ = fVar266 * fVar239;
        fVar315 = auVar169._12_4_;
        auVar36._12_4_ = fVar267 * fVar315;
        fVar280 = auVar169._16_4_;
        auVar36._16_4_ = fVar268 * fVar280;
        fVar213 = auVar169._20_4_;
        auVar36._20_4_ = fVar269 * fVar213;
        fVar149 = auVar169._24_4_;
        auVar36._24_4_ = fVar270 * fVar149;
        auVar36._28_4_ = uVar7;
        fVar250 = auVar15._0_4_;
        auVar326._0_4_ = fVar156 * fVar250;
        fVar206 = auVar15._4_4_;
        auVar326._4_4_ = fVar189 * fVar206;
        fVar312 = auVar15._8_4_;
        auVar326._8_4_ = fVar240 * fVar312;
        fVar314 = auVar15._12_4_;
        auVar326._12_4_ = fVar254 * fVar314;
        fVar210 = auVar15._16_4_;
        auVar326._16_4_ = fVar205 * fVar210;
        fVar172 = auVar15._20_4_;
        auVar326._20_4_ = fVar207 * fVar172;
        fVar151 = auVar15._24_4_;
        auVar326._24_4_ = fVar209 * fVar151;
        auVar326._28_4_ = 0;
        auVar195 = vsubps_avx(auVar326,auVar36);
        auVar37._4_4_ = fVar188 * fVar206;
        auVar37._0_4_ = fVar241 * fVar250;
        auVar37._8_4_ = fVar310 * fVar312;
        auVar37._12_4_ = fVar285 * fVar314;
        auVar37._16_4_ = fVar279 * fVar210;
        auVar37._20_4_ = fVar284 * fVar172;
        auVar37._24_4_ = fVar146 * fVar151;
        auVar37._28_4_ = uVar7;
        auVar38._4_4_ = fVar153 * fVar322;
        auVar38._0_4_ = fVar248 * fVar204;
        auVar38._8_4_ = fVar239 * fVar211;
        auVar38._12_4_ = fVar315 * fVar313;
        auVar38._16_4_ = fVar280 * fVar286;
        auVar38._20_4_ = fVar213 * fVar283;
        auVar38._24_4_ = fVar149 * fVar144;
        auVar38._28_4_ = auVar332._28_4_;
        auVar245 = vsubps_avx(auVar38,auVar37);
        auVar20 = vsubps_avx(auVar17,auVar14);
        fVar252 = auVar245._28_4_ + auVar195._28_4_;
        auVar263._0_4_ = auVar245._0_4_ + auVar195._0_4_ * 0.0 + auVar294._0_4_ * 0.0;
        auVar263._4_4_ = auVar245._4_4_ + auVar195._4_4_ * 0.0 + auVar294._4_4_ * 0.0;
        auVar263._8_4_ = auVar245._8_4_ + auVar195._8_4_ * 0.0 + auVar294._8_4_ * 0.0;
        auVar263._12_4_ = auVar245._12_4_ + auVar195._12_4_ * 0.0 + auVar294._12_4_ * 0.0;
        auVar263._16_4_ = auVar245._16_4_ + auVar195._16_4_ * 0.0 + auVar294._16_4_ * 0.0;
        auVar263._20_4_ = auVar245._20_4_ + auVar195._20_4_ * 0.0 + auVar294._20_4_ * 0.0;
        auVar263._24_4_ = auVar245._24_4_ + auVar195._24_4_ * 0.0 + auVar294._24_4_ * 0.0;
        auVar263._28_4_ = fVar252 + auVar294._28_4_;
        fVar212 = auVar19._0_4_;
        fVar288 = auVar19._4_4_;
        auVar39._4_4_ = fVar288 * auVar14._4_4_;
        auVar39._0_4_ = fVar212 * auVar14._0_4_;
        fVar238 = auVar19._8_4_;
        auVar39._8_4_ = fVar238 * auVar14._8_4_;
        fVar272 = auVar19._12_4_;
        auVar39._12_4_ = fVar272 * auVar14._12_4_;
        fVar278 = auVar19._16_4_;
        auVar39._16_4_ = fVar278 * auVar14._16_4_;
        fVar281 = auVar19._20_4_;
        auVar39._20_4_ = fVar281 * auVar14._20_4_;
        fVar282 = auVar19._24_4_;
        auVar39._24_4_ = fVar282 * auVar14._24_4_;
        auVar39._28_4_ = fVar252;
        fVar252 = auVar20._0_4_;
        fVar309 = auVar20._4_4_;
        auVar40._4_4_ = auVar23._4_4_ * fVar309;
        auVar40._0_4_ = auVar23._0_4_ * fVar252;
        fVar311 = auVar20._8_4_;
        auVar40._8_4_ = auVar23._8_4_ * fVar311;
        fVar208 = auVar20._12_4_;
        auVar40._12_4_ = auVar23._12_4_ * fVar208;
        fVar287 = auVar20._16_4_;
        auVar40._16_4_ = auVar23._16_4_ * fVar287;
        fVar304 = auVar20._20_4_;
        auVar40._20_4_ = auVar23._20_4_ * fVar304;
        fVar154 = auVar20._24_4_;
        auVar40._24_4_ = auVar23._24_4_ * fVar154;
        auVar40._28_4_ = auVar245._28_4_;
        auVar195 = vsubps_avx(auVar40,auVar39);
        auVar245 = vsubps_avx(auVar169,auVar18);
        fVar271 = auVar245._0_4_;
        fVar290 = auVar245._4_4_;
        auVar41._4_4_ = fVar290 * auVar14._4_4_;
        auVar41._0_4_ = fVar271 * auVar14._0_4_;
        fVar298 = auVar245._8_4_;
        auVar41._8_4_ = fVar298 * auVar14._8_4_;
        fVar299 = auVar245._12_4_;
        auVar41._12_4_ = fVar299 * auVar14._12_4_;
        fVar300 = auVar245._16_4_;
        auVar41._16_4_ = fVar300 * auVar14._16_4_;
        fVar301 = auVar245._20_4_;
        auVar41._20_4_ = fVar301 * auVar14._20_4_;
        fVar302 = auVar245._24_4_;
        auVar41._24_4_ = fVar302 * auVar14._24_4_;
        auVar41._28_4_ = auVar14._28_4_;
        auVar42._4_4_ = auVar18._4_4_ * fVar309;
        auVar42._0_4_ = auVar18._0_4_ * fVar252;
        auVar42._8_4_ = auVar18._8_4_ * fVar311;
        auVar42._12_4_ = auVar18._12_4_ * fVar208;
        auVar42._16_4_ = auVar18._16_4_ * fVar287;
        auVar42._20_4_ = auVar18._20_4_ * fVar304;
        auVar42._24_4_ = auVar18._24_4_ * fVar154;
        auVar42._28_4_ = auVar294._28_4_;
        auVar294 = vsubps_avx(auVar41,auVar42);
        auVar43._4_4_ = auVar23._4_4_ * fVar290;
        auVar43._0_4_ = auVar23._0_4_ * fVar271;
        auVar43._8_4_ = auVar23._8_4_ * fVar298;
        auVar43._12_4_ = auVar23._12_4_ * fVar299;
        auVar43._16_4_ = auVar23._16_4_ * fVar300;
        auVar43._20_4_ = auVar23._20_4_ * fVar301;
        auVar43._24_4_ = auVar23._24_4_ * fVar302;
        auVar43._28_4_ = auVar14._28_4_;
        auVar44._4_4_ = auVar18._4_4_ * fVar288;
        auVar44._0_4_ = auVar18._0_4_ * fVar212;
        auVar44._8_4_ = auVar18._8_4_ * fVar238;
        auVar44._12_4_ = auVar18._12_4_ * fVar272;
        auVar44._16_4_ = auVar18._16_4_ * fVar278;
        auVar44._20_4_ = auVar18._20_4_ * fVar281;
        auVar44._24_4_ = auVar18._24_4_ * fVar282;
        auVar44._28_4_ = auVar18._28_4_;
        auVar18 = vsubps_avx(auVar44,auVar43);
        auVar171 = ZEXT864(0) << 0x20;
        auVar222._0_4_ = auVar195._0_4_ * 0.0 + auVar18._0_4_ + auVar294._0_4_ * 0.0;
        auVar222._4_4_ = auVar195._4_4_ * 0.0 + auVar18._4_4_ + auVar294._4_4_ * 0.0;
        auVar222._8_4_ = auVar195._8_4_ * 0.0 + auVar18._8_4_ + auVar294._8_4_ * 0.0;
        auVar222._12_4_ = auVar195._12_4_ * 0.0 + auVar18._12_4_ + auVar294._12_4_ * 0.0;
        auVar222._16_4_ = auVar195._16_4_ * 0.0 + auVar18._16_4_ + auVar294._16_4_ * 0.0;
        auVar222._20_4_ = auVar195._20_4_ * 0.0 + auVar18._20_4_ + auVar294._20_4_ * 0.0;
        auVar222._24_4_ = auVar195._24_4_ * 0.0 + auVar18._24_4_ + auVar294._24_4_ * 0.0;
        auVar222._28_4_ = auVar18._28_4_ + auVar18._28_4_ + auVar294._28_4_;
        auVar294 = vmaxps_avx(auVar263,auVar222);
        auVar294 = vcmpps_avx(auVar294,ZEXT832(0) << 0x20,2);
        auVar180 = vpackssdw_avx(auVar294._0_16_,auVar294._16_16_);
        auVar16 = vpand_avx(auVar180,auVar16);
        auVar180 = vpmovsxwd_avx(auVar16);
        auVar219 = vpunpckhwd_avx(auVar16,auVar16);
        auVar197._16_16_ = auVar219;
        auVar197._0_16_ = auVar180;
        if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar197 >> 0x7f,0) == '\0') &&
              (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar219 >> 0x3f,0) == '\0') &&
            (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar219[0xf]) {
LAB_00e33cbe:
          auVar201 = ZEXT3264(auVar197);
          auVar142 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar277 = ZEXT3264(auVar274);
          auVar297 = ZEXT3264(auVar233);
          auVar274._4_4_ = fVar143;
          auVar274._0_4_ = fVar125;
          auVar274._8_4_ = fVar145;
          auVar274._12_4_ = fVar147;
          auVar274._16_4_ = fVar148;
          auVar274._20_4_ = fVar150;
          auVar274._24_4_ = fVar152;
          auVar274._28_4_ = fVar155;
        }
        else {
          auVar45._4_4_ = fVar309 * fVar322;
          auVar45._0_4_ = fVar252 * fVar204;
          auVar45._8_4_ = fVar311 * fVar211;
          auVar45._12_4_ = fVar208 * fVar313;
          auVar45._16_4_ = fVar287 * fVar286;
          auVar45._20_4_ = fVar304 * fVar283;
          auVar45._24_4_ = fVar154 * fVar144;
          auVar45._28_4_ = auVar219._12_4_;
          auVar317._0_4_ = fVar212 * fVar289;
          auVar317._4_4_ = fVar288 * fVar256;
          auVar317._8_4_ = fVar238 * fVar266;
          auVar317._12_4_ = fVar272 * fVar267;
          auVar317._16_4_ = fVar278 * fVar268;
          auVar317._20_4_ = fVar281 * fVar269;
          auVar317._24_4_ = fVar282 * fVar270;
          auVar317._28_4_ = 0;
          auVar294 = vsubps_avx(auVar317,auVar45);
          auVar46._4_4_ = fVar290 * fVar256;
          auVar46._0_4_ = fVar271 * fVar289;
          auVar46._8_4_ = fVar298 * fVar266;
          auVar46._12_4_ = fVar299 * fVar267;
          auVar46._16_4_ = fVar300 * fVar268;
          auVar46._20_4_ = fVar301 * fVar269;
          auVar46._24_4_ = fVar302 * fVar270;
          auVar46._28_4_ = auVar196._28_4_;
          auVar47._4_4_ = fVar309 * fVar206;
          auVar47._0_4_ = fVar252 * fVar250;
          auVar47._8_4_ = fVar311 * fVar312;
          auVar47._12_4_ = fVar208 * fVar314;
          auVar47._16_4_ = fVar287 * fVar210;
          auVar47._20_4_ = fVar304 * fVar172;
          auVar47._24_4_ = fVar154 * fVar151;
          auVar47._28_4_ = auVar20._28_4_;
          auVar23 = vsubps_avx(auVar47,auVar46);
          auVar48._4_4_ = fVar288 * fVar206;
          auVar48._0_4_ = fVar212 * fVar250;
          auVar48._8_4_ = fVar238 * fVar312;
          auVar48._12_4_ = fVar272 * fVar314;
          auVar48._16_4_ = fVar278 * fVar210;
          auVar48._20_4_ = fVar281 * fVar172;
          auVar48._24_4_ = fVar282 * fVar151;
          auVar48._28_4_ = auVar15._28_4_;
          auVar49._4_4_ = fVar290 * fVar322;
          auVar49._0_4_ = fVar271 * fVar204;
          auVar49._8_4_ = fVar298 * fVar211;
          auVar49._12_4_ = fVar299 * fVar313;
          auVar49._16_4_ = fVar300 * fVar286;
          auVar49._20_4_ = fVar301 * fVar283;
          auVar49._24_4_ = fVar302 * fVar144;
          auVar49._28_4_ = auVar263._28_4_;
          auVar14 = vsubps_avx(auVar49,auVar48);
          auVar264._0_4_ = auVar294._0_4_ * 0.0 + auVar14._0_4_ + auVar23._0_4_ * 0.0;
          auVar264._4_4_ = auVar294._4_4_ * 0.0 + auVar14._4_4_ + auVar23._4_4_ * 0.0;
          auVar264._8_4_ = auVar294._8_4_ * 0.0 + auVar14._8_4_ + auVar23._8_4_ * 0.0;
          auVar264._12_4_ = auVar294._12_4_ * 0.0 + auVar14._12_4_ + auVar23._12_4_ * 0.0;
          auVar264._16_4_ = auVar294._16_4_ * 0.0 + auVar14._16_4_ + auVar23._16_4_ * 0.0;
          auVar264._20_4_ = auVar294._20_4_ * 0.0 + auVar14._20_4_ + auVar23._20_4_ * 0.0;
          auVar264._24_4_ = auVar294._24_4_ * 0.0 + auVar14._24_4_ + auVar23._24_4_ * 0.0;
          auVar264._28_4_ = auVar263._28_4_ + auVar14._28_4_ + auVar15._28_4_;
          auVar18 = vrcpps_avx(auVar264);
          fVar204 = auVar18._0_4_;
          fVar250 = auVar18._4_4_;
          auVar50._4_4_ = auVar264._4_4_ * fVar250;
          auVar50._0_4_ = auVar264._0_4_ * fVar204;
          fVar252 = auVar18._8_4_;
          auVar50._8_4_ = auVar264._8_4_ * fVar252;
          fVar322 = auVar18._12_4_;
          auVar50._12_4_ = auVar264._12_4_ * fVar322;
          fVar206 = auVar18._16_4_;
          auVar50._16_4_ = auVar264._16_4_ * fVar206;
          fVar309 = auVar18._20_4_;
          auVar50._20_4_ = auVar264._20_4_ * fVar309;
          fVar211 = auVar18._24_4_;
          auVar50._24_4_ = auVar264._24_4_ * fVar211;
          auVar50._28_4_ = auVar20._28_4_;
          auVar318._8_4_ = 0x3f800000;
          auVar318._0_8_ = 0x3f8000003f800000;
          auVar318._12_4_ = 0x3f800000;
          auVar318._16_4_ = 0x3f800000;
          auVar318._20_4_ = 0x3f800000;
          auVar318._24_4_ = 0x3f800000;
          auVar318._28_4_ = 0x3f800000;
          auVar15 = vsubps_avx(auVar318,auVar50);
          fVar204 = auVar15._0_4_ * fVar204 + fVar204;
          fVar250 = auVar15._4_4_ * fVar250 + fVar250;
          fVar252 = auVar15._8_4_ * fVar252 + fVar252;
          fVar322 = auVar15._12_4_ * fVar322 + fVar322;
          fVar206 = auVar15._16_4_ * fVar206 + fVar206;
          fVar309 = auVar15._20_4_ * fVar309 + fVar309;
          fVar211 = auVar15._24_4_ * fVar211 + fVar211;
          auVar51._4_4_ =
               (auVar294._4_4_ * fVar153 + auVar23._4_4_ * fVar188 + auVar14._4_4_ * fVar189) *
               fVar250;
          auVar51._0_4_ =
               (auVar294._0_4_ * fVar248 + auVar23._0_4_ * fVar241 + auVar14._0_4_ * fVar156) *
               fVar204;
          auVar51._8_4_ =
               (auVar294._8_4_ * fVar239 + auVar23._8_4_ * fVar310 + auVar14._8_4_ * fVar240) *
               fVar252;
          auVar51._12_4_ =
               (auVar294._12_4_ * fVar315 + auVar23._12_4_ * fVar285 + auVar14._12_4_ * fVar254) *
               fVar322;
          auVar51._16_4_ =
               (auVar294._16_4_ * fVar280 + auVar23._16_4_ * fVar279 + auVar14._16_4_ * fVar205) *
               fVar206;
          auVar51._20_4_ =
               (auVar294._20_4_ * fVar213 + auVar23._20_4_ * fVar284 + auVar14._20_4_ * fVar207) *
               fVar309;
          auVar51._24_4_ =
               (auVar294._24_4_ * fVar149 + auVar23._24_4_ * fVar146 + auVar14._24_4_ * fVar209) *
               fVar211;
          auVar51._28_4_ = auVar169._28_4_ + auVar308._28_4_ + auVar17._28_4_;
          auVar180 = vpermilps_avx(ZEXT416(uVar8),0);
          auVar198._16_16_ = auVar180;
          auVar198._0_16_ = auVar180;
          auVar169 = vcmpps_avx(auVar198,auVar51,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar231._4_4_ = uVar7;
          auVar231._0_4_ = uVar7;
          auVar231._8_4_ = uVar7;
          auVar231._12_4_ = uVar7;
          auVar231._16_4_ = uVar7;
          auVar231._20_4_ = uVar7;
          auVar231._24_4_ = uVar7;
          auVar231._28_4_ = uVar7;
          auVar294 = vcmpps_avx(auVar51,auVar231,2);
          auVar169 = vandps_avx(auVar294,auVar169);
          auVar180 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
          auVar16 = vpand_avx(auVar16,auVar180);
          auVar180 = vpmovsxwd_avx(auVar16);
          auVar219 = vpshufd_avx(auVar16,0xee);
          auVar219 = vpmovsxwd_avx(auVar219);
          auVar197._16_16_ = auVar219;
          auVar197._0_16_ = auVar180;
          if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar197 >> 0x7f,0) == '\0') &&
                (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar219 >> 0x3f,0) == '\0') &&
              (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar219[0xf]) goto LAB_00e33cbe;
          auVar169 = vcmpps_avx(ZEXT832(0) << 0x20,auVar264,4);
          auVar180 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
          auVar16 = vpand_avx(auVar16,auVar180);
          auVar180 = vpmovsxwd_avx(auVar16);
          auVar16 = vpunpckhwd_avx(auVar16,auVar16);
          auVar201 = ZEXT1664(auVar16);
          auVar246._16_16_ = auVar16;
          auVar246._0_16_ = auVar180;
          auVar142 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar277 = ZEXT3264(auVar274);
          auVar297 = ZEXT3264(auVar233);
          auVar274._4_4_ = fVar143;
          auVar274._0_4_ = fVar125;
          auVar274._8_4_ = fVar145;
          auVar274._12_4_ = fVar147;
          auVar274._16_4_ = fVar148;
          auVar274._20_4_ = fVar150;
          auVar274._24_4_ = fVar152;
          auVar274._28_4_ = fVar155;
          if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar246 >> 0x7f,0) != '\0') ||
                (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar16 >> 0x3f,0) != '\0') ||
              (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0xf] < '\0') {
            auVar199._0_4_ = auVar263._0_4_ * fVar204;
            auVar199._4_4_ = auVar263._4_4_ * fVar250;
            auVar199._8_4_ = auVar263._8_4_ * fVar252;
            auVar199._12_4_ = auVar263._12_4_ * fVar322;
            auVar199._16_4_ = auVar263._16_4_ * fVar206;
            auVar199._20_4_ = auVar263._20_4_ * fVar309;
            auVar199._24_4_ = auVar263._24_4_ * fVar211;
            auVar199._28_4_ = 0;
            auVar52._4_4_ = auVar222._4_4_ * fVar250;
            auVar52._0_4_ = auVar222._0_4_ * fVar204;
            auVar52._8_4_ = auVar222._8_4_ * fVar252;
            auVar52._12_4_ = auVar222._12_4_ * fVar322;
            auVar52._16_4_ = auVar222._16_4_ * fVar206;
            auVar52._20_4_ = auVar222._20_4_ * fVar309;
            auVar52._24_4_ = auVar222._24_4_ * fVar211;
            auVar52._28_4_ = auVar15._28_4_ + auVar18._28_4_;
            auVar232._8_4_ = 0x3f800000;
            auVar232._0_8_ = 0x3f8000003f800000;
            auVar232._12_4_ = 0x3f800000;
            auVar232._16_4_ = 0x3f800000;
            auVar232._20_4_ = 0x3f800000;
            auVar232._24_4_ = 0x3f800000;
            auVar232._28_4_ = 0x3f800000;
            auVar233 = vsubps_avx(auVar232,auVar199);
            auVar233 = vblendvps_avx(auVar233,auVar199,auVar220);
            auVar277 = ZEXT3264(auVar233);
            auVar233 = vsubps_avx(auVar232,auVar52);
            auVar201 = ZEXT3264(auVar233);
            _local_4c0 = vblendvps_avx(auVar233,auVar52,auVar220);
            auVar142 = ZEXT3264(auVar246);
            auVar297 = ZEXT3264(auVar51);
          }
        }
        auVar233 = auVar142._0_32_;
        if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar233 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar233 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar233 >> 0x7f,0) != '\0') ||
              (auVar142 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar233 >> 0xbf,0) != '\0') ||
            (auVar142 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar142[0x1f] < '\0') {
          auVar169 = vsubps_avx(auVar331,auVar274);
          fVar241 = auVar274._0_4_ + auVar277._0_4_ * auVar169._0_4_;
          fVar248 = auVar274._4_4_ + auVar277._4_4_ * auVar169._4_4_;
          fVar250 = auVar274._8_4_ + auVar277._8_4_ * auVar169._8_4_;
          fVar252 = auVar274._12_4_ + auVar277._12_4_ * auVar169._12_4_;
          fVar322 = auVar274._16_4_ + auVar277._16_4_ * auVar169._16_4_;
          fVar188 = auVar274._20_4_ + auVar277._20_4_ * auVar169._20_4_;
          fVar153 = auVar274._24_4_ + auVar277._24_4_ * auVar169._24_4_;
          fVar206 = auVar274._28_4_ + auVar169._28_4_;
          fVar204 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar53._4_4_ = (fVar248 + fVar248) * fVar204;
          auVar53._0_4_ = (fVar241 + fVar241) * fVar204;
          auVar53._8_4_ = (fVar250 + fVar250) * fVar204;
          auVar53._12_4_ = (fVar252 + fVar252) * fVar204;
          auVar53._16_4_ = (fVar322 + fVar322) * fVar204;
          auVar53._20_4_ = (fVar188 + fVar188) * fVar204;
          auVar53._24_4_ = (fVar153 + fVar153) * fVar204;
          auVar53._28_4_ = fVar206 + fVar206;
          auVar294 = auVar297._0_32_;
          auVar274 = vcmpps_avx(auVar294,auVar53,6);
          auVar169 = auVar233 & auVar274;
          if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0x7f,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar169 >> 0xbf,0) != '\0') ||
              (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar169[0x1f] < '\0') {
            local_3a0 = vandps_avx(auVar274,auVar233);
            local_440._0_4_ = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
            local_440._4_4_ = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
            fStack_438 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
            fStack_434 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
            fStack_430 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
            fStack_42c = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
            fStack_428 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
            fStack_424 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
            auVar233 = auVar277._0_32_;
            local_400 = 0;
            local_3e0 = local_720;
            uStack_3d8 = uStack_718;
            local_3d0 = local_630;
            uStack_3c8 = uStack_628;
            local_3c0 = local_640;
            uStack_3b8 = uStack_638;
            local_4c0._4_4_ = local_440._4_4_;
            local_4c0._0_4_ = local_440._0_4_;
            uStack_4b8._0_4_ = fStack_438;
            uStack_4b8._4_4_ = fStack_434;
            uStack_4b0._0_4_ = fStack_430;
            uStack_4b0._4_4_ = fStack_42c;
            auVar163 = _local_4c0;
            uStack_4a8._0_4_ = fStack_428;
            uStack_4a8._4_4_ = fStack_424;
            auVar274 = _local_4c0;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              pRVar117 = context->args;
              _local_4c0 = auVar274;
              if ((pRVar117->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar117 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar117 >> 8),1),
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar178._0_4_ = 1.0 / (float)(int)uVar10;
                auVar178._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar16 = vshufps_avx(auVar178,auVar178,0);
                local_380[0] = auVar16._0_4_ * (auVar277._0_4_ + 0.0);
                local_380[1] = auVar16._4_4_ * (auVar277._4_4_ + 1.0);
                local_380[2] = auVar16._8_4_ * (auVar277._8_4_ + 2.0);
                local_380[3] = auVar16._12_4_ * (auVar277._12_4_ + 3.0);
                fStack_370 = auVar16._0_4_ * (auVar277._16_4_ + 4.0);
                fStack_36c = auVar16._4_4_ * (auVar277._20_4_ + 5.0);
                fStack_368 = auVar16._8_4_ * (auVar277._24_4_ + 6.0);
                fStack_364 = auVar277._28_4_ + 7.0;
                uStack_4b0 = auVar163._16_8_;
                uStack_4a8 = auVar274._24_8_;
                local_360 = local_4c0;
                uStack_358 = uStack_4b8;
                uStack_350 = uStack_4b0;
                uStack_348 = uStack_4a8;
                local_340 = auVar294;
                iVar115 = vmovmskps_avx(local_3a0);
                local_900 = CONCAT44((int)((ulong)pRVar117 >> 0x20),iVar115);
                uVar121 = 0;
                if (local_900 != 0) {
                  for (; (local_900 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                  }
                }
                if (iVar115 == 0) {
                  pRVar117 = (RTCIntersectArguments *)0x0;
                }
                else {
                  auVar16 = vshufps_avx(ZEXT416(uVar123),ZEXT416(uVar123),0);
                  auVar180 = vshufps_avx(ZEXT416(uVar120),ZEXT416(uVar120),0);
                  auVar194 = *local_700;
                  auVar219 = *local_700;
                  uVar98 = *(undefined8 *)(local_708 + 0x10);
                  uVar99 = *(undefined8 *)(local_708 + 0x18);
                  uStack_650 = uVar98;
                  uStack_648 = uVar99;
                  local_680._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_460 = auVar233;
                  local_420 = auVar294;
                  local_3fc = uVar10;
                  do {
                    local_1e0 = local_380[uVar121];
                    local_1c0 = *(undefined4 *)((long)&local_360 + uVar121 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar121 * 4);
                    fVar241 = 1.0 - local_1e0;
                    fVar204 = local_1e0 * fVar241 * 4.0;
                    auVar229 = ZEXT416((uint)(local_1e0 * local_1e0 * 0.5));
                    auVar229 = vshufps_avx(auVar229,auVar229,0);
                    auVar127 = ZEXT416((uint)((fVar241 * fVar241 + fVar204) * 0.5));
                    auVar127 = vshufps_avx(auVar127,auVar127,0);
                    auVar128 = ZEXT416((uint)((-local_1e0 * local_1e0 - fVar204) * 0.5));
                    auVar128 = vshufps_avx(auVar128,auVar128,0);
                    local_6f0.context = context->user;
                    auVar159 = ZEXT416((uint)(fVar241 * -fVar241 * 0.5));
                    auVar159 = vshufps_avx(auVar159,auVar159,0);
                    auVar179._0_4_ =
                         local_910 * auVar159._0_4_ +
                         auVar128._0_4_ * (float)local_720._0_4_ +
                         auVar229._0_4_ * (float)local_640._0_4_ +
                         auVar127._0_4_ * (float)local_630._0_4_;
                    auVar179._4_4_ =
                         fStack_90c * auVar159._4_4_ +
                         auVar128._4_4_ * (float)local_720._4_4_ +
                         auVar229._4_4_ * (float)local_640._4_4_ +
                         auVar127._4_4_ * (float)local_630._4_4_;
                    auVar179._8_4_ =
                         fStack_908 * auVar159._8_4_ +
                         auVar128._8_4_ * (float)uStack_718 +
                         auVar229._8_4_ * (float)uStack_638 + auVar127._8_4_ * (float)uStack_628;
                    auVar179._12_4_ =
                         fStack_904 * auVar159._12_4_ +
                         auVar128._12_4_ * uStack_718._4_4_ +
                         auVar229._12_4_ * uStack_638._4_4_ + auVar127._12_4_ * uStack_628._4_4_;
                    local_230 = vshufps_avx(auVar179,auVar179,0);
                    local_240[0] = (RTCHitN)local_230[0];
                    local_240[1] = (RTCHitN)local_230[1];
                    local_240[2] = (RTCHitN)local_230[2];
                    local_240[3] = (RTCHitN)local_230[3];
                    local_240[4] = (RTCHitN)local_230[4];
                    local_240[5] = (RTCHitN)local_230[5];
                    local_240[6] = (RTCHitN)local_230[6];
                    local_240[7] = (RTCHitN)local_230[7];
                    local_240[8] = (RTCHitN)local_230[8];
                    local_240[9] = (RTCHitN)local_230[9];
                    local_240[10] = (RTCHitN)local_230[10];
                    local_240[0xb] = (RTCHitN)local_230[0xb];
                    local_240[0xc] = (RTCHitN)local_230[0xc];
                    local_240[0xd] = (RTCHitN)local_230[0xd];
                    local_240[0xe] = (RTCHitN)local_230[0xe];
                    local_240[0xf] = (RTCHitN)local_230[0xf];
                    local_210 = vshufps_avx(auVar179,auVar179,0x55);
                    local_220 = local_210;
                    local_1f0 = vshufps_avx(auVar179,auVar179,0xaa);
                    local_200 = local_1f0;
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_780 = auVar180._0_8_;
                    uStack_778 = auVar180._8_8_;
                    local_1a0 = local_780;
                    uStack_198 = uStack_778;
                    uStack_190 = local_780;
                    uStack_188 = uStack_778;
                    local_7e0 = auVar16._0_8_;
                    uStack_7d8 = auVar16._8_8_;
                    local_180 = local_7e0;
                    uStack_178 = uStack_7d8;
                    uStack_170 = local_7e0;
                    uStack_168 = uStack_7d8;
                    auVar274 = vcmpps_avx(auVar171._0_32_,auVar171._0_32_,0xf);
                    local_6f8[1] = auVar274;
                    *local_6f8 = auVar274;
                    local_160 = (local_6f0.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_6f0.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_840 = auVar194._0_8_;
                    uStack_838 = auVar194._8_8_;
                    local_740 = local_840;
                    uStack_738 = uStack_838;
                    local_6f0.valid = (int *)&local_740;
                    local_6f0.geometryUserPtr = *(void **)(local_5c0._0_8_ + 0x18);
                    local_6f0.hit = local_240;
                    local_6f0.N = 8;
                    auVar130 = _local_660;
                    auVar160 = auVar219;
                    uStack_730 = uVar98;
                    uStack_728 = uVar99;
                    local_6f0.ray = (RTCRayN *)ray;
                    if (*(code **)(local_5c0._0_8_ + 0x48) != (code *)0x0) {
                      (**(code **)(local_5c0._0_8_ + 0x48))(&local_6f0);
                      auVar297 = ZEXT3264(auVar294);
                      auVar277 = ZEXT3264(auVar233);
                      auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar160._8_8_ = uStack_738;
                      auVar160._0_8_ = local_740;
                      auVar130._8_8_ = uStack_728;
                      auVar130._0_8_ = uStack_730;
                      fVar226 = (float)local_6a0._0_4_;
                      fVar157 = (float)local_6a0._4_4_;
                      fVar173 = fStack_698;
                      fVar255 = fStack_694;
                      fVar225 = fStack_690;
                      fVar190 = fStack_68c;
                      fVar235 = fStack_688;
                    }
                    auVar229 = vpcmpeqd_avx(auVar160,ZEXT816(0) << 0x40);
                    auVar127 = vpcmpeqd_avx(auVar130,ZEXT816(0) << 0x40);
                    auVar201 = ZEXT1664(auVar127);
                    auVar183._16_16_ = auVar127;
                    auVar183._0_16_ = auVar229;
                    auVar169 = auVar274 & ~auVar183;
                    if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar169 >> 0x7f,0) == '\0') &&
                          (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar169 >> 0xbf,0) == '\0') &&
                        (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar169[0x1f]) {
                      auVar136._0_4_ = auVar229._0_4_ ^ auVar274._0_4_;
                      auVar136._4_4_ = auVar229._4_4_ ^ auVar274._4_4_;
                      auVar136._8_4_ = auVar229._8_4_ ^ auVar274._8_4_;
                      auVar136._12_4_ = auVar229._12_4_ ^ auVar274._12_4_;
                      auVar136._16_4_ = auVar127._0_4_ ^ auVar274._16_4_;
                      auVar136._20_4_ = auVar127._4_4_ ^ auVar274._20_4_;
                      auVar136._24_4_ = auVar127._8_4_ ^ auVar274._24_4_;
                      auVar136._28_4_ = auVar127._12_4_ ^ auVar274._28_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_5c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar201 = ZEXT1664(auVar127);
                        (*p_Var12)(&local_6f0);
                        auVar297 = ZEXT3264(auVar294);
                        auVar277 = ZEXT3264(auVar233);
                        auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar160._8_8_ = uStack_738;
                        auVar160._0_8_ = local_740;
                        auVar130._8_8_ = uStack_728;
                        auVar130._0_8_ = uStack_730;
                        fVar226 = (float)local_6a0._0_4_;
                        fVar157 = (float)local_6a0._4_4_;
                        fVar173 = fStack_698;
                        fVar255 = fStack_694;
                        fVar225 = fStack_690;
                        fVar190 = fStack_68c;
                        fVar235 = fStack_688;
                      }
                      auVar229 = vpcmpeqd_avx(auVar160,ZEXT816(0) << 0x40);
                      auVar127 = vpcmpeqd_avx(auVar130,ZEXT816(0) << 0x40);
                      auVar164._16_16_ = auVar127;
                      auVar164._0_16_ = auVar229;
                      auVar136._0_4_ = auVar229._0_4_ ^ auVar274._0_4_;
                      auVar136._4_4_ = auVar229._4_4_ ^ auVar274._4_4_;
                      auVar136._8_4_ = auVar229._8_4_ ^ auVar274._8_4_;
                      auVar136._12_4_ = auVar229._12_4_ ^ auVar274._12_4_;
                      auVar136._16_4_ = auVar127._0_4_ ^ auVar274._16_4_;
                      auVar136._20_4_ = auVar127._4_4_ ^ auVar274._20_4_;
                      auVar136._24_4_ = auVar127._8_4_ ^ auVar274._24_4_;
                      auVar136._28_4_ = auVar127._12_4_ ^ auVar274._28_4_;
                      auVar184._8_4_ = 0xff800000;
                      auVar184._0_8_ = 0xff800000ff800000;
                      auVar184._12_4_ = 0xff800000;
                      auVar184._16_4_ = 0xff800000;
                      auVar184._20_4_ = 0xff800000;
                      auVar184._24_4_ = 0xff800000;
                      auVar184._28_4_ = 0xff800000;
                      auVar274 = vblendvps_avx(auVar184,*(undefined1 (*) [32])
                                                         (local_6f0.ray + 0x100),auVar164);
                      *(undefined1 (*) [32])(local_6f0.ray + 0x100) = auVar274;
                    }
                    if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar136 >> 0x7f,0) != '\0') ||
                          (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar136 >> 0xbf,0) != '\0') ||
                        (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar136[0x1f] < '\0') {
                      pRVar117 = (RTCIntersectArguments *)0x1;
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_680._0_4_;
                    local_900 = local_900 ^ 1L << (uVar121 & 0x3f);
                    uVar121 = 0;
                    if (local_900 != 0) {
                      for (; (local_900 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                      }
                    }
                    pRVar117 = (RTCIntersectArguments *)0x0;
                  } while (local_900 != 0);
                }
              }
              goto LAB_00e32697;
            }
          }
        }
        pRVar117 = (RTCIntersectArguments *)0x0;
      }
LAB_00e32697:
      uVar120 = (uint)pRVar117;
      auVar171 = ZEXT1664(auVar230);
      if (8 < (int)uVar10) {
        auVar16 = vpshufd_avx(ZEXT416(uVar10),0);
        local_580 = auVar16._0_4_;
        fStack_57c = auVar16._4_4_;
        fStack_578 = auVar16._8_4_;
        fStack_574 = auVar16._12_4_;
        auVar16 = vshufps_avx(auVar230,auVar230,0);
        local_4a0._16_16_ = auVar16;
        local_4a0._0_16_ = auVar16;
        auVar16 = vpermilps_avx(ZEXT416(uVar8),0);
        local_5c0._16_16_ = auVar16;
        local_5c0._0_16_ = auVar16;
        auVar131._0_4_ = 1.0 / (float)local_540._0_4_;
        auVar131._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar16 = vshufps_avx(auVar131,auVar131,0);
        register0x00001210 = auVar16;
        _local_120 = auVar16;
        auVar16 = vshufps_avx(ZEXT416(uVar123),ZEXT416(uVar123),0);
        local_100._16_16_ = auVar16;
        local_100._0_16_ = auVar16;
        auVar16 = vshufps_avx(ZEXT416((uint)local_560._0_4_),ZEXT416((uint)local_560._0_4_),0);
        local_560._16_16_ = auVar16;
        local_560._0_16_ = auVar16;
        auVar142 = ZEXT3264(local_560);
        lVar124 = 8;
        auVar274 = auVar277._0_32_;
        auVar233 = auVar297._0_32_;
        fVar204 = (float)local_6c0._0_4_;
        fVar241 = (float)local_6c0._4_4_;
        fVar248 = fStack_6b8;
        fVar250 = fStack_6b4;
        fVar252 = fStack_6b0;
        fVar322 = fStack_6ac;
        fVar188 = fStack_6a8;
        fVar153 = fStack_6a4;
        do {
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar124 * 4 + lVar116);
          fVar206 = *(float *)*pauVar1;
          fVar309 = *(float *)(*pauVar1 + 4);
          fVar211 = *(float *)(*pauVar1 + 8);
          fVar310 = *(float *)(*pauVar1 + 0xc);
          fVar239 = *(float *)(*pauVar1 + 0x10);
          fVar312 = *(float *)(*pauVar1 + 0x14);
          fVar311 = *(float *)(*pauVar1 + 0x18);
          auVar110 = *pauVar1;
          pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21aefac + lVar124 * 4);
          fVar313 = *(float *)*pauVar3;
          fVar285 = *(float *)(*pauVar3 + 4);
          fVar315 = *(float *)(*pauVar3 + 8);
          fVar314 = *(float *)(*pauVar3 + 0xc);
          fVar208 = *(float *)(*pauVar3 + 0x10);
          fVar286 = *(float *)(*pauVar3 + 0x14);
          fVar279 = *(float *)(*pauVar3 + 0x18);
          auVar109 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21af430 + lVar124 * 4);
          fVar280 = *(float *)*pauVar3;
          fVar210 = *(float *)(*pauVar3 + 4);
          fVar287 = *(float *)(*pauVar3 + 8);
          fVar283 = *(float *)(*pauVar3 + 0xc);
          fVar284 = *(float *)(*pauVar3 + 0x10);
          fVar213 = *(float *)(*pauVar3 + 0x14);
          fVar172 = *(float *)(*pauVar3 + 0x18);
          auVar108 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21af8b4 + lVar124 * 4);
          fVar304 = *(float *)*pauVar3;
          fVar144 = *(float *)(*pauVar3 + 4);
          fVar146 = *(float *)(*pauVar3 + 8);
          fVar125 = *(float *)(*pauVar3 + 0xc);
          fVar143 = *(float *)(*pauVar3 + 0x10);
          fVar145 = *(float *)(*pauVar3 + 0x14);
          fVar147 = *(float *)(*pauVar3 + 0x18);
          auVar107 = *pauVar3;
          fVar240 = auVar201._28_4_;
          fVar189 = fVar240 + *(float *)pauVar3[1];
          fVar156 = fVar240 + fVar240 + auVar142._28_4_;
          auVar333._0_4_ =
               (float)local_500._0_4_ * fVar206 +
               (float)local_80._0_4_ * fVar313 +
               fVar204 * fVar280 + (float)local_520._0_4_ * fVar304;
          auVar333._4_4_ =
               (float)local_500._4_4_ * fVar309 +
               (float)local_80._4_4_ * fVar285 +
               fVar241 * fVar210 + (float)local_520._4_4_ * fVar144;
          auVar333._8_4_ =
               fStack_4f8 * fVar211 + fStack_78 * fVar315 + fVar248 * fVar287 + fStack_518 * fVar146
          ;
          auVar333._12_4_ =
               fStack_4f4 * fVar310 + fStack_74 * fVar314 + fVar250 * fVar283 + fStack_514 * fVar125
          ;
          auVar333._16_4_ =
               fStack_4f0 * fVar239 + fStack_70 * fVar208 + fVar252 * fVar284 + fStack_510 * fVar143
          ;
          auVar333._20_4_ =
               fStack_4ec * fVar312 + fStack_6c * fVar286 + fVar322 * fVar213 + fStack_50c * fVar145
          ;
          auVar333._24_4_ =
               fStack_4e8 * fVar311 + fStack_68 * fVar279 + fVar188 * fVar172 + fStack_508 * fVar147
          ;
          auVar333._28_4_ = fVar189 + fVar156;
          auVar185._0_4_ =
               (float)local_280._0_4_ * fVar206 +
               (float)local_260._0_4_ * fVar313 + fVar226 * fVar280 + fVar242 * fVar304;
          auVar185._4_4_ =
               (float)local_280._4_4_ * fVar309 +
               (float)local_260._4_4_ * fVar285 + fVar157 * fVar210 + fVar249 * fVar144;
          auVar185._8_4_ =
               fStack_278 * fVar211 + fStack_258 * fVar315 + fVar173 * fVar287 + fVar251 * fVar146;
          auVar185._12_4_ =
               fStack_274 * fVar310 + fStack_254 * fVar314 + fVar255 * fVar283 + fVar253 * fVar125;
          auVar185._16_4_ =
               fStack_270 * fVar239 + fStack_250 * fVar208 + fVar225 * fVar284 + fVar242 * fVar143;
          auVar185._20_4_ =
               fStack_26c * fVar312 + fStack_24c * fVar286 + fVar190 * fVar213 + fVar249 * fVar145;
          auVar185._24_4_ =
               fStack_268 * fVar311 + fStack_248 * fVar279 + fVar235 * fVar172 + fVar251 * fVar147;
          auVar185._28_4_ = fVar156 + fVar240 + fVar240 + auVar171._28_4_;
          fVar148 = fVar206 * (float)local_2e0._0_4_ +
                    (float)local_a0._0_4_ * fVar313 +
                    fVar280 * (float)local_2a0._0_4_ + fVar304 * (float)local_2c0._0_4_;
          fVar150 = fVar309 * (float)local_2e0._4_4_ +
                    (float)local_a0._4_4_ * fVar285 +
                    fVar210 * (float)local_2a0._4_4_ + fVar144 * (float)local_2c0._4_4_;
          fVar152 = fVar211 * fStack_2d8 +
                    fStack_98 * fVar315 + fVar287 * fStack_298 + fVar146 * fStack_2b8;
          fVar155 = fVar310 * fStack_2d4 +
                    fStack_94 * fVar314 + fVar283 * fStack_294 + fVar125 * fStack_2b4;
          fVar149 = fVar239 * fStack_2d0 +
                    fStack_90 * fVar208 + fVar284 * fStack_290 + fVar143 * fStack_2b0;
          fVar151 = fVar312 * fStack_2cc +
                    fStack_8c * fVar286 + fVar213 * fStack_28c + fVar145 * fStack_2ac;
          fVar154 = fVar311 * fStack_2c8 +
                    fStack_88 * fVar279 + fVar172 * fStack_288 + fVar147 * fStack_2a8;
          fVar156 = fVar156 + fVar240 + fVar189;
          pfVar2 = (float *)(bspline_basis1 + lVar124 * 4 + lVar116);
          fVar310 = *pfVar2;
          fVar239 = pfVar2[1];
          fVar312 = pfVar2[2];
          fVar311 = pfVar2[3];
          fVar313 = pfVar2[4];
          fVar285 = pfVar2[5];
          fVar315 = pfVar2[6];
          pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21b13cc + lVar124 * 4);
          fVar206 = *(float *)*pauVar3;
          fVar309 = *(float *)(*pauVar3 + 4);
          fVar211 = *(float *)(*pauVar3 + 8);
          fVar314 = *(float *)(*pauVar3 + 0xc);
          fVar208 = *(float *)(*pauVar3 + 0x10);
          fVar286 = *(float *)(*pauVar3 + 0x14);
          fVar279 = *(float *)(*pauVar3 + 0x18);
          auVar112 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar116 + 0x21b1850 + lVar124 * 4);
          fVar280 = *(float *)*pauVar3;
          fVar210 = *(float *)(*pauVar3 + 4);
          fVar287 = *(float *)(*pauVar3 + 8);
          fVar283 = *(float *)(*pauVar3 + 0xc);
          fVar284 = *(float *)(*pauVar3 + 0x10);
          fVar213 = *(float *)(*pauVar3 + 0x14);
          fVar172 = *(float *)(*pauVar3 + 0x18);
          auVar111 = *pauVar3;
          pfVar4 = (float *)(lVar116 + 0x21b1cd4 + lVar124 * 4);
          fVar304 = *pfVar4;
          fVar144 = pfVar4[1];
          fVar146 = pfVar4[2];
          fVar125 = pfVar4[3];
          fVar143 = pfVar4[4];
          fVar145 = pfVar4[5];
          fVar147 = pfVar4[6];
          fVar254 = fVar153 + pfVar4[7];
          fVar189 = fVar153 + fVar153 + fStack_504;
          fVar240 = fVar153 + fVar153 + *(float *)pauVar1[1];
          auVar265._0_4_ =
               (float)local_500._0_4_ * fVar310 +
               (float)local_80._0_4_ * fVar206 +
               fVar204 * fVar280 + (float)local_520._0_4_ * fVar304;
          auVar265._4_4_ =
               (float)local_500._4_4_ * fVar239 +
               (float)local_80._4_4_ * fVar309 +
               fVar241 * fVar210 + (float)local_520._4_4_ * fVar144;
          auVar265._8_4_ =
               fStack_4f8 * fVar312 + fStack_78 * fVar211 + fVar248 * fVar287 + fStack_518 * fVar146
          ;
          auVar265._12_4_ =
               fStack_4f4 * fVar311 + fStack_74 * fVar314 + fVar250 * fVar283 + fStack_514 * fVar125
          ;
          auVar265._16_4_ =
               fStack_4f0 * fVar313 + fStack_70 * fVar208 + fVar252 * fVar284 + fStack_510 * fVar143
          ;
          auVar265._20_4_ =
               fStack_4ec * fVar285 + fStack_6c * fVar286 + fVar322 * fVar213 + fStack_50c * fVar145
          ;
          auVar265._24_4_ =
               fStack_4e8 * fVar315 + fStack_68 * fVar279 + fVar188 * fVar172 + fStack_508 * fVar147
          ;
          auVar265._28_4_ = fVar254 + fVar189;
          local_5a0._0_4_ =
               (float)local_280._0_4_ * fVar310 +
               (float)local_260._0_4_ * fVar206 + fVar226 * fVar280 + fVar242 * fVar304;
          local_5a0._4_4_ =
               (float)local_280._4_4_ * fVar239 +
               (float)local_260._4_4_ * fVar309 + fVar157 * fVar210 + fVar249 * fVar144;
          fStack_598 = fStack_278 * fVar312 +
                       fStack_258 * fVar211 + fVar173 * fVar287 + fVar251 * fVar146;
          fStack_594 = fStack_274 * fVar311 +
                       fStack_254 * fVar314 + fVar255 * fVar283 + fVar253 * fVar125;
          fStack_590 = fStack_270 * fVar313 +
                       fStack_250 * fVar208 + fVar225 * fVar284 + fVar242 * fVar143;
          fStack_58c = fStack_26c * fVar285 +
                       fStack_24c * fVar286 + fVar190 * fVar213 + fVar249 * fVar145;
          fStack_588 = fStack_268 * fVar315 +
                       fStack_248 * fVar279 + fVar235 * fVar172 + fVar251 * fVar147;
          fStack_584 = fVar189 + fVar240;
          auVar200._0_4_ =
               (float)local_a0._0_4_ * fVar206 +
               fVar280 * (float)local_2a0._0_4_ + fVar304 * (float)local_2c0._0_4_ +
               fVar310 * (float)local_2e0._0_4_;
          auVar200._4_4_ =
               (float)local_a0._4_4_ * fVar309 +
               fVar210 * (float)local_2a0._4_4_ + fVar144 * (float)local_2c0._4_4_ +
               fVar239 * (float)local_2e0._4_4_;
          auVar200._8_4_ =
               fStack_98 * fVar211 + fVar287 * fStack_298 + fVar146 * fStack_2b8 +
               fVar312 * fStack_2d8;
          auVar200._12_4_ =
               fStack_94 * fVar314 + fVar283 * fStack_294 + fVar125 * fStack_2b4 +
               fVar311 * fStack_2d4;
          auVar200._16_4_ =
               fStack_90 * fVar208 + fVar284 * fStack_290 + fVar143 * fStack_2b0 +
               fVar313 * fStack_2d0;
          auVar200._20_4_ =
               fStack_8c * fVar286 + fVar213 * fStack_28c + fVar145 * fStack_2ac +
               fVar285 * fStack_2cc;
          auVar200._24_4_ =
               fStack_88 * fVar279 + fVar172 * fStack_288 + fVar147 * fStack_2a8 +
               fVar315 * fStack_2c8;
          auVar200._28_4_ = fVar153 + fVar254 + fVar189;
          auVar201 = ZEXT3264(auVar200);
          auVar294 = vsubps_avx(auVar265,auVar333);
          auVar17 = vsubps_avx(_local_5a0,auVar185);
          fVar225 = auVar294._0_4_;
          fVar235 = auVar294._4_4_;
          auVar54._4_4_ = auVar185._4_4_ * fVar235;
          auVar54._0_4_ = auVar185._0_4_ * fVar225;
          fVar241 = auVar294._8_4_;
          auVar54._8_4_ = auVar185._8_4_ * fVar241;
          fVar250 = auVar294._12_4_;
          auVar54._12_4_ = auVar185._12_4_ * fVar250;
          fVar322 = auVar294._16_4_;
          auVar54._16_4_ = auVar185._16_4_ * fVar322;
          fVar153 = auVar294._20_4_;
          auVar54._20_4_ = auVar185._20_4_ * fVar153;
          fVar309 = auVar294._24_4_;
          auVar54._24_4_ = auVar185._24_4_ * fVar309;
          auVar54._28_4_ = fVar189;
          fVar190 = auVar17._0_4_;
          fVar204 = auVar17._4_4_;
          auVar55._4_4_ = auVar333._4_4_ * fVar204;
          auVar55._0_4_ = auVar333._0_4_ * fVar190;
          fVar248 = auVar17._8_4_;
          auVar55._8_4_ = auVar333._8_4_ * fVar248;
          fVar252 = auVar17._12_4_;
          auVar55._12_4_ = auVar333._12_4_ * fVar252;
          fVar188 = auVar17._16_4_;
          auVar55._16_4_ = auVar333._16_4_ * fVar188;
          fVar206 = auVar17._20_4_;
          auVar55._20_4_ = auVar333._20_4_ * fVar206;
          fVar211 = auVar17._24_4_;
          auVar55._24_4_ = auVar333._24_4_ * fVar211;
          auVar55._28_4_ = fVar240;
          auVar18 = vsubps_avx(auVar54,auVar55);
          auVar102._4_4_ = fVar150;
          auVar102._0_4_ = fVar148;
          auVar102._8_4_ = fVar152;
          auVar102._12_4_ = fVar155;
          auVar102._16_4_ = fVar149;
          auVar102._20_4_ = fVar151;
          auVar102._24_4_ = fVar154;
          auVar102._28_4_ = fVar156;
          auVar142 = ZEXT3264(auVar102);
          auVar169 = vmaxps_avx(auVar102,auVar200);
          auVar56._4_4_ = auVar169._4_4_ * auVar169._4_4_ * (fVar235 * fVar235 + fVar204 * fVar204);
          auVar56._0_4_ = auVar169._0_4_ * auVar169._0_4_ * (fVar225 * fVar225 + fVar190 * fVar190);
          auVar56._8_4_ = auVar169._8_4_ * auVar169._8_4_ * (fVar241 * fVar241 + fVar248 * fVar248);
          auVar56._12_4_ =
               auVar169._12_4_ * auVar169._12_4_ * (fVar250 * fVar250 + fVar252 * fVar252);
          auVar56._16_4_ =
               auVar169._16_4_ * auVar169._16_4_ * (fVar322 * fVar322 + fVar188 * fVar188);
          auVar56._20_4_ =
               auVar169._20_4_ * auVar169._20_4_ * (fVar153 * fVar153 + fVar206 * fVar206);
          auVar56._24_4_ =
               auVar169._24_4_ * auVar169._24_4_ * (fVar309 * fVar309 + fVar211 * fVar211);
          auVar56._28_4_ = fVar254 + fVar240;
          auVar57._4_4_ = auVar18._4_4_ * auVar18._4_4_;
          auVar57._0_4_ = auVar18._0_4_ * auVar18._0_4_;
          auVar57._8_4_ = auVar18._8_4_ * auVar18._8_4_;
          auVar57._12_4_ = auVar18._12_4_ * auVar18._12_4_;
          auVar57._16_4_ = auVar18._16_4_ * auVar18._16_4_;
          auVar57._20_4_ = auVar18._20_4_ * auVar18._20_4_;
          auVar57._24_4_ = auVar18._24_4_ * auVar18._24_4_;
          auVar57._28_4_ = auVar18._28_4_;
          auVar169 = vcmpps_avx(auVar57,auVar56,2);
          local_400 = (uint)lVar124;
          auVar230 = vpshufd_avx(ZEXT416(local_400),0);
          auVar16 = vpor_avx(auVar230,_DAT_01f7fcf0);
          auVar230 = vpor_avx(auVar230,_DAT_01fafea0);
          auVar105._4_4_ = fStack_57c;
          auVar105._0_4_ = local_580;
          auVar105._8_4_ = fStack_578;
          auVar105._12_4_ = fStack_574;
          auVar16 = vpcmpgtd_avx(auVar105,auVar16);
          auVar230 = vpcmpgtd_avx(auVar105,auVar230);
          auVar165._16_16_ = auVar230;
          auVar165._0_16_ = auVar16;
          auVar171 = ZEXT3264(auVar165);
          auVar18 = auVar165 & auVar169;
          fVar204 = (float)local_6c0._0_4_;
          fVar241 = (float)local_6c0._4_4_;
          fVar248 = fStack_6b8;
          fVar250 = fStack_6b4;
          fVar252 = fStack_6b0;
          fVar322 = fStack_6ac;
          fVar188 = fStack_6a8;
          fVar153 = fStack_6a4;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar18 >> 0x7f,0) == '\0') &&
                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar18 >> 0xbf,0) == '\0') &&
              (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar18[0x1f]) {
            pRVar118 = (RTCIntersectArguments *)((ulong)pRVar117 & 0xffffffff);
          }
          else {
            local_840._0_4_ = auVar112._0_4_;
            local_840._4_4_ = auVar112._4_4_;
            uStack_838._0_4_ = auVar112._8_4_;
            uStack_838._4_4_ = auVar112._12_4_;
            fStack_830 = auVar112._16_4_;
            fStack_82c = auVar112._20_4_;
            fStack_828 = auVar112._24_4_;
            local_680._0_4_ = auVar111._0_4_;
            local_680._4_4_ = auVar111._4_4_;
            fStack_678 = auVar111._8_4_;
            fStack_674 = auVar111._12_4_;
            fStack_670 = auVar111._16_4_;
            fStack_66c = auVar111._20_4_;
            fStack_668 = auVar111._24_4_;
            local_620 = fVar310 * (float)local_600._0_4_ +
                        (float)local_c0._0_4_ * (float)local_840._0_4_ +
                        (float)local_e0._0_4_ * (float)local_680._0_4_ + fVar202 * fVar304;
            fStack_61c = fVar239 * (float)local_600._4_4_ +
                         (float)local_c0._4_4_ * (float)local_840._4_4_ +
                         (float)local_e0._4_4_ * (float)local_680._4_4_ + fVar236 * fVar144;
            fStack_618 = fVar312 * fStack_5f8 +
                         fStack_b8 * (float)uStack_838 + fStack_d8 * fStack_678 + fVar203 * fVar146;
            fStack_614 = fVar311 * fStack_5f4 +
                         fStack_b4 * uStack_838._4_4_ + fStack_d4 * fStack_674 + fVar237 * fVar125;
            fStack_610 = fVar313 * fStack_5f0 +
                         fStack_b0 * fStack_830 + fStack_d0 * fStack_670 + fVar202 * fVar143;
            fStack_60c = fVar285 * fStack_5ec +
                         fStack_ac * fStack_82c + fStack_cc * fStack_66c + fVar236 * fVar145;
            fStack_608 = fVar315 * fStack_5e8 +
                         fStack_a8 * fStack_828 + fStack_c8 * fStack_668 + fVar203 * fVar147;
            fStack_604 = fStack_584 + fVar156 + auVar230._12_4_ + 0.0;
            local_7e0._0_4_ = auVar109._0_4_;
            local_7e0._4_4_ = auVar109._4_4_;
            uStack_7d8._0_4_ = auVar109._8_4_;
            uStack_7d8._4_4_ = auVar109._12_4_;
            fStack_7d0 = auVar109._16_4_;
            fStack_7cc = auVar109._20_4_;
            fStack_7c8 = auVar109._24_4_;
            local_780._0_4_ = auVar108._0_4_;
            local_780._4_4_ = auVar108._4_4_;
            uStack_778._0_4_ = auVar108._8_4_;
            uStack_778._4_4_ = auVar108._12_4_;
            fStack_770 = auVar108._16_4_;
            fStack_76c = auVar108._20_4_;
            fStack_768 = auVar108._24_4_;
            local_7a0._0_4_ = auVar107._0_4_;
            local_7a0._4_4_ = auVar107._4_4_;
            fStack_798 = auVar107._8_4_;
            fStack_794 = auVar107._12_4_;
            fStack_790 = auVar107._16_4_;
            fStack_78c = auVar107._20_4_;
            fStack_788 = auVar107._24_4_;
            pfVar4 = (float *)(lVar116 + 0x21b0640 + lVar124 * 4);
            fVar225 = *pfVar4;
            fVar190 = pfVar4[1];
            fVar235 = pfVar4[2];
            fVar206 = pfVar4[3];
            fVar309 = pfVar4[4];
            fVar211 = pfVar4[5];
            fVar310 = pfVar4[6];
            pfVar5 = (float *)(lVar116 + 0x21b0ac4 + lVar124 * 4);
            fVar239 = *pfVar5;
            fVar312 = pfVar5[1];
            fVar311 = pfVar5[2];
            fVar313 = pfVar5[3];
            fVar285 = pfVar5[4];
            fVar315 = pfVar5[5];
            fVar314 = pfVar5[6];
            pfVar6 = (float *)(lVar116 + 0x21b01bc + lVar124 * 4);
            fVar208 = *pfVar6;
            fVar286 = pfVar6[1];
            fVar279 = pfVar6[2];
            fVar280 = pfVar6[3];
            fVar210 = pfVar6[4];
            fVar287 = pfVar6[5];
            fVar283 = pfVar6[6];
            fVar157 = pfVar4[7] + pfVar5[7];
            fVar173 = pfVar5[7] + fStack_264 + 0.0;
            fVar255 = fStack_264 + pfVar2[7] + fStack_264 + 0.0;
            pfVar2 = (float *)(lVar116 + 0x21afd38 + lVar124 * 4);
            fVar284 = *pfVar2;
            fVar213 = pfVar2[1];
            fVar172 = pfVar2[2];
            fVar304 = pfVar2[3];
            fVar144 = pfVar2[4];
            fVar146 = pfVar2[5];
            fVar226 = pfVar2[6];
            auVar137._0_4_ =
                 fVar284 * (float)local_500._0_4_ +
                 (float)local_80._0_4_ * fVar208 +
                 (float)local_6c0._0_4_ * fVar225 + (float)local_520._0_4_ * fVar239;
            auVar137._4_4_ =
                 fVar213 * (float)local_500._4_4_ +
                 (float)local_80._4_4_ * fVar286 +
                 (float)local_6c0._4_4_ * fVar190 + (float)local_520._4_4_ * fVar312;
            auVar137._8_4_ =
                 fVar172 * fStack_4f8 +
                 fStack_78 * fVar279 + fStack_6b8 * fVar235 + fStack_518 * fVar311;
            auVar137._12_4_ =
                 fVar304 * fStack_4f4 +
                 fStack_74 * fVar280 + fStack_6b4 * fVar206 + fStack_514 * fVar313;
            auVar137._16_4_ =
                 fVar144 * fStack_4f0 +
                 fStack_70 * fVar210 + fStack_6b0 * fVar309 + fStack_510 * fVar285;
            auVar137._20_4_ =
                 fVar146 * fStack_4ec +
                 fStack_6c * fVar287 + fStack_6ac * fVar211 + fStack_50c * fVar315;
            auVar137._24_4_ =
                 fVar226 * fStack_4e8 +
                 fStack_68 * fVar283 + fStack_6a8 * fVar310 + fStack_508 * fVar314;
            auVar137._28_4_ = fVar157 + fVar173;
            auVar166._0_4_ =
                 fVar284 * (float)local_280._0_4_ +
                 (float)local_6a0._0_4_ * fVar225 + fVar242 * fVar239 +
                 (float)local_260._0_4_ * fVar208;
            auVar166._4_4_ =
                 fVar213 * (float)local_280._4_4_ +
                 (float)local_6a0._4_4_ * fVar190 + fVar249 * fVar312 +
                 (float)local_260._4_4_ * fVar286;
            auVar166._8_4_ =
                 fVar172 * fStack_278 +
                 fStack_698 * fVar235 + fVar251 * fVar311 + fStack_258 * fVar279;
            auVar166._12_4_ =
                 fVar304 * fStack_274 +
                 fStack_694 * fVar206 + fVar253 * fVar313 + fStack_254 * fVar280;
            auVar166._16_4_ =
                 fVar144 * fStack_270 +
                 fStack_690 * fVar309 + fVar242 * fVar285 + fStack_250 * fVar210;
            auVar166._20_4_ =
                 fVar146 * fStack_26c +
                 fStack_68c * fVar211 + fVar249 * fVar315 + fStack_24c * fVar287;
            auVar166._24_4_ =
                 fVar226 * fStack_268 +
                 fStack_688 * fVar310 + fVar251 * fVar314 + fStack_248 * fVar283;
            auVar166._28_4_ = fVar173 + fVar255;
            auVar324._0_4_ =
                 (float)local_c0._0_4_ * fVar208 +
                 (float)local_e0._0_4_ * fVar225 + fVar202 * fVar239 +
                 fVar284 * (float)local_600._0_4_;
            auVar324._4_4_ =
                 (float)local_c0._4_4_ * fVar286 +
                 (float)local_e0._4_4_ * fVar190 + fVar236 * fVar312 +
                 fVar213 * (float)local_600._4_4_;
            auVar324._8_4_ =
                 fStack_b8 * fVar279 + fStack_d8 * fVar235 + fVar203 * fVar311 +
                 fVar172 * fStack_5f8;
            auVar324._12_4_ =
                 fStack_b4 * fVar280 + fStack_d4 * fVar206 + fVar237 * fVar313 +
                 fVar304 * fStack_5f4;
            auVar324._16_4_ =
                 fStack_b0 * fVar210 + fStack_d0 * fVar309 + fVar202 * fVar285 +
                 fVar144 * fStack_5f0;
            auVar324._20_4_ =
                 fStack_ac * fVar287 + fStack_cc * fVar211 + fVar236 * fVar315 +
                 fVar146 * fStack_5ec;
            auVar324._24_4_ =
                 fStack_a8 * fVar283 + fStack_c8 * fVar310 + fVar203 * fVar314 +
                 fVar226 * fStack_5e8;
            auVar324._28_4_ = pfVar6[7] + fVar157 + fVar255;
            pfVar2 = (float *)(lVar116 + 0x21b2a60 + lVar124 * 4);
            fVar225 = *pfVar2;
            fVar190 = pfVar2[1];
            fVar235 = pfVar2[2];
            fVar206 = pfVar2[3];
            fVar309 = pfVar2[4];
            fVar211 = pfVar2[5];
            fVar310 = pfVar2[6];
            pfVar4 = (float *)(lVar116 + 0x21b2ee4 + lVar124 * 4);
            fVar239 = *pfVar4;
            fVar312 = pfVar4[1];
            fVar311 = pfVar4[2];
            fVar313 = pfVar4[3];
            fVar285 = pfVar4[4];
            fVar315 = pfVar4[5];
            fVar314 = pfVar4[6];
            pfVar5 = (float *)(lVar116 + 0x21b25dc + lVar124 * 4);
            fVar208 = *pfVar5;
            fVar286 = pfVar5[1];
            fVar279 = pfVar5[2];
            fVar280 = pfVar5[3];
            fVar210 = pfVar5[4];
            fVar287 = pfVar5[5];
            fVar283 = pfVar5[6];
            pfVar6 = (float *)(lVar116 + 0x21b2158 + lVar124 * 4);
            fVar284 = *pfVar6;
            fVar213 = pfVar6[1];
            fVar172 = pfVar6[2];
            fVar304 = pfVar6[3];
            fVar144 = pfVar6[4];
            fVar146 = pfVar6[5];
            fVar226 = pfVar6[6];
            auVar295._0_4_ =
                 fVar284 * (float)local_500._0_4_ +
                 (float)local_80._0_4_ * fVar208 +
                 (float)local_6c0._0_4_ * fVar225 + (float)local_520._0_4_ * fVar239;
            auVar295._4_4_ =
                 fVar213 * (float)local_500._4_4_ +
                 (float)local_80._4_4_ * fVar286 +
                 (float)local_6c0._4_4_ * fVar190 + (float)local_520._4_4_ * fVar312;
            auVar295._8_4_ =
                 fVar172 * fStack_4f8 +
                 fStack_78 * fVar279 + fStack_6b8 * fVar235 + fStack_518 * fVar311;
            auVar295._12_4_ =
                 fVar304 * fStack_4f4 +
                 fStack_74 * fVar280 + fStack_6b4 * fVar206 + fStack_514 * fVar313;
            auVar295._16_4_ =
                 fVar144 * fStack_4f0 +
                 fStack_70 * fVar210 + fStack_6b0 * fVar309 + fStack_510 * fVar285;
            auVar295._20_4_ =
                 fVar146 * fStack_4ec +
                 fStack_6c * fVar287 + fStack_6ac * fVar211 + fStack_50c * fVar315;
            auVar295._24_4_ =
                 fVar226 * fStack_4e8 +
                 fStack_68 * fVar283 + fStack_6a8 * fVar310 + fStack_508 * fVar314;
            auVar295._28_4_ = fStack_a4 + fStack_a4 + fStack_504 + fStack_a4;
            auVar319._0_4_ =
                 fVar284 * (float)local_280._0_4_ +
                 fVar208 * (float)local_260._0_4_ +
                 (float)local_6a0._0_4_ * fVar225 + fVar242 * fVar239;
            auVar319._4_4_ =
                 fVar213 * (float)local_280._4_4_ +
                 fVar286 * (float)local_260._4_4_ +
                 (float)local_6a0._4_4_ * fVar190 + fVar249 * fVar312;
            auVar319._8_4_ =
                 fVar172 * fStack_278 +
                 fVar279 * fStack_258 + fStack_698 * fVar235 + fVar251 * fVar311;
            auVar319._12_4_ =
                 fVar304 * fStack_274 +
                 fVar280 * fStack_254 + fStack_694 * fVar206 + fVar253 * fVar313;
            auVar319._16_4_ =
                 fVar144 * fStack_270 +
                 fVar210 * fStack_250 + fStack_690 * fVar309 + fVar242 * fVar285;
            auVar319._20_4_ =
                 fVar146 * fStack_26c +
                 fVar287 * fStack_24c + fStack_68c * fVar211 + fVar249 * fVar315;
            auVar319._24_4_ =
                 fVar226 * fStack_268 +
                 fVar283 * fStack_248 + fStack_688 * fVar310 + fVar251 * fVar314;
            auVar319._28_4_ = fStack_a4 + fStack_a4 + fStack_244 + fStack_a4;
            auVar234._8_4_ = 0x7fffffff;
            auVar234._0_8_ = 0x7fffffff7fffffff;
            auVar234._12_4_ = 0x7fffffff;
            auVar234._16_4_ = 0x7fffffff;
            auVar234._20_4_ = 0x7fffffff;
            auVar234._24_4_ = 0x7fffffff;
            auVar234._28_4_ = 0x7fffffff;
            auVar18 = vandps_avx(auVar137,auVar234);
            auVar23 = vandps_avx(auVar166,auVar234);
            auVar23 = vmaxps_avx(auVar18,auVar23);
            auVar18 = vandps_avx(auVar324,auVar234);
            auVar23 = vmaxps_avx(auVar23,auVar18);
            auVar23 = vcmpps_avx(auVar23,local_4a0,1);
            auVar14 = vblendvps_avx(auVar137,auVar294,auVar23);
            auVar138._0_4_ =
                 fVar284 * (float)local_600._0_4_ +
                 fVar208 * (float)local_c0._0_4_ +
                 fVar239 * fVar202 + (float)local_e0._0_4_ * fVar225;
            auVar138._4_4_ =
                 fVar213 * (float)local_600._4_4_ +
                 fVar286 * (float)local_c0._4_4_ +
                 fVar312 * fVar236 + (float)local_e0._4_4_ * fVar190;
            auVar138._8_4_ =
                 fVar172 * fStack_5f8 +
                 fVar279 * fStack_b8 + fVar311 * fVar203 + fStack_d8 * fVar235;
            auVar138._12_4_ =
                 fVar304 * fStack_5f4 +
                 fVar280 * fStack_b4 + fVar313 * fVar237 + fStack_d4 * fVar206;
            auVar138._16_4_ =
                 fVar144 * fStack_5f0 +
                 fVar210 * fStack_b0 + fVar285 * fVar202 + fStack_d0 * fVar309;
            auVar138._20_4_ =
                 fVar146 * fStack_5ec +
                 fVar287 * fStack_ac + fVar315 * fVar236 + fStack_cc * fVar211;
            auVar138._24_4_ =
                 fVar226 * fStack_5e8 +
                 fVar283 * fStack_a8 + fVar314 * fVar203 + fStack_c8 * fVar310;
            auVar138._28_4_ = auVar18._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar15 = vblendvps_avx(auVar166,auVar17,auVar23);
            auVar18 = vandps_avx(auVar295,auVar234);
            auVar23 = vandps_avx(auVar319,auVar234);
            auVar23 = vmaxps_avx(auVar18,auVar23);
            auVar18 = vandps_avx(auVar138,auVar234);
            auVar18 = vmaxps_avx(auVar23,auVar18);
            local_8e0._0_4_ = auVar110._0_4_;
            local_8e0._4_4_ = auVar110._4_4_;
            fStack_8d8 = auVar110._8_4_;
            fStack_8d4 = auVar110._12_4_;
            fStack_8d0 = auVar110._16_4_;
            fStack_8cc = auVar110._20_4_;
            fStack_8c8 = auVar110._24_4_;
            auVar18 = vcmpps_avx(auVar18,local_4a0,1);
            auVar294 = vblendvps_avx(auVar295,auVar294,auVar18);
            auVar139._0_4_ =
                 (float)local_600._0_4_ * (float)local_8e0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_7e0 +
                 (float)local_e0._0_4_ * (float)local_780 + fVar202 * (float)local_7a0._0_4_;
            auVar139._4_4_ =
                 (float)local_600._4_4_ * (float)local_8e0._4_4_ +
                 (float)local_c0._4_4_ * local_7e0._4_4_ +
                 (float)local_e0._4_4_ * local_780._4_4_ + fVar236 * (float)local_7a0._4_4_;
            auVar139._8_4_ =
                 fStack_5f8 * fStack_8d8 +
                 fStack_b8 * (float)uStack_7d8 +
                 fStack_d8 * (float)uStack_778 + fVar203 * fStack_798;
            auVar139._12_4_ =
                 fStack_5f4 * fStack_8d4 +
                 fStack_b4 * uStack_7d8._4_4_ + fStack_d4 * uStack_778._4_4_ + fVar237 * fStack_794;
            auVar139._16_4_ =
                 fStack_5f0 * fStack_8d0 +
                 fStack_b0 * fStack_7d0 + fStack_d0 * fStack_770 + fVar202 * fStack_790;
            auVar139._20_4_ =
                 fStack_5ec * fStack_8cc +
                 fStack_ac * fStack_7cc + fStack_cc * fStack_76c + fVar236 * fStack_78c;
            auVar139._24_4_ =
                 fStack_5e8 * fStack_8c8 +
                 fStack_a8 * fStack_7c8 + fStack_c8 * fStack_768 + fVar203 * fStack_788;
            auVar139._28_4_ = auVar23._28_4_ + fStack_604 + auVar230._12_4_ + 0.0;
            auVar18 = vblendvps_avx(auVar319,auVar17,auVar18);
            fVar189 = auVar14._0_4_;
            fVar240 = auVar14._4_4_;
            fVar254 = auVar14._8_4_;
            fVar205 = auVar14._12_4_;
            fVar207 = auVar14._16_4_;
            fVar209 = auVar14._20_4_;
            fVar212 = auVar14._24_4_;
            fVar288 = auVar14._28_4_;
            fVar208 = auVar294._0_4_;
            fVar279 = auVar294._4_4_;
            fVar210 = auVar294._8_4_;
            fVar283 = auVar294._12_4_;
            fVar213 = auVar294._16_4_;
            fVar304 = auVar294._20_4_;
            fVar146 = auVar294._24_4_;
            fVar225 = auVar15._0_4_;
            fVar235 = auVar15._4_4_;
            fVar309 = auVar15._8_4_;
            fVar310 = auVar15._12_4_;
            fVar312 = auVar15._16_4_;
            fVar313 = auVar15._20_4_;
            fVar315 = auVar15._24_4_;
            auVar306._0_4_ = fVar225 * fVar225 + fVar189 * fVar189;
            auVar306._4_4_ = fVar235 * fVar235 + fVar240 * fVar240;
            auVar306._8_4_ = fVar309 * fVar309 + fVar254 * fVar254;
            auVar306._12_4_ = fVar310 * fVar310 + fVar205 * fVar205;
            auVar306._16_4_ = fVar312 * fVar312 + fVar207 * fVar207;
            auVar306._20_4_ = fVar313 * fVar313 + fVar209 * fVar209;
            auVar306._24_4_ = fVar315 * fVar315 + fVar212 * fVar212;
            auVar306._28_4_ = fVar253 + auVar17._28_4_;
            auVar23 = vrsqrtps_avx(auVar306);
            fVar190 = auVar23._0_4_;
            fVar206 = auVar23._4_4_;
            auVar58._4_4_ = fVar206 * 1.5;
            auVar58._0_4_ = fVar190 * 1.5;
            fVar211 = auVar23._8_4_;
            auVar58._8_4_ = fVar211 * 1.5;
            fVar239 = auVar23._12_4_;
            auVar58._12_4_ = fVar239 * 1.5;
            fVar311 = auVar23._16_4_;
            auVar58._16_4_ = fVar311 * 1.5;
            fVar285 = auVar23._20_4_;
            auVar58._20_4_ = fVar285 * 1.5;
            fVar314 = auVar23._24_4_;
            auVar58._24_4_ = fVar314 * 1.5;
            auVar58._28_4_ = auVar319._28_4_;
            auVar59._4_4_ = fVar206 * fVar206 * fVar206 * auVar306._4_4_ * 0.5;
            auVar59._0_4_ = fVar190 * fVar190 * fVar190 * auVar306._0_4_ * 0.5;
            auVar59._8_4_ = fVar211 * fVar211 * fVar211 * auVar306._8_4_ * 0.5;
            auVar59._12_4_ = fVar239 * fVar239 * fVar239 * auVar306._12_4_ * 0.5;
            auVar59._16_4_ = fVar311 * fVar311 * fVar311 * auVar306._16_4_ * 0.5;
            auVar59._20_4_ = fVar285 * fVar285 * fVar285 * auVar306._20_4_ * 0.5;
            auVar59._24_4_ = fVar314 * fVar314 * fVar314 * auVar306._24_4_ * 0.5;
            auVar59._28_4_ = auVar306._28_4_;
            auVar14 = vsubps_avx(auVar58,auVar59);
            fVar157 = auVar14._0_4_;
            fVar173 = auVar14._4_4_;
            fVar255 = auVar14._8_4_;
            fVar125 = auVar14._12_4_;
            fVar143 = auVar14._16_4_;
            fVar145 = auVar14._20_4_;
            fVar147 = auVar14._24_4_;
            fVar190 = auVar18._0_4_;
            fVar206 = auVar18._4_4_;
            fVar211 = auVar18._8_4_;
            fVar239 = auVar18._12_4_;
            fVar311 = auVar18._16_4_;
            fVar285 = auVar18._20_4_;
            fVar314 = auVar18._24_4_;
            auVar276._0_4_ = fVar190 * fVar190 + fVar208 * fVar208;
            auVar276._4_4_ = fVar206 * fVar206 + fVar279 * fVar279;
            auVar276._8_4_ = fVar211 * fVar211 + fVar210 * fVar210;
            auVar276._12_4_ = fVar239 * fVar239 + fVar283 * fVar283;
            auVar276._16_4_ = fVar311 * fVar311 + fVar213 * fVar213;
            auVar276._20_4_ = fVar285 * fVar285 + fVar304 * fVar304;
            auVar276._24_4_ = fVar314 * fVar314 + fVar146 * fVar146;
            auVar276._28_4_ = auVar23._28_4_ + auVar294._28_4_;
            auVar294 = vrsqrtps_avx(auVar276);
            fVar286 = auVar294._0_4_;
            fVar280 = auVar294._4_4_;
            auVar60._4_4_ = fVar280 * 1.5;
            auVar60._0_4_ = fVar286 * 1.5;
            fVar287 = auVar294._8_4_;
            auVar60._8_4_ = fVar287 * 1.5;
            fVar284 = auVar294._12_4_;
            auVar60._12_4_ = fVar284 * 1.5;
            fVar172 = auVar294._16_4_;
            auVar60._16_4_ = fVar172 * 1.5;
            fVar144 = auVar294._20_4_;
            auVar60._20_4_ = fVar144 * 1.5;
            fVar226 = auVar294._24_4_;
            auVar60._24_4_ = fVar226 * 1.5;
            auVar60._28_4_ = auVar319._28_4_;
            auVar61._4_4_ = fVar280 * fVar280 * fVar280 * auVar276._4_4_ * 0.5;
            auVar61._0_4_ = fVar286 * fVar286 * fVar286 * auVar276._0_4_ * 0.5;
            auVar61._8_4_ = fVar287 * fVar287 * fVar287 * auVar276._8_4_ * 0.5;
            auVar61._12_4_ = fVar284 * fVar284 * fVar284 * auVar276._12_4_ * 0.5;
            auVar61._16_4_ = fVar172 * fVar172 * fVar172 * auVar276._16_4_ * 0.5;
            auVar61._20_4_ = fVar144 * fVar144 * fVar144 * auVar276._20_4_ * 0.5;
            auVar61._24_4_ = fVar226 * fVar226 * fVar226 * auVar276._24_4_ * 0.5;
            auVar61._28_4_ = auVar276._28_4_;
            auVar18 = vsubps_avx(auVar60,auVar61);
            fVar286 = auVar18._0_4_;
            fVar280 = auVar18._4_4_;
            fVar287 = auVar18._8_4_;
            fVar284 = auVar18._12_4_;
            fVar172 = auVar18._16_4_;
            fVar144 = auVar18._20_4_;
            fVar226 = auVar18._24_4_;
            fVar225 = fVar148 * fVar157 * fVar225;
            fVar235 = fVar150 * fVar173 * fVar235;
            auVar62._4_4_ = fVar235;
            auVar62._0_4_ = fVar225;
            fVar309 = fVar152 * fVar255 * fVar309;
            auVar62._8_4_ = fVar309;
            fVar310 = fVar155 * fVar125 * fVar310;
            auVar62._12_4_ = fVar310;
            fVar312 = fVar149 * fVar143 * fVar312;
            auVar62._16_4_ = fVar312;
            fVar313 = fVar151 * fVar145 * fVar313;
            auVar62._20_4_ = fVar313;
            fVar315 = fVar154 * fVar147 * fVar315;
            auVar62._24_4_ = fVar315;
            auVar62._28_4_ = auVar294._28_4_;
            local_8e0._4_4_ = fVar235 + auVar333._4_4_;
            local_8e0._0_4_ = fVar225 + auVar333._0_4_;
            fStack_8d8 = fVar309 + auVar333._8_4_;
            fStack_8d4 = fVar310 + auVar333._12_4_;
            fStack_8d0 = fVar312 + auVar333._16_4_;
            fStack_8cc = fVar313 + auVar333._20_4_;
            fStack_8c8 = fVar315 + auVar333._24_4_;
            fStack_8c4 = auVar294._28_4_ + auVar333._28_4_;
            fVar225 = fVar148 * fVar157 * -fVar189;
            fVar235 = fVar150 * fVar173 * -fVar240;
            auVar63._4_4_ = fVar235;
            auVar63._0_4_ = fVar225;
            fVar309 = fVar152 * fVar255 * -fVar254;
            auVar63._8_4_ = fVar309;
            fVar310 = fVar155 * fVar125 * -fVar205;
            auVar63._12_4_ = fVar310;
            fVar312 = fVar149 * fVar143 * -fVar207;
            auVar63._16_4_ = fVar312;
            fVar313 = fVar151 * fVar145 * -fVar209;
            auVar63._20_4_ = fVar313;
            fVar315 = fVar154 * fVar147 * -fVar212;
            auVar63._24_4_ = fVar315;
            auVar63._28_4_ = -fVar288;
            local_7a0._4_4_ = auVar185._4_4_ + fVar235;
            local_7a0._0_4_ = auVar185._0_4_ + fVar225;
            fStack_798 = auVar185._8_4_ + fVar309;
            fStack_794 = auVar185._12_4_ + fVar310;
            fStack_790 = auVar185._16_4_ + fVar312;
            fStack_78c = auVar185._20_4_ + fVar313;
            fStack_788 = auVar185._24_4_ + fVar315;
            fStack_784 = auVar185._28_4_ + -fVar288;
            fVar225 = fVar157 * 0.0 * fVar148;
            fVar235 = fVar173 * 0.0 * fVar150;
            auVar64._4_4_ = fVar235;
            auVar64._0_4_ = fVar225;
            fVar309 = fVar255 * 0.0 * fVar152;
            auVar64._8_4_ = fVar309;
            fVar310 = fVar125 * 0.0 * fVar155;
            auVar64._12_4_ = fVar310;
            fVar312 = fVar143 * 0.0 * fVar149;
            auVar64._16_4_ = fVar312;
            fVar313 = fVar145 * 0.0 * fVar151;
            auVar64._20_4_ = fVar313;
            fVar315 = fVar147 * 0.0 * fVar154;
            auVar64._24_4_ = fVar315;
            auVar64._28_4_ = fVar288;
            auVar196 = vsubps_avx(auVar333,auVar62);
            auVar334._0_4_ = fVar225 + auVar139._0_4_;
            auVar334._4_4_ = fVar235 + auVar139._4_4_;
            auVar334._8_4_ = fVar309 + auVar139._8_4_;
            auVar334._12_4_ = fVar310 + auVar139._12_4_;
            auVar334._16_4_ = fVar312 + auVar139._16_4_;
            auVar334._20_4_ = fVar313 + auVar139._20_4_;
            auVar334._24_4_ = fVar315 + auVar139._24_4_;
            auVar334._28_4_ = fVar288 + auVar139._28_4_;
            fVar225 = auVar200._0_4_ * fVar286 * fVar190;
            fVar190 = auVar200._4_4_ * fVar280 * fVar206;
            auVar65._4_4_ = fVar190;
            auVar65._0_4_ = fVar225;
            fVar235 = auVar200._8_4_ * fVar287 * fVar211;
            auVar65._8_4_ = fVar235;
            fVar206 = auVar200._12_4_ * fVar284 * fVar239;
            auVar65._12_4_ = fVar206;
            fVar309 = auVar200._16_4_ * fVar172 * fVar311;
            auVar65._16_4_ = fVar309;
            fVar211 = auVar200._20_4_ * fVar144 * fVar285;
            auVar65._20_4_ = fVar211;
            fVar310 = auVar200._24_4_ * fVar226 * fVar314;
            auVar65._24_4_ = fVar310;
            auVar65._28_4_ = fVar156;
            auVar331 = vsubps_avx(auVar185,auVar63);
            auVar325._0_4_ = auVar265._0_4_ + fVar225;
            auVar325._4_4_ = auVar265._4_4_ + fVar190;
            auVar325._8_4_ = auVar265._8_4_ + fVar235;
            auVar325._12_4_ = auVar265._12_4_ + fVar206;
            auVar325._16_4_ = auVar265._16_4_ + fVar309;
            auVar325._20_4_ = auVar265._20_4_ + fVar211;
            auVar325._24_4_ = auVar265._24_4_ + fVar310;
            auVar325._28_4_ = auVar265._28_4_ + fVar156;
            fVar225 = fVar286 * -fVar208 * auVar200._0_4_;
            fVar190 = fVar280 * -fVar279 * auVar200._4_4_;
            auVar66._4_4_ = fVar190;
            auVar66._0_4_ = fVar225;
            fVar235 = fVar287 * -fVar210 * auVar200._8_4_;
            auVar66._8_4_ = fVar235;
            fVar206 = fVar284 * -fVar283 * auVar200._12_4_;
            auVar66._12_4_ = fVar206;
            fVar309 = fVar172 * -fVar213 * auVar200._16_4_;
            auVar66._16_4_ = fVar309;
            fVar211 = fVar144 * -fVar304 * auVar200._20_4_;
            auVar66._20_4_ = fVar211;
            fVar310 = fVar226 * -fVar146 * auVar200._24_4_;
            auVar66._24_4_ = fVar310;
            auVar66._28_4_ = auVar333._28_4_;
            auVar19 = vsubps_avx(auVar139,auVar64);
            auVar223._0_4_ = (float)local_5a0._0_4_ + fVar225;
            auVar223._4_4_ = (float)local_5a0._4_4_ + fVar190;
            auVar223._8_4_ = fStack_598 + fVar235;
            auVar223._12_4_ = fStack_594 + fVar206;
            auVar223._16_4_ = fStack_590 + fVar309;
            auVar223._20_4_ = fStack_58c + fVar211;
            auVar223._24_4_ = fStack_588 + fVar310;
            auVar223._28_4_ = fStack_584 + auVar333._28_4_;
            fVar225 = fVar286 * 0.0 * auVar200._0_4_;
            fVar190 = fVar280 * 0.0 * auVar200._4_4_;
            auVar67._4_4_ = fVar190;
            auVar67._0_4_ = fVar225;
            fVar235 = fVar287 * 0.0 * auVar200._8_4_;
            auVar67._8_4_ = fVar235;
            fVar206 = fVar284 * 0.0 * auVar200._12_4_;
            auVar67._12_4_ = fVar206;
            fVar309 = fVar172 * 0.0 * auVar200._16_4_;
            auVar67._16_4_ = fVar309;
            fVar211 = fVar144 * 0.0 * auVar200._20_4_;
            auVar67._20_4_ = fVar211;
            fVar310 = fVar226 * 0.0 * auVar200._24_4_;
            auVar67._24_4_ = fVar310;
            auVar67._28_4_ = auVar139._28_4_;
            auVar294 = vsubps_avx(auVar265,auVar65);
            auVar104._4_4_ = fStack_61c;
            auVar104._0_4_ = local_620;
            auVar104._8_4_ = fStack_618;
            auVar104._12_4_ = fStack_614;
            auVar104._16_4_ = fStack_610;
            auVar104._20_4_ = fStack_60c;
            auVar104._24_4_ = fStack_608;
            auVar104._28_4_ = fStack_604;
            auVar296._0_4_ = local_620 + fVar225;
            auVar296._4_4_ = fStack_61c + fVar190;
            auVar296._8_4_ = fStack_618 + fVar235;
            auVar296._12_4_ = fStack_614 + fVar206;
            auVar296._16_4_ = fStack_610 + fVar309;
            auVar296._20_4_ = fStack_60c + fVar211;
            auVar296._24_4_ = fStack_608 + fVar310;
            auVar296._28_4_ = fStack_604 + auVar139._28_4_;
            auVar23 = vsubps_avx(_local_5a0,auVar66);
            auVar14 = vsubps_avx(auVar104,auVar67);
            auVar15 = vsubps_avx(auVar223,auVar331);
            auVar195 = vsubps_avx(auVar296,auVar19);
            auVar68._4_4_ = auVar19._4_4_ * auVar15._4_4_;
            auVar68._0_4_ = auVar19._0_4_ * auVar15._0_4_;
            auVar68._8_4_ = auVar19._8_4_ * auVar15._8_4_;
            auVar68._12_4_ = auVar19._12_4_ * auVar15._12_4_;
            auVar68._16_4_ = auVar19._16_4_ * auVar15._16_4_;
            auVar68._20_4_ = auVar19._20_4_ * auVar15._20_4_;
            auVar68._24_4_ = auVar19._24_4_ * auVar15._24_4_;
            auVar68._28_4_ = auVar319._28_4_;
            auVar69._4_4_ = auVar331._4_4_ * auVar195._4_4_;
            auVar69._0_4_ = auVar331._0_4_ * auVar195._0_4_;
            auVar69._8_4_ = auVar331._8_4_ * auVar195._8_4_;
            auVar69._12_4_ = auVar331._12_4_ * auVar195._12_4_;
            auVar69._16_4_ = auVar331._16_4_ * auVar195._16_4_;
            auVar69._20_4_ = auVar331._20_4_ * auVar195._20_4_;
            auVar69._24_4_ = auVar331._24_4_ * auVar195._24_4_;
            auVar69._28_4_ = fStack_584;
            auVar220 = vsubps_avx(auVar69,auVar68);
            auVar70._4_4_ = auVar196._4_4_ * auVar195._4_4_;
            auVar70._0_4_ = auVar196._0_4_ * auVar195._0_4_;
            auVar70._8_4_ = auVar196._8_4_ * auVar195._8_4_;
            auVar70._12_4_ = auVar196._12_4_ * auVar195._12_4_;
            auVar70._16_4_ = auVar196._16_4_ * auVar195._16_4_;
            auVar70._20_4_ = auVar196._20_4_ * auVar195._20_4_;
            auVar70._24_4_ = auVar196._24_4_ * auVar195._24_4_;
            auVar70._28_4_ = auVar195._28_4_;
            auVar195 = vsubps_avx(auVar325,auVar196);
            auVar71._4_4_ = auVar19._4_4_ * auVar195._4_4_;
            auVar71._0_4_ = auVar19._0_4_ * auVar195._0_4_;
            auVar71._8_4_ = auVar19._8_4_ * auVar195._8_4_;
            auVar71._12_4_ = auVar19._12_4_ * auVar195._12_4_;
            auVar71._16_4_ = auVar19._16_4_ * auVar195._16_4_;
            auVar71._20_4_ = auVar19._20_4_ * auVar195._20_4_;
            auVar71._24_4_ = auVar19._24_4_ * auVar195._24_4_;
            auVar71._28_4_ = auVar18._28_4_;
            auVar245 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar331._4_4_ * auVar195._4_4_;
            auVar72._0_4_ = auVar331._0_4_ * auVar195._0_4_;
            auVar72._8_4_ = auVar331._8_4_ * auVar195._8_4_;
            auVar72._12_4_ = auVar331._12_4_ * auVar195._12_4_;
            auVar72._16_4_ = auVar331._16_4_ * auVar195._16_4_;
            auVar72._20_4_ = auVar331._20_4_ * auVar195._20_4_;
            auVar72._24_4_ = auVar331._24_4_ * auVar195._24_4_;
            auVar72._28_4_ = auVar18._28_4_;
            auVar73._4_4_ = auVar196._4_4_ * auVar15._4_4_;
            auVar73._0_4_ = auVar196._0_4_ * auVar15._0_4_;
            auVar73._8_4_ = auVar196._8_4_ * auVar15._8_4_;
            auVar73._12_4_ = auVar196._12_4_ * auVar15._12_4_;
            auVar73._16_4_ = auVar196._16_4_ * auVar15._16_4_;
            auVar73._20_4_ = auVar196._20_4_ * auVar15._20_4_;
            auVar73._24_4_ = auVar196._24_4_ * auVar15._24_4_;
            auVar73._28_4_ = auVar15._28_4_;
            auVar18 = vsubps_avx(auVar73,auVar72);
            auVar167._0_4_ = auVar220._0_4_ * 0.0 + auVar18._0_4_ + auVar245._0_4_ * 0.0;
            auVar167._4_4_ = auVar220._4_4_ * 0.0 + auVar18._4_4_ + auVar245._4_4_ * 0.0;
            auVar167._8_4_ = auVar220._8_4_ * 0.0 + auVar18._8_4_ + auVar245._8_4_ * 0.0;
            auVar167._12_4_ = auVar220._12_4_ * 0.0 + auVar18._12_4_ + auVar245._12_4_ * 0.0;
            auVar167._16_4_ = auVar220._16_4_ * 0.0 + auVar18._16_4_ + auVar245._16_4_ * 0.0;
            auVar167._20_4_ = auVar220._20_4_ * 0.0 + auVar18._20_4_ + auVar245._20_4_ * 0.0;
            auVar167._24_4_ = auVar220._24_4_ * 0.0 + auVar18._24_4_ + auVar245._24_4_ * 0.0;
            auVar167._28_4_ = auVar220._28_4_ + auVar18._28_4_ + auVar245._28_4_;
            auVar308 = vcmpps_avx(auVar167,ZEXT832(0) << 0x20,2);
            auVar294 = vblendvps_avx(auVar294,_local_8e0,auVar308);
            auVar201 = ZEXT3264(auVar294);
            auVar18 = vblendvps_avx(auVar23,_local_7a0,auVar308);
            auVar23 = vblendvps_avx(auVar14,auVar334,auVar308);
            auVar14 = vblendvps_avx(auVar196,auVar325,auVar308);
            auVar15 = vblendvps_avx(auVar331,auVar223,auVar308);
            auVar195 = vblendvps_avx(auVar19,auVar296,auVar308);
            auVar196 = vblendvps_avx(auVar325,auVar196,auVar308);
            auVar220 = vblendvps_avx(auVar223,auVar331,auVar308);
            auVar245 = vblendvps_avx(auVar296,auVar19,auVar308);
            auVar169 = vandps_avx(auVar169,auVar165);
            auVar196 = vsubps_avx(auVar196,auVar294);
            auVar20 = vsubps_avx(auVar220,auVar18);
            auVar245 = vsubps_avx(auVar245,auVar23);
            auVar21 = vsubps_avx(auVar18,auVar15);
            fVar225 = auVar20._0_4_;
            fVar256 = auVar23._0_4_;
            fVar239 = auVar20._4_4_;
            fVar266 = auVar23._4_4_;
            auVar74._4_4_ = fVar266 * fVar239;
            auVar74._0_4_ = fVar256 * fVar225;
            fVar208 = auVar20._8_4_;
            fVar267 = auVar23._8_4_;
            auVar74._8_4_ = fVar267 * fVar208;
            fVar284 = auVar20._12_4_;
            fVar268 = auVar23._12_4_;
            auVar74._12_4_ = fVar268 * fVar284;
            fVar157 = auVar20._16_4_;
            fVar269 = auVar23._16_4_;
            auVar74._16_4_ = fVar269 * fVar157;
            fVar189 = auVar20._20_4_;
            fVar270 = auVar23._20_4_;
            auVar74._20_4_ = fVar270 * fVar189;
            fVar288 = auVar20._24_4_;
            fVar271 = auVar23._24_4_;
            auVar74._24_4_ = fVar271 * fVar288;
            auVar74._28_4_ = auVar220._28_4_;
            fVar190 = auVar18._0_4_;
            fVar290 = auVar245._0_4_;
            fVar312 = auVar18._4_4_;
            fVar298 = auVar245._4_4_;
            auVar75._4_4_ = fVar298 * fVar312;
            auVar75._0_4_ = fVar290 * fVar190;
            fVar286 = auVar18._8_4_;
            fVar299 = auVar245._8_4_;
            auVar75._8_4_ = fVar299 * fVar286;
            fVar213 = auVar18._12_4_;
            fVar300 = auVar245._12_4_;
            auVar75._12_4_ = fVar300 * fVar213;
            fVar173 = auVar18._16_4_;
            fVar301 = auVar245._16_4_;
            auVar75._16_4_ = fVar301 * fVar173;
            fVar240 = auVar18._20_4_;
            fVar302 = auVar245._20_4_;
            auVar75._20_4_ = fVar302 * fVar240;
            fVar238 = auVar18._24_4_;
            fVar303 = auVar245._24_4_;
            uVar7 = auVar331._28_4_;
            auVar75._24_4_ = fVar303 * fVar238;
            auVar75._28_4_ = uVar7;
            auVar220 = vsubps_avx(auVar75,auVar74);
            fVar235 = auVar294._0_4_;
            fVar311 = auVar294._4_4_;
            auVar76._4_4_ = fVar298 * fVar311;
            auVar76._0_4_ = fVar290 * fVar235;
            fVar279 = auVar294._8_4_;
            auVar76._8_4_ = fVar299 * fVar279;
            fVar172 = auVar294._12_4_;
            auVar76._12_4_ = fVar300 * fVar172;
            fVar255 = auVar294._16_4_;
            auVar76._16_4_ = fVar301 * fVar255;
            fVar254 = auVar294._20_4_;
            auVar76._20_4_ = fVar302 * fVar254;
            fVar272 = auVar294._24_4_;
            auVar76._24_4_ = fVar303 * fVar272;
            auVar76._28_4_ = uVar7;
            fVar206 = auVar196._0_4_;
            fVar313 = auVar196._4_4_;
            auVar77._4_4_ = fVar266 * fVar313;
            auVar77._0_4_ = fVar256 * fVar206;
            fVar280 = auVar196._8_4_;
            auVar77._8_4_ = fVar267 * fVar280;
            fVar304 = auVar196._12_4_;
            auVar77._12_4_ = fVar268 * fVar304;
            fVar125 = auVar196._16_4_;
            auVar77._16_4_ = fVar269 * fVar125;
            fVar205 = auVar196._20_4_;
            auVar77._20_4_ = fVar270 * fVar205;
            fVar278 = auVar196._24_4_;
            auVar77._24_4_ = fVar271 * fVar278;
            auVar77._28_4_ = auVar325._28_4_;
            auVar331 = vsubps_avx(auVar77,auVar76);
            auVar78._4_4_ = fVar312 * fVar313;
            auVar78._0_4_ = fVar190 * fVar206;
            auVar78._8_4_ = fVar286 * fVar280;
            auVar78._12_4_ = fVar213 * fVar304;
            auVar78._16_4_ = fVar173 * fVar125;
            auVar78._20_4_ = fVar240 * fVar205;
            auVar78._24_4_ = fVar238 * fVar278;
            auVar78._28_4_ = uVar7;
            auVar79._4_4_ = fVar311 * fVar239;
            auVar79._0_4_ = fVar235 * fVar225;
            auVar79._8_4_ = fVar279 * fVar208;
            auVar79._12_4_ = fVar172 * fVar284;
            auVar79._16_4_ = fVar255 * fVar157;
            auVar79._20_4_ = fVar254 * fVar189;
            auVar79._24_4_ = fVar272 * fVar288;
            auVar79._28_4_ = auVar19._28_4_;
            auVar19 = vsubps_avx(auVar79,auVar78);
            auVar22 = vsubps_avx(auVar23,auVar195);
            fVar211 = auVar19._28_4_ + auVar331._28_4_;
            auVar307._0_4_ = auVar19._0_4_ + auVar331._0_4_ * 0.0 + auVar220._0_4_ * 0.0;
            auVar307._4_4_ = auVar19._4_4_ + auVar331._4_4_ * 0.0 + auVar220._4_4_ * 0.0;
            auVar307._8_4_ = auVar19._8_4_ + auVar331._8_4_ * 0.0 + auVar220._8_4_ * 0.0;
            auVar307._12_4_ = auVar19._12_4_ + auVar331._12_4_ * 0.0 + auVar220._12_4_ * 0.0;
            auVar307._16_4_ = auVar19._16_4_ + auVar331._16_4_ * 0.0 + auVar220._16_4_ * 0.0;
            auVar307._20_4_ = auVar19._20_4_ + auVar331._20_4_ * 0.0 + auVar220._20_4_ * 0.0;
            auVar307._24_4_ = auVar19._24_4_ + auVar331._24_4_ * 0.0 + auVar220._24_4_ * 0.0;
            auVar307._28_4_ = fVar211 + auVar220._28_4_;
            fVar309 = auVar21._0_4_;
            fVar285 = auVar21._4_4_;
            auVar80._4_4_ = auVar195._4_4_ * fVar285;
            auVar80._0_4_ = auVar195._0_4_ * fVar309;
            fVar210 = auVar21._8_4_;
            auVar80._8_4_ = auVar195._8_4_ * fVar210;
            fVar144 = auVar21._12_4_;
            auVar80._12_4_ = auVar195._12_4_ * fVar144;
            fVar143 = auVar21._16_4_;
            auVar80._16_4_ = auVar195._16_4_ * fVar143;
            fVar207 = auVar21._20_4_;
            auVar80._20_4_ = auVar195._20_4_ * fVar207;
            fVar281 = auVar21._24_4_;
            auVar80._24_4_ = auVar195._24_4_ * fVar281;
            auVar80._28_4_ = fVar211;
            fVar211 = auVar22._0_4_;
            fVar315 = auVar22._4_4_;
            auVar81._4_4_ = auVar15._4_4_ * fVar315;
            auVar81._0_4_ = auVar15._0_4_ * fVar211;
            fVar287 = auVar22._8_4_;
            auVar81._8_4_ = auVar15._8_4_ * fVar287;
            fVar146 = auVar22._12_4_;
            auVar81._12_4_ = auVar15._12_4_ * fVar146;
            fVar145 = auVar22._16_4_;
            auVar81._16_4_ = auVar15._16_4_ * fVar145;
            fVar209 = auVar22._20_4_;
            auVar81._20_4_ = auVar15._20_4_ * fVar209;
            fVar282 = auVar22._24_4_;
            auVar81._24_4_ = auVar15._24_4_ * fVar282;
            auVar81._28_4_ = auVar19._28_4_;
            auVar331 = vsubps_avx(auVar81,auVar80);
            auVar19 = vsubps_avx(auVar294,auVar14);
            fVar310 = auVar19._0_4_;
            fVar314 = auVar19._4_4_;
            auVar82._4_4_ = auVar195._4_4_ * fVar314;
            auVar82._0_4_ = auVar195._0_4_ * fVar310;
            fVar283 = auVar19._8_4_;
            auVar82._8_4_ = auVar195._8_4_ * fVar283;
            fVar226 = auVar19._12_4_;
            auVar82._12_4_ = auVar195._12_4_ * fVar226;
            fVar147 = auVar19._16_4_;
            auVar82._16_4_ = auVar195._16_4_ * fVar147;
            fVar212 = auVar19._20_4_;
            auVar82._20_4_ = auVar195._20_4_ * fVar212;
            fVar289 = auVar19._24_4_;
            auVar82._24_4_ = auVar195._24_4_ * fVar289;
            auVar82._28_4_ = auVar195._28_4_;
            auVar83._4_4_ = fVar315 * auVar14._4_4_;
            auVar83._0_4_ = fVar211 * auVar14._0_4_;
            auVar83._8_4_ = fVar287 * auVar14._8_4_;
            auVar83._12_4_ = fVar146 * auVar14._12_4_;
            auVar83._16_4_ = fVar145 * auVar14._16_4_;
            auVar83._20_4_ = fVar209 * auVar14._20_4_;
            auVar83._24_4_ = fVar282 * auVar14._24_4_;
            auVar83._28_4_ = auVar220._28_4_;
            auVar195 = vsubps_avx(auVar82,auVar83);
            auVar84._4_4_ = auVar15._4_4_ * fVar314;
            auVar84._0_4_ = auVar15._0_4_ * fVar310;
            auVar84._8_4_ = auVar15._8_4_ * fVar283;
            auVar84._12_4_ = auVar15._12_4_ * fVar226;
            auVar84._16_4_ = auVar15._16_4_ * fVar147;
            auVar84._20_4_ = auVar15._20_4_ * fVar212;
            auVar84._24_4_ = auVar15._24_4_ * fVar289;
            auVar84._28_4_ = auVar15._28_4_;
            auVar85._4_4_ = fVar285 * auVar14._4_4_;
            auVar85._0_4_ = fVar309 * auVar14._0_4_;
            auVar85._8_4_ = fVar210 * auVar14._8_4_;
            auVar85._12_4_ = fVar144 * auVar14._12_4_;
            auVar85._16_4_ = fVar143 * auVar14._16_4_;
            auVar85._20_4_ = fVar207 * auVar14._20_4_;
            auVar85._24_4_ = fVar281 * auVar14._24_4_;
            auVar85._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar85,auVar84);
            auVar140._0_4_ = auVar331._0_4_ * 0.0 + auVar14._0_4_ + auVar195._0_4_ * 0.0;
            auVar140._4_4_ = auVar331._4_4_ * 0.0 + auVar14._4_4_ + auVar195._4_4_ * 0.0;
            auVar140._8_4_ = auVar331._8_4_ * 0.0 + auVar14._8_4_ + auVar195._8_4_ * 0.0;
            auVar140._12_4_ = auVar331._12_4_ * 0.0 + auVar14._12_4_ + auVar195._12_4_ * 0.0;
            auVar140._16_4_ = auVar331._16_4_ * 0.0 + auVar14._16_4_ + auVar195._16_4_ * 0.0;
            auVar140._20_4_ = auVar331._20_4_ * 0.0 + auVar14._20_4_ + auVar195._20_4_ * 0.0;
            auVar140._24_4_ = auVar331._24_4_ * 0.0 + auVar14._24_4_ + auVar195._24_4_ * 0.0;
            auVar140._28_4_ = auVar195._28_4_ + auVar14._28_4_ + auVar195._28_4_;
            auVar142 = ZEXT3264(auVar140);
            auVar14 = vmaxps_avx(auVar307,auVar140);
            auVar14 = vcmpps_avx(auVar14,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar15 = auVar169 & auVar14;
            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar15 >> 0x7f,0) == '\0') &&
                  (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0xbf,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar15[0x1f]) {
LAB_00e33c57:
              auVar171 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              auVar321._4_4_ = fVar150;
              auVar321._0_4_ = fVar148;
              auVar321._8_4_ = fVar152;
              auVar321._12_4_ = fVar155;
              auVar321._16_4_ = fVar149;
              auVar321._20_4_ = fVar151;
              auVar321._24_4_ = fVar154;
              auVar321._28_4_ = fVar156;
            }
            else {
              auVar15 = vandps_avx(auVar14,auVar169);
              auVar86._4_4_ = fVar315 * fVar239;
              auVar86._0_4_ = fVar211 * fVar225;
              auVar86._8_4_ = fVar287 * fVar208;
              auVar86._12_4_ = fVar146 * fVar284;
              auVar86._16_4_ = fVar145 * fVar157;
              auVar86._20_4_ = fVar209 * fVar189;
              auVar86._24_4_ = fVar282 * fVar288;
              auVar86._28_4_ = auVar169._28_4_;
              auVar87._4_4_ = fVar285 * fVar298;
              auVar87._0_4_ = fVar309 * fVar290;
              auVar87._8_4_ = fVar210 * fVar299;
              auVar87._12_4_ = fVar144 * fVar300;
              auVar87._16_4_ = fVar143 * fVar301;
              auVar87._20_4_ = fVar207 * fVar302;
              auVar87._24_4_ = fVar281 * fVar303;
              auVar87._28_4_ = auVar14._28_4_;
              auVar14 = vsubps_avx(auVar87,auVar86);
              auVar88._4_4_ = fVar314 * fVar298;
              auVar88._0_4_ = fVar310 * fVar290;
              auVar88._8_4_ = fVar283 * fVar299;
              auVar88._12_4_ = fVar226 * fVar300;
              auVar88._16_4_ = fVar147 * fVar301;
              auVar88._20_4_ = fVar212 * fVar302;
              auVar88._24_4_ = fVar289 * fVar303;
              auVar88._28_4_ = auVar245._28_4_;
              auVar89._4_4_ = fVar315 * fVar313;
              auVar89._0_4_ = fVar211 * fVar206;
              auVar89._8_4_ = fVar287 * fVar280;
              auVar89._12_4_ = fVar146 * fVar304;
              auVar89._16_4_ = fVar145 * fVar125;
              auVar89._20_4_ = fVar209 * fVar205;
              auVar89._24_4_ = fVar282 * fVar278;
              auVar89._28_4_ = auVar22._28_4_;
              auVar195 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar285 * fVar313;
              auVar90._0_4_ = fVar309 * fVar206;
              auVar90._8_4_ = fVar210 * fVar280;
              auVar90._12_4_ = fVar144 * fVar304;
              auVar90._16_4_ = fVar143 * fVar125;
              auVar90._20_4_ = fVar207 * fVar205;
              auVar90._24_4_ = fVar281 * fVar278;
              auVar90._28_4_ = auVar196._28_4_;
              auVar91._4_4_ = fVar314 * fVar239;
              auVar91._0_4_ = fVar310 * fVar225;
              auVar91._8_4_ = fVar283 * fVar208;
              auVar91._12_4_ = fVar226 * fVar284;
              auVar91._16_4_ = fVar147 * fVar157;
              auVar91._20_4_ = fVar212 * fVar189;
              auVar91._24_4_ = fVar289 * fVar288;
              auVar91._28_4_ = auVar20._28_4_;
              auVar220 = vsubps_avx(auVar91,auVar90);
              auVar168._0_4_ = auVar14._0_4_ * 0.0 + auVar220._0_4_ + auVar195._0_4_ * 0.0;
              auVar168._4_4_ = auVar14._4_4_ * 0.0 + auVar220._4_4_ + auVar195._4_4_ * 0.0;
              auVar168._8_4_ = auVar14._8_4_ * 0.0 + auVar220._8_4_ + auVar195._8_4_ * 0.0;
              auVar168._12_4_ = auVar14._12_4_ * 0.0 + auVar220._12_4_ + auVar195._12_4_ * 0.0;
              auVar168._16_4_ = auVar14._16_4_ * 0.0 + auVar220._16_4_ + auVar195._16_4_ * 0.0;
              auVar168._20_4_ = auVar14._20_4_ * 0.0 + auVar220._20_4_ + auVar195._20_4_ * 0.0;
              auVar168._24_4_ = auVar14._24_4_ * 0.0 + auVar220._24_4_ + auVar195._24_4_ * 0.0;
              auVar168._28_4_ = auVar20._28_4_ + auVar220._28_4_ + auVar196._28_4_;
              auVar169 = vrcpps_avx(auVar168);
              fVar225 = auVar169._0_4_;
              fVar206 = auVar169._4_4_;
              auVar92._4_4_ = auVar168._4_4_ * fVar206;
              auVar92._0_4_ = auVar168._0_4_ * fVar225;
              fVar309 = auVar169._8_4_;
              auVar92._8_4_ = auVar168._8_4_ * fVar309;
              fVar211 = auVar169._12_4_;
              auVar92._12_4_ = auVar168._12_4_ * fVar211;
              fVar310 = auVar169._16_4_;
              auVar92._16_4_ = auVar168._16_4_ * fVar310;
              fVar239 = auVar169._20_4_;
              auVar92._20_4_ = auVar168._20_4_ * fVar239;
              fVar313 = auVar169._24_4_;
              auVar92._24_4_ = auVar168._24_4_ * fVar313;
              auVar92._28_4_ = auVar22._28_4_;
              auVar320._8_4_ = 0x3f800000;
              auVar320._0_8_ = 0x3f8000003f800000;
              auVar320._12_4_ = 0x3f800000;
              auVar320._16_4_ = 0x3f800000;
              auVar320._20_4_ = 0x3f800000;
              auVar320._24_4_ = 0x3f800000;
              auVar320._28_4_ = 0x3f800000;
              auVar169 = vsubps_avx(auVar320,auVar92);
              fVar225 = auVar169._0_4_ * fVar225 + fVar225;
              fVar206 = auVar169._4_4_ * fVar206 + fVar206;
              fVar309 = auVar169._8_4_ * fVar309 + fVar309;
              fVar211 = auVar169._12_4_ * fVar211 + fVar211;
              fVar310 = auVar169._16_4_ * fVar310 + fVar310;
              fVar239 = auVar169._20_4_ * fVar239 + fVar239;
              fVar313 = auVar169._24_4_ * fVar313 + fVar313;
              auVar93._4_4_ =
                   (fVar311 * auVar14._4_4_ + auVar195._4_4_ * fVar312 + auVar220._4_4_ * fVar266) *
                   fVar206;
              auVar93._0_4_ =
                   (fVar235 * auVar14._0_4_ + auVar195._0_4_ * fVar190 + auVar220._0_4_ * fVar256) *
                   fVar225;
              auVar93._8_4_ =
                   (fVar279 * auVar14._8_4_ + auVar195._8_4_ * fVar286 + auVar220._8_4_ * fVar267) *
                   fVar309;
              auVar93._12_4_ =
                   (fVar172 * auVar14._12_4_ + auVar195._12_4_ * fVar213 + auVar220._12_4_ * fVar268
                   ) * fVar211;
              auVar93._16_4_ =
                   (fVar255 * auVar14._16_4_ + auVar195._16_4_ * fVar173 + auVar220._16_4_ * fVar269
                   ) * fVar310;
              auVar93._20_4_ =
                   (fVar254 * auVar14._20_4_ + auVar195._20_4_ * fVar240 + auVar220._20_4_ * fVar270
                   ) * fVar239;
              auVar93._24_4_ =
                   (fVar272 * auVar14._24_4_ + auVar195._24_4_ * fVar238 + auVar220._24_4_ * fVar271
                   ) * fVar313;
              auVar93._28_4_ = auVar294._28_4_ + auVar18._28_4_ + auVar23._28_4_;
              auVar201 = ZEXT3264(auVar93);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar224._4_4_ = uVar7;
              auVar224._0_4_ = uVar7;
              auVar224._8_4_ = uVar7;
              auVar224._12_4_ = uVar7;
              auVar224._16_4_ = uVar7;
              auVar224._20_4_ = uVar7;
              auVar224._24_4_ = uVar7;
              auVar224._28_4_ = uVar7;
              auVar169 = vcmpps_avx(local_5c0,auVar93,2);
              auVar294 = vcmpps_avx(auVar93,auVar224,2);
              auVar169 = vandps_avx(auVar169,auVar294);
              auVar18 = auVar15 & auVar169;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar18 >> 0x7f,0) == '\0') &&
                    (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar18 >> 0xbf,0) == '\0') &&
                  (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar18[0x1f]) goto LAB_00e33c57;
              auVar169 = vandps_avx(auVar15,auVar169);
              auVar18 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar168,4);
              auVar23 = auVar169 & auVar18;
              auVar171 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              auVar321._4_4_ = fVar150;
              auVar321._0_4_ = fVar148;
              auVar321._8_4_ = fVar152;
              auVar321._12_4_ = fVar155;
              auVar321._16_4_ = fVar149;
              auVar321._20_4_ = fVar151;
              auVar321._24_4_ = fVar154;
              auVar321._28_4_ = fVar156;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                auVar169 = vandps_avx(auVar18,auVar169);
                auVar171 = ZEXT3264(auVar169);
                auVar94._4_4_ = fVar206 * auVar307._4_4_;
                auVar94._0_4_ = fVar225 * auVar307._0_4_;
                auVar94._8_4_ = fVar309 * auVar307._8_4_;
                auVar94._12_4_ = fVar211 * auVar307._12_4_;
                auVar94._16_4_ = fVar310 * auVar307._16_4_;
                auVar94._20_4_ = fVar239 * auVar307._20_4_;
                auVar94._24_4_ = fVar313 * auVar307._24_4_;
                auVar94._28_4_ = auVar294._28_4_;
                auVar95._4_4_ = auVar140._4_4_ * fVar206;
                auVar95._0_4_ = auVar140._0_4_ * fVar225;
                auVar95._8_4_ = auVar140._8_4_ * fVar309;
                auVar95._12_4_ = auVar140._12_4_ * fVar211;
                auVar95._16_4_ = auVar140._16_4_ * fVar310;
                auVar95._20_4_ = auVar140._20_4_ * fVar239;
                auVar95._24_4_ = auVar140._24_4_ * fVar313;
                auVar95._28_4_ = auVar140._28_4_;
                auVar247._8_4_ = 0x3f800000;
                auVar247._0_8_ = 0x3f8000003f800000;
                auVar247._12_4_ = 0x3f800000;
                auVar247._16_4_ = 0x3f800000;
                auVar247._20_4_ = 0x3f800000;
                auVar247._24_4_ = 0x3f800000;
                auVar247._28_4_ = 0x3f800000;
                auVar169 = vsubps_avx(auVar247,auVar94);
                local_300 = vblendvps_avx(auVar169,auVar94,auVar308);
                auVar169 = vsubps_avx(auVar247,auVar95);
                _local_4e0 = vblendvps_avx(auVar169,auVar95,auVar308);
                auVar142 = ZEXT3264(_local_4e0);
                local_320 = auVar93;
              }
            }
            pRVar118 = (RTCIntersectArguments *)((ulong)pRVar117 & 0xffffffff);
            auVar169 = auVar171._0_32_;
            local_540 = auVar17;
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar171 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar171 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar171[0x1f] < '\0') {
              auVar294 = vsubps_avx(auVar200,auVar321);
              auVar201 = ZEXT3264(local_300);
              fVar190 = auVar321._0_4_ + auVar294._0_4_ * local_300._0_4_;
              fVar235 = auVar321._4_4_ + auVar294._4_4_ * local_300._4_4_;
              fVar206 = auVar321._8_4_ + auVar294._8_4_ * local_300._8_4_;
              fVar309 = auVar321._12_4_ + auVar294._12_4_ * local_300._12_4_;
              fVar211 = auVar321._16_4_ + auVar294._16_4_ * local_300._16_4_;
              fVar310 = auVar321._20_4_ + auVar294._20_4_ * local_300._20_4_;
              fVar239 = auVar321._24_4_ + auVar294._24_4_ * local_300._24_4_;
              fVar312 = auVar321._28_4_ + auVar294._28_4_;
              fVar225 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar96._4_4_ = (fVar235 + fVar235) * fVar225;
              auVar96._0_4_ = (fVar190 + fVar190) * fVar225;
              auVar96._8_4_ = (fVar206 + fVar206) * fVar225;
              auVar96._12_4_ = (fVar309 + fVar309) * fVar225;
              auVar96._16_4_ = (fVar211 + fVar211) * fVar225;
              auVar96._20_4_ = (fVar310 + fVar310) * fVar225;
              auVar96._24_4_ = (fVar239 + fVar239) * fVar225;
              auVar96._28_4_ = fVar312 + fVar312;
              auVar294 = vcmpps_avx(local_320,auVar96,6);
              auVar142 = ZEXT3264(auVar294);
              auVar17 = auVar169 & auVar294;
              if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar17 >> 0x7f,0) != '\0') ||
                    (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0xbf,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar17[0x1f] < '\0') {
                local_3a0 = vandps_avx(auVar294,auVar169);
                auVar142 = ZEXT3264(local_3a0);
                auVar161._0_8_ =
                     CONCAT44((float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0,
                              (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0);
                auVar161._8_4_ = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
                auVar161._12_4_ = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
                auVar163._16_4_ = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
                auVar163._0_16_ = auVar161;
                auVar163._20_4_ = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
                fStack_428 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
                _local_440 = auVar163;
                fStack_424 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
                auVar171 = ZEXT3264(_local_440);
                local_460 = local_300;
                local_420 = local_320;
                local_3e0 = local_720;
                uStack_3d8 = uStack_718;
                local_3d0 = local_630;
                uStack_3c8 = uStack_628;
                local_3c0 = local_640;
                uStack_3b8 = uStack_638;
                pGVar11 = (context->scene->geometries).items[uVar123].ptr;
                _local_4e0 = _local_440;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar118 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar118 = context->args;
                  if ((pRVar118->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar118 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar118 >> 8),1),
                     pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar16 = vshufps_avx(ZEXT416((uint)(float)(int)local_400),
                                          ZEXT416((uint)(float)(int)local_400),0);
                    local_380[0] = (auVar16._0_4_ + local_300._0_4_ + 0.0) * (float)local_120._0_4_;
                    local_380[1] = (auVar16._4_4_ + local_300._4_4_ + 1.0) * (float)local_120._4_4_;
                    local_380[2] = (auVar16._8_4_ + local_300._8_4_ + 2.0) * fStack_118;
                    local_380[3] = (auVar16._12_4_ + local_300._12_4_ + 3.0) * fStack_114;
                    fStack_370 = (auVar16._0_4_ + local_300._16_4_ + 4.0) * fStack_110;
                    fStack_36c = (auVar16._4_4_ + local_300._20_4_ + 5.0) * fStack_10c;
                    fStack_368 = (auVar16._8_4_ + local_300._24_4_ + 6.0) * fStack_108;
                    fStack_364 = auVar16._12_4_ + (float)local_300._28_4_ + 7.0;
                    uStack_4d8 = auVar161._8_8_;
                    uStack_4d0 = auVar163._16_8_;
                    uStack_4c8 = local_440._24_8_;
                    local_360 = auVar161._0_8_;
                    uStack_358 = uStack_4d8;
                    uStack_350 = uStack_4d0;
                    uStack_348 = uStack_4c8;
                    auVar171 = ZEXT3264(local_320);
                    local_340 = local_320;
                    iVar115 = vmovmskps_avx(local_3a0);
                    local_900 = CONCAT44((int)((ulong)pRVar118 >> 0x20),iVar115);
                    lVar13 = 0;
                    if (local_900 != 0) {
                      for (; (local_900 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                      }
                    }
                    local_880 = (uint)lVar13;
                    uStack_87c = (undefined4)((ulong)lVar13 >> 0x20);
                    if (iVar115 == 0) {
                      pRVar118 = (RTCIntersectArguments *)0x0;
LAB_00e33c6b:
                    }
                    else {
                      auVar16 = *local_700;
                      uStack_650 = *(undefined8 *)(local_708 + 0x10);
                      _local_660 = *local_700;
                      uStack_648 = *(undefined8 *)(local_708 + 0x18);
                      uVar120 = *(uint *)(ray + k * 4 + 0x100);
                      _local_680 = auVar165;
                      local_3fc = uVar10;
                      local_3f0 = uVar113;
                      uStack_3e8 = uVar114;
                      do {
                        lVar13 = CONCAT44(uStack_87c,local_880);
                        local_1e0 = local_380[lVar13];
                        local_1c0 = *(undefined4 *)((long)&local_360 + lVar13 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_340 + lVar13 * 4);
                        fVar190 = 1.0 - local_1e0;
                        fVar225 = local_1e0 * fVar190 * 4.0;
                        auVar230 = ZEXT416((uint)(local_1e0 * local_1e0 * 0.5));
                        auVar230 = vshufps_avx(auVar230,auVar230,0);
                        auVar180 = ZEXT416((uint)((fVar190 * fVar190 + fVar225) * 0.5));
                        auVar180 = vshufps_avx(auVar180,auVar180,0);
                        auVar219 = ZEXT416((uint)((-local_1e0 * local_1e0 - fVar225) * 0.5));
                        auVar219 = vshufps_avx(auVar219,auVar219,0);
                        local_6f0.context = context->user;
                        auVar194 = ZEXT416((uint)(fVar190 * -fVar190 * 0.5));
                        auVar194 = vshufps_avx(auVar194,auVar194,0);
                        auVar181._0_4_ =
                             local_910 * auVar194._0_4_ +
                             auVar219._0_4_ * (float)local_720._0_4_ +
                             auVar230._0_4_ * (float)local_640._0_4_ +
                             auVar180._0_4_ * (float)local_630._0_4_;
                        auVar181._4_4_ =
                             fStack_90c * auVar194._4_4_ +
                             auVar219._4_4_ * (float)local_720._4_4_ +
                             auVar230._4_4_ * (float)local_640._4_4_ +
                             auVar180._4_4_ * (float)local_630._4_4_;
                        auVar181._8_4_ =
                             fStack_908 * auVar194._8_4_ +
                             auVar219._8_4_ * (float)uStack_718 +
                             auVar230._8_4_ * (float)uStack_638 + auVar180._8_4_ * (float)uStack_628
                        ;
                        auVar181._12_4_ =
                             fStack_904 * auVar194._12_4_ +
                             auVar219._12_4_ * uStack_718._4_4_ +
                             auVar230._12_4_ * uStack_638._4_4_ + auVar180._12_4_ * uStack_628._4_4_
                        ;
                        local_230 = vshufps_avx(auVar181,auVar181,0);
                        local_240[0] = (RTCHitN)local_230[0];
                        local_240[1] = (RTCHitN)local_230[1];
                        local_240[2] = (RTCHitN)local_230[2];
                        local_240[3] = (RTCHitN)local_230[3];
                        local_240[4] = (RTCHitN)local_230[4];
                        local_240[5] = (RTCHitN)local_230[5];
                        local_240[6] = (RTCHitN)local_230[6];
                        local_240[7] = (RTCHitN)local_230[7];
                        local_240[8] = (RTCHitN)local_230[8];
                        local_240[9] = (RTCHitN)local_230[9];
                        local_240[10] = (RTCHitN)local_230[10];
                        local_240[0xb] = (RTCHitN)local_230[0xb];
                        local_240[0xc] = (RTCHitN)local_230[0xc];
                        local_240[0xd] = (RTCHitN)local_230[0xd];
                        local_240[0xe] = (RTCHitN)local_230[0xe];
                        local_240[0xf] = (RTCHitN)local_230[0xf];
                        local_210 = vshufps_avx(auVar181,auVar181,0x55);
                        local_220 = local_210;
                        local_1f0 = vshufps_avx(auVar181,auVar181,0xaa);
                        local_200 = local_1f0;
                        fStack_1dc = local_1e0;
                        fStack_1d8 = local_1e0;
                        fStack_1d4 = local_1e0;
                        fStack_1d0 = local_1e0;
                        fStack_1cc = local_1e0;
                        fStack_1c8 = local_1e0;
                        fStack_1c4 = local_1e0;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_560._0_8_;
                        uStack_198 = local_560._8_8_;
                        uStack_190 = local_560._16_8_;
                        uStack_188 = local_560._24_8_;
                        local_180 = local_100._0_8_;
                        uStack_178 = local_100._8_8_;
                        uStack_170 = local_100._16_8_;
                        uStack_168 = local_100._24_8_;
                        auVar169 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),
                                              ZEXT1632(ZEXT816(0) << 0x40),0xf);
                        local_6f8[1] = auVar169;
                        *local_6f8 = auVar169;
                        local_160 = (local_6f0.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_6f0.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_740 = local_660;
                        uStack_738 = uStack_658;
                        uStack_730 = uStack_650;
                        uStack_728 = uStack_648;
                        local_6f0.valid = (int *)&local_740;
                        local_6f0.geometryUserPtr = pGVar11->userPtr;
                        local_6f0.hit = local_240;
                        local_6f0.N = 8;
                        auVar132 = _local_7a0;
                        local_6f0.ray = (RTCRayN *)ray;
                        auVar162 = auVar16;
                        if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar11->occlusionFilterN)(&local_6f0);
                          auVar162._8_8_ = uStack_738;
                          auVar162._0_8_ = local_740;
                          auVar132._8_8_ = uStack_728;
                          auVar132._0_8_ = uStack_730;
                        }
                        auVar171 = ZEXT1664(auVar162);
                        auVar230 = vpcmpeqd_avx(auVar162,ZEXT816(0) << 0x40);
                        auVar180 = vpcmpeqd_avx(auVar132,ZEXT816(0) << 0x40);
                        auVar201 = ZEXT1664(auVar180);
                        auVar186._16_16_ = auVar180;
                        auVar186._0_16_ = auVar230;
                        auVar294 = auVar169 & ~auVar186;
                        local_7c0 = auVar169._0_4_;
                        uStack_7bc = auVar169._4_4_;
                        uStack_7b8 = auVar169._8_4_;
                        uStack_7b4 = auVar169._12_4_;
                        uStack_7b0 = auVar169._16_4_;
                        uStack_7ac = auVar169._20_4_;
                        uStack_7a8 = auVar169._24_4_;
                        uStack_7a4 = auVar169._28_4_;
                        if ((((((((auVar294 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar294 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar294 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar294 >> 0x7f,0) == '\0')
                              && (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar294 >> 0xbf,0) == '\0') &&
                            (auVar294 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar294[0x1f]) {
                          auVar141._0_4_ = auVar230._0_4_ ^ local_7c0;
                          auVar141._4_4_ = auVar230._4_4_ ^ uStack_7bc;
                          auVar141._8_4_ = auVar230._8_4_ ^ uStack_7b8;
                          auVar141._12_4_ = auVar230._12_4_ ^ uStack_7b4;
                          auVar141._16_4_ = auVar180._0_4_ ^ uStack_7b0;
                          auVar141._20_4_ = auVar180._4_4_ ^ uStack_7ac;
                          auVar141._24_4_ = auVar180._8_4_ ^ uStack_7a8;
                          auVar141._28_4_ = auVar180._12_4_ ^ uStack_7a4;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar201 = ZEXT1664(auVar180);
                            (*p_Var12)(&local_6f0);
                            auVar162._8_8_ = uStack_738;
                            auVar162._0_8_ = local_740;
                            auVar132._8_8_ = uStack_728;
                            auVar132._0_8_ = uStack_730;
                          }
                          auVar230 = vpcmpeqd_avx(auVar162,ZEXT816(0) << 0x40);
                          auVar180 = vpcmpeqd_avx(auVar132,ZEXT816(0) << 0x40);
                          auVar170._16_16_ = auVar180;
                          auVar170._0_16_ = auVar230;
                          auVar141._0_4_ = auVar230._0_4_ ^ local_7c0;
                          auVar141._4_4_ = auVar230._4_4_ ^ uStack_7bc;
                          auVar141._8_4_ = auVar230._8_4_ ^ uStack_7b8;
                          auVar141._12_4_ = auVar230._12_4_ ^ uStack_7b4;
                          auVar141._16_4_ = auVar180._0_4_ ^ uStack_7b0;
                          auVar141._20_4_ = auVar180._4_4_ ^ uStack_7ac;
                          auVar141._24_4_ = auVar180._8_4_ ^ uStack_7a8;
                          auVar141._28_4_ = auVar180._12_4_ ^ uStack_7a4;
                          auVar187._8_4_ = 0xff800000;
                          auVar187._0_8_ = 0xff800000ff800000;
                          auVar187._12_4_ = 0xff800000;
                          auVar187._16_4_ = 0xff800000;
                          auVar187._20_4_ = 0xff800000;
                          auVar187._24_4_ = 0xff800000;
                          auVar187._28_4_ = 0xff800000;
                          auVar169 = vblendvps_avx(auVar187,*(undefined1 (*) [32])
                                                             (local_6f0.ray + 0x100),auVar170);
                          auVar171 = ZEXT3264(auVar169);
                          *(undefined1 (*) [32])(local_6f0.ray + 0x100) = auVar169;
                        }
                        auVar142 = ZEXT3264(auVar141);
                        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar141 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar141 >> 0x7f,0) != '\0')
                              || (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar141 >> 0xbf,0) != '\0') ||
                            (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar141[0x1f] < '\0') {
                          pRVar118 = (RTCIntersectArguments *)0x1;
                          goto LAB_00e33c6b;
                        }
                        auVar142 = ZEXT464(uVar120);
                        *(uint *)(ray + k * 4 + 0x100) = uVar120;
                        local_900 = local_900 ^ 1L << ((ulong)local_880 & 0x3f);
                        lVar13 = 0;
                        if (local_900 != 0) {
                          for (; (local_900 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                          }
                        }
                        local_880 = (uint)lVar13;
                        uStack_87c = (undefined4)((ulong)lVar13 >> 0x20);
                        pRVar118 = (RTCIntersectArguments *)0x0;
                      } while (local_900 != 0);
                    }
                  }
                }
                pRVar118 = (RTCIntersectArguments *)(ulong)(byte)((byte)pRVar117 | (byte)pRVar118);
                fVar204 = (float)local_6c0._0_4_;
                fVar241 = (float)local_6c0._4_4_;
                fVar248 = fStack_6b8;
                fVar250 = fStack_6b4;
                fVar252 = fStack_6b0;
                fVar322 = fStack_6ac;
                fVar188 = fStack_6a8;
                fVar153 = fStack_6a4;
              }
            }
          }
          auVar297 = ZEXT3264(auVar233);
          auVar277 = ZEXT3264(auVar274);
          uVar120 = (uint)pRVar118;
          lVar124 = lVar124 + 8;
          pRVar117 = pRVar118;
          fVar226 = (float)local_6a0._0_4_;
          fVar157 = (float)local_6a0._4_4_;
          fVar173 = fStack_698;
          fVar255 = fStack_694;
          fVar225 = fStack_690;
          fVar190 = fStack_68c;
          fVar235 = fStack_688;
        } while ((int)lVar124 < (int)uVar10);
      }
      bVar119 = SUB41(uVar120,0);
      if ((uVar120 & 1) != 0) {
        return bVar119;
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar129._4_4_ = uVar7;
      auVar129._0_4_ = uVar7;
      auVar129._8_4_ = uVar7;
      auVar129._12_4_ = uVar7;
      auVar16 = vcmpps_avx(local_470,auVar129,2);
      uVar120 = vmovmskps_avx(auVar16);
      uVar120 = (uint)uVar122 & uVar120;
    } while (uVar120 != 0);
  }
  return bVar119;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }